

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  uint uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [24];
  uint uVar126;
  uint uVar127;
  ulong uVar128;
  long lVar129;
  uint uVar130;
  ulong uVar131;
  undefined1 auVar132 [8];
  long lVar133;
  Geometry *pGVar134;
  undefined4 uVar135;
  undefined8 unaff_R13;
  long lVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar155;
  float fVar156;
  float fVar158;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar157;
  float fVar159;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar160;
  float fVar178;
  float fVar179;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar180;
  float fVar181;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar182;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar203 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar215;
  float fVar216;
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar201 [16];
  undefined1 auVar207 [32];
  undefined1 auVar202 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar221;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar237;
  float fVar239;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar230 [32];
  undefined1 auVar227 [16];
  float fVar241;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar238;
  float fVar240;
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar246;
  undefined1 auVar236 [32];
  float fVar247;
  float fVar248;
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar249 [32];
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar250 [32];
  float fVar261;
  undefined1 auVar251 [32];
  float fVar262;
  float fVar271;
  float fVar272;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar265 [32];
  float fVar273;
  undefined1 auVar266 [32];
  float fVar278;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar277;
  undefined1 auVar269 [32];
  float fVar279;
  float fVar280;
  undefined1 auVar270 [32];
  undefined1 auVar281 [16];
  float fVar292;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar300;
  undefined1 auVar288 [32];
  float fVar293;
  float fVar301;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar291 [64];
  float fVar302;
  float fVar309;
  float fVar310;
  undefined1 auVar304 [16];
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar316;
  undefined1 auVar306 [32];
  float fVar303;
  float fVar312;
  float fVar315;
  float fVar317;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar326;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  undefined1 auVar332 [12];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar333;
  undefined1 auVar331 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar337;
  float fVar345;
  float fVar346;
  float in_register_0000151c;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  float fVar347;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar355;
  float fVar358;
  float fVar359;
  float fVar360;
  float in_register_0000159c;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar361 [16];
  float in_register_000015dc;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  Precalculations *local_848;
  undefined1 local_840 [32];
  uint local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined1 local_7b0 [8];
  undefined8 uStack_7a8;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  ulong local_700;
  undefined8 uStack_6f8;
  RayHitK<4> *local_6f0;
  undefined1 (*local_6e8) [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [8];
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  ulong local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  LinearSpace3fa *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  RTCHitN local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370 [16];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar305 [32];
  undefined1 auVar338 [16];
  
  PVar14 = prim[1];
  uVar128 = (ulong)(byte)PVar14;
  auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar189 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar189 = vinsertps_avx(auVar189,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar229 = vsubps_avx(auVar229,*(undefined1 (*) [16])(prim + uVar128 * 0x19 + 6));
  fVar262 = *(float *)(prim + uVar128 * 0x19 + 0x12);
  auVar161._0_4_ = fVar262 * auVar229._0_4_;
  auVar161._4_4_ = fVar262 * auVar229._4_4_;
  auVar161._8_4_ = fVar262 * auVar229._8_4_;
  auVar161._12_4_ = fVar262 * auVar229._12_4_;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar263._0_4_ = fVar262 * auVar189._0_4_;
  auVar263._4_4_ = fVar262 * auVar189._4_4_;
  auVar263._8_4_ = fVar262 * auVar189._8_4_;
  auVar263._12_4_ = fVar262 * auVar189._12_4_;
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 10)));
  auVar147._16_16_ = auVar189;
  auVar147._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 10)));
  auVar195._16_16_ = auVar189;
  auVar195._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar195);
  auVar204._16_16_ = auVar189;
  auVar204._0_16_ = auVar229;
  auVar22 = vcvtdq2ps_avx(auVar204);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 10)));
  auVar205._16_16_ = auVar189;
  auVar205._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xc + 6)));
  auVar23 = vcvtdq2ps_avx(auVar205);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xc + 10)));
  auVar249._16_16_ = auVar189;
  auVar249._0_16_ = auVar229;
  auVar24 = vcvtdq2ps_avx(auVar249);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xd + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xd + 10)));
  auVar282._16_16_ = auVar189;
  auVar282._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x12 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x12 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar282);
  auVar283._16_16_ = auVar189;
  auVar283._0_16_ = auVar229;
  auVar26 = vcvtdq2ps_avx(auVar283);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x13 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x13 + 10)));
  auVar318._16_16_ = auVar189;
  auVar318._0_16_ = auVar229;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x14 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar318);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x14 + 10)));
  auVar327._16_16_ = auVar189;
  auVar327._0_16_ = auVar229;
  auVar28 = vcvtdq2ps_avx(auVar327);
  auVar229 = vshufps_avx(auVar263,auVar263,0);
  auVar189 = vshufps_avx(auVar263,auVar263,0x55);
  auVar203 = vshufps_avx(auVar263,auVar263,0xaa);
  fVar262 = auVar203._0_4_;
  fVar271 = auVar203._4_4_;
  fVar272 = auVar203._8_4_;
  fVar273 = auVar203._12_4_;
  fVar274 = auVar189._0_4_;
  fVar275 = auVar189._4_4_;
  fVar276 = auVar189._8_4_;
  fVar224 = auVar189._12_4_;
  fVar237 = auVar229._0_4_;
  fVar239 = auVar229._4_4_;
  fVar241 = auVar229._8_4_;
  fVar243 = auVar229._12_4_;
  auVar339._0_4_ = fVar237 * auVar147._0_4_ + fVar274 * auVar21._0_4_ + fVar262 * auVar22._0_4_;
  auVar339._4_4_ = fVar239 * auVar147._4_4_ + fVar275 * auVar21._4_4_ + fVar271 * auVar22._4_4_;
  auVar339._8_4_ = fVar241 * auVar147._8_4_ + fVar276 * auVar21._8_4_ + fVar272 * auVar22._8_4_;
  auVar339._12_4_ = fVar243 * auVar147._12_4_ + fVar224 * auVar21._12_4_ + fVar273 * auVar22._12_4_;
  auVar339._16_4_ = fVar237 * auVar147._16_4_ + fVar274 * auVar21._16_4_ + fVar262 * auVar22._16_4_;
  auVar339._20_4_ = fVar239 * auVar147._20_4_ + fVar275 * auVar21._20_4_ + fVar271 * auVar22._20_4_;
  auVar339._24_4_ = fVar241 * auVar147._24_4_ + fVar276 * auVar21._24_4_ + fVar272 * auVar22._24_4_;
  auVar339._28_4_ = fVar224 + in_register_000015dc + in_register_0000151c;
  auVar334._0_4_ = fVar237 * auVar23._0_4_ + fVar274 * auVar24._0_4_ + auVar25._0_4_ * fVar262;
  auVar334._4_4_ = fVar239 * auVar23._4_4_ + fVar275 * auVar24._4_4_ + auVar25._4_4_ * fVar271;
  auVar334._8_4_ = fVar241 * auVar23._8_4_ + fVar276 * auVar24._8_4_ + auVar25._8_4_ * fVar272;
  auVar334._12_4_ = fVar243 * auVar23._12_4_ + fVar224 * auVar24._12_4_ + auVar25._12_4_ * fVar273;
  auVar334._16_4_ = fVar237 * auVar23._16_4_ + fVar274 * auVar24._16_4_ + auVar25._16_4_ * fVar262;
  auVar334._20_4_ = fVar239 * auVar23._20_4_ + fVar275 * auVar24._20_4_ + auVar25._20_4_ * fVar271;
  auVar334._24_4_ = fVar241 * auVar23._24_4_ + fVar276 * auVar24._24_4_ + auVar25._24_4_ * fVar272;
  auVar334._28_4_ = fVar224 + in_register_000015dc + in_register_0000159c;
  auVar265._0_4_ = fVar237 * auVar26._0_4_ + fVar274 * auVar27._0_4_ + auVar28._0_4_ * fVar262;
  auVar265._4_4_ = fVar239 * auVar26._4_4_ + fVar275 * auVar27._4_4_ + auVar28._4_4_ * fVar271;
  auVar265._8_4_ = fVar241 * auVar26._8_4_ + fVar276 * auVar27._8_4_ + auVar28._8_4_ * fVar272;
  auVar265._12_4_ = fVar243 * auVar26._12_4_ + fVar224 * auVar27._12_4_ + auVar28._12_4_ * fVar273;
  auVar265._16_4_ = fVar237 * auVar26._16_4_ + fVar274 * auVar27._16_4_ + auVar28._16_4_ * fVar262;
  auVar265._20_4_ = fVar239 * auVar26._20_4_ + fVar275 * auVar27._20_4_ + auVar28._20_4_ * fVar271;
  auVar265._24_4_ = fVar241 * auVar26._24_4_ + fVar276 * auVar27._24_4_ + auVar28._24_4_ * fVar272;
  auVar265._28_4_ = fVar243 + fVar224 + fVar273;
  auVar229 = vshufps_avx(auVar161,auVar161,0);
  auVar189 = vshufps_avx(auVar161,auVar161,0x55);
  auVar203 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar271 = auVar203._0_4_;
  fVar272 = auVar203._4_4_;
  fVar273 = auVar203._8_4_;
  fVar274 = auVar203._12_4_;
  fVar239 = auVar189._0_4_;
  fVar241 = auVar189._4_4_;
  fVar243 = auVar189._8_4_;
  fVar244 = auVar189._12_4_;
  fVar275 = auVar229._0_4_;
  fVar276 = auVar229._4_4_;
  fVar224 = auVar229._8_4_;
  fVar237 = auVar229._12_4_;
  fVar262 = auVar147._28_4_;
  auVar166._0_4_ = fVar275 * auVar147._0_4_ + fVar239 * auVar21._0_4_ + fVar271 * auVar22._0_4_;
  auVar166._4_4_ = fVar276 * auVar147._4_4_ + fVar241 * auVar21._4_4_ + fVar272 * auVar22._4_4_;
  auVar166._8_4_ = fVar224 * auVar147._8_4_ + fVar243 * auVar21._8_4_ + fVar273 * auVar22._8_4_;
  auVar166._12_4_ = fVar237 * auVar147._12_4_ + fVar244 * auVar21._12_4_ + fVar274 * auVar22._12_4_;
  auVar166._16_4_ = fVar275 * auVar147._16_4_ + fVar239 * auVar21._16_4_ + fVar271 * auVar22._16_4_;
  auVar166._20_4_ = fVar276 * auVar147._20_4_ + fVar241 * auVar21._20_4_ + fVar272 * auVar22._20_4_;
  auVar166._24_4_ = fVar224 * auVar147._24_4_ + fVar243 * auVar21._24_4_ + fVar273 * auVar22._24_4_;
  auVar166._28_4_ = fVar262 + auVar21._28_4_ + auVar22._28_4_;
  auVar206._0_4_ = fVar275 * auVar23._0_4_ + auVar25._0_4_ * fVar271 + fVar239 * auVar24._0_4_;
  auVar206._4_4_ = fVar276 * auVar23._4_4_ + auVar25._4_4_ * fVar272 + fVar241 * auVar24._4_4_;
  auVar206._8_4_ = fVar224 * auVar23._8_4_ + auVar25._8_4_ * fVar273 + fVar243 * auVar24._8_4_;
  auVar206._12_4_ = fVar237 * auVar23._12_4_ + auVar25._12_4_ * fVar274 + fVar244 * auVar24._12_4_;
  auVar206._16_4_ = fVar275 * auVar23._16_4_ + auVar25._16_4_ * fVar271 + fVar239 * auVar24._16_4_;
  auVar206._20_4_ = fVar276 * auVar23._20_4_ + auVar25._20_4_ * fVar272 + fVar241 * auVar24._20_4_;
  auVar206._24_4_ = fVar224 * auVar23._24_4_ + auVar25._24_4_ * fVar273 + fVar243 * auVar24._24_4_;
  auVar206._28_4_ = fVar262 + auVar25._28_4_ + auVar22._28_4_;
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar284._16_4_ = 0x7fffffff;
  auVar284._20_4_ = 0x7fffffff;
  auVar284._24_4_ = 0x7fffffff;
  auVar284._28_4_ = 0x7fffffff;
  auVar196._0_4_ = fVar275 * auVar26._0_4_ + fVar239 * auVar27._0_4_ + auVar28._0_4_ * fVar271;
  auVar196._4_4_ = fVar276 * auVar26._4_4_ + fVar241 * auVar27._4_4_ + auVar28._4_4_ * fVar272;
  auVar196._8_4_ = fVar224 * auVar26._8_4_ + fVar243 * auVar27._8_4_ + auVar28._8_4_ * fVar273;
  auVar196._12_4_ = fVar237 * auVar26._12_4_ + fVar244 * auVar27._12_4_ + auVar28._12_4_ * fVar274;
  auVar196._16_4_ = fVar275 * auVar26._16_4_ + fVar239 * auVar27._16_4_ + auVar28._16_4_ * fVar271;
  auVar196._20_4_ = fVar276 * auVar26._20_4_ + fVar241 * auVar27._20_4_ + auVar28._20_4_ * fVar272;
  auVar196._24_4_ = fVar224 * auVar26._24_4_ + fVar243 * auVar27._24_4_ + auVar28._24_4_ * fVar273;
  auVar196._28_4_ = fVar262 + auVar24._28_4_ + fVar274;
  auVar147 = vandps_avx(auVar339,auVar284);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  auVar230._16_4_ = 0x219392ef;
  auVar230._20_4_ = 0x219392ef;
  auVar230._24_4_ = 0x219392ef;
  auVar230._28_4_ = 0x219392ef;
  auVar147 = vcmpps_avx(auVar147,auVar230,1);
  auVar21 = vblendvps_avx(auVar339,auVar230,auVar147);
  auVar147 = vandps_avx(auVar334,auVar284);
  auVar147 = vcmpps_avx(auVar147,auVar230,1);
  auVar22 = vblendvps_avx(auVar334,auVar230,auVar147);
  auVar147 = vandps_avx(auVar265,auVar284);
  auVar147 = vcmpps_avx(auVar147,auVar230,1);
  auVar23 = vrcpps_avx(auVar21);
  auVar147 = vblendvps_avx(auVar265,auVar230,auVar147);
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar319._16_4_ = 0x3f800000;
  auVar319._20_4_ = 0x3f800000;
  auVar319._24_4_ = 0x3f800000;
  auVar319._28_4_ = 0x3f800000;
  fVar224 = auVar23._0_4_;
  fVar237 = auVar23._4_4_;
  auVar24._4_4_ = fVar237 * auVar21._4_4_;
  auVar24._0_4_ = fVar224 * auVar21._0_4_;
  fVar239 = auVar23._8_4_;
  auVar24._8_4_ = fVar239 * auVar21._8_4_;
  fVar241 = auVar23._12_4_;
  auVar24._12_4_ = fVar241 * auVar21._12_4_;
  fVar243 = auVar23._16_4_;
  auVar24._16_4_ = fVar243 * auVar21._16_4_;
  fVar244 = auVar23._20_4_;
  auVar24._20_4_ = fVar244 * auVar21._20_4_;
  fVar245 = auVar23._24_4_;
  auVar24._24_4_ = fVar245 * auVar21._24_4_;
  auVar24._28_4_ = auVar21._28_4_;
  auVar21 = vsubps_avx(auVar319,auVar24);
  fVar224 = fVar224 + fVar224 * auVar21._0_4_;
  fVar237 = fVar237 + fVar237 * auVar21._4_4_;
  fVar239 = fVar239 + fVar239 * auVar21._8_4_;
  fVar241 = fVar241 + fVar241 * auVar21._12_4_;
  fVar243 = fVar243 + fVar243 * auVar21._16_4_;
  fVar244 = fVar244 + fVar244 * auVar21._20_4_;
  fVar245 = fVar245 + fVar245 * auVar21._24_4_;
  auVar21 = vrcpps_avx(auVar22);
  fVar262 = auVar21._0_4_;
  fVar271 = auVar21._4_4_;
  auVar23._4_4_ = fVar271 * auVar22._4_4_;
  auVar23._0_4_ = fVar262 * auVar22._0_4_;
  fVar272 = auVar21._8_4_;
  auVar23._8_4_ = fVar272 * auVar22._8_4_;
  fVar273 = auVar21._12_4_;
  auVar23._12_4_ = fVar273 * auVar22._12_4_;
  fVar274 = auVar21._16_4_;
  auVar23._16_4_ = fVar274 * auVar22._16_4_;
  fVar275 = auVar21._20_4_;
  auVar23._20_4_ = fVar275 * auVar22._20_4_;
  fVar276 = auVar21._24_4_;
  auVar23._24_4_ = fVar276 * auVar22._24_4_;
  auVar23._28_4_ = auVar22._28_4_;
  auVar23 = vsubps_avx(auVar319,auVar23);
  auVar22 = vrcpps_avx(auVar147);
  fVar262 = fVar262 + fVar262 * auVar23._0_4_;
  fVar271 = fVar271 + fVar271 * auVar23._4_4_;
  fVar272 = fVar272 + fVar272 * auVar23._8_4_;
  fVar273 = fVar273 + fVar273 * auVar23._12_4_;
  fVar274 = fVar274 + fVar274 * auVar23._16_4_;
  fVar275 = fVar275 + fVar275 * auVar23._20_4_;
  fVar276 = fVar276 + fVar276 * auVar23._24_4_;
  fVar247 = auVar22._0_4_;
  fVar252 = auVar22._4_4_;
  auVar25._4_4_ = fVar252 * auVar147._4_4_;
  auVar25._0_4_ = fVar247 * auVar147._0_4_;
  fVar254 = auVar22._8_4_;
  auVar25._8_4_ = fVar254 * auVar147._8_4_;
  fVar256 = auVar22._12_4_;
  auVar25._12_4_ = fVar256 * auVar147._12_4_;
  fVar258 = auVar22._16_4_;
  auVar25._16_4_ = fVar258 * auVar147._16_4_;
  fVar259 = auVar22._20_4_;
  auVar25._20_4_ = fVar259 * auVar147._20_4_;
  fVar260 = auVar22._24_4_;
  auVar25._24_4_ = fVar260 * auVar147._24_4_;
  auVar25._28_4_ = auVar21._28_4_;
  auVar147 = vsubps_avx(auVar319,auVar25);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar229 = vpmovsxwd_avx(auVar229);
  fVar247 = fVar247 + fVar247 * auVar147._0_4_;
  fVar252 = fVar252 + fVar252 * auVar147._4_4_;
  fVar254 = fVar254 + fVar254 * auVar147._8_4_;
  fVar256 = fVar256 + fVar256 * auVar147._12_4_;
  fVar258 = fVar258 + fVar258 * auVar147._16_4_;
  fVar259 = fVar259 + fVar259 * auVar147._20_4_;
  fVar260 = fVar260 + fVar260 * auVar147._24_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar128 * 7 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar189);
  auVar141._16_16_ = auVar189;
  auVar141._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar141);
  auVar147 = vsubps_avx(auVar147,auVar166);
  auVar138._0_4_ = fVar224 * auVar147._0_4_;
  auVar138._4_4_ = fVar237 * auVar147._4_4_;
  auVar138._8_4_ = fVar239 * auVar147._8_4_;
  auVar138._12_4_ = fVar241 * auVar147._12_4_;
  auVar22._16_4_ = fVar243 * auVar147._16_4_;
  auVar22._0_16_ = auVar138;
  auVar22._20_4_ = fVar244 * auVar147._20_4_;
  auVar22._24_4_ = fVar245 * auVar147._24_4_;
  auVar22._28_4_ = auVar147._28_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar229 = vpmovsxwd_avx(auVar203);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar128 * 9 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar193);
  auVar285._16_16_ = auVar189;
  auVar285._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar285);
  auVar147 = vsubps_avx(auVar147,auVar166);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar128 * 0xe + 6);
  auVar229 = vpmovsxwd_avx(auVar191);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar128 * 0xe + 0xe);
  auVar189 = vpmovsxwd_avx(auVar228);
  auVar162._0_4_ = fVar224 * auVar147._0_4_;
  auVar162._4_4_ = fVar237 * auVar147._4_4_;
  auVar162._8_4_ = fVar239 * auVar147._8_4_;
  auVar162._12_4_ = fVar241 * auVar147._12_4_;
  auVar26._16_4_ = fVar243 * auVar147._16_4_;
  auVar26._0_16_ = auVar162;
  auVar26._20_4_ = fVar244 * auVar147._20_4_;
  auVar26._24_4_ = fVar245 * auVar147._24_4_;
  auVar26._28_4_ = auVar147._28_4_;
  auVar231._16_16_ = auVar189;
  auVar231._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar231);
  auVar147 = vsubps_avx(auVar147,auVar206);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar229 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar9);
  auVar225._0_4_ = fVar262 * auVar147._0_4_;
  auVar225._4_4_ = fVar271 * auVar147._4_4_;
  auVar225._8_4_ = fVar272 * auVar147._8_4_;
  auVar225._12_4_ = fVar273 * auVar147._12_4_;
  auVar21._16_4_ = fVar274 * auVar147._16_4_;
  auVar21._0_16_ = auVar225;
  auVar21._20_4_ = fVar275 * auVar147._20_4_;
  auVar21._24_4_ = fVar276 * auVar147._24_4_;
  auVar21._28_4_ = auVar147._28_4_;
  auVar286._16_16_ = auVar189;
  auVar286._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar286);
  auVar147 = vsubps_avx(auVar147,auVar206);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar128 * 0x15 + 6);
  auVar229 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar128 * 0x15 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar11);
  auVar201._0_4_ = fVar262 * auVar147._0_4_;
  auVar201._4_4_ = fVar271 * auVar147._4_4_;
  auVar201._8_4_ = fVar272 * auVar147._8_4_;
  auVar201._12_4_ = fVar273 * auVar147._12_4_;
  auVar27._16_4_ = fVar274 * auVar147._16_4_;
  auVar27._0_16_ = auVar201;
  auVar27._20_4_ = fVar275 * auVar147._20_4_;
  auVar27._24_4_ = fVar276 * auVar147._24_4_;
  auVar27._28_4_ = auVar147._28_4_;
  auVar266._16_16_ = auVar189;
  auVar266._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar266);
  auVar147 = vsubps_avx(auVar147,auVar196);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 6);
  auVar229 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar13);
  auVar264._0_4_ = fVar247 * auVar147._0_4_;
  auVar264._4_4_ = fVar252 * auVar147._4_4_;
  auVar264._8_4_ = fVar254 * auVar147._8_4_;
  auVar264._12_4_ = fVar256 * auVar147._12_4_;
  auVar28._16_4_ = fVar258 * auVar147._16_4_;
  auVar28._0_16_ = auVar264;
  auVar28._20_4_ = fVar259 * auVar147._20_4_;
  auVar28._24_4_ = fVar260 * auVar147._24_4_;
  auVar28._28_4_ = auVar147._28_4_;
  auVar287._16_16_ = auVar189;
  auVar287._0_16_ = auVar229;
  auVar147 = vcvtdq2ps_avx(auVar287);
  auVar147 = vsubps_avx(auVar147,auVar196);
  auVar183._0_4_ = fVar247 * auVar147._0_4_;
  auVar183._4_4_ = fVar252 * auVar147._4_4_;
  auVar183._8_4_ = fVar254 * auVar147._8_4_;
  auVar183._12_4_ = fVar256 * auVar147._12_4_;
  auVar19._16_4_ = fVar258 * auVar147._16_4_;
  auVar19._0_16_ = auVar183;
  auVar19._20_4_ = fVar259 * auVar147._20_4_;
  auVar19._24_4_ = fVar260 * auVar147._24_4_;
  auVar19._28_4_ = auVar147._28_4_;
  auVar229 = vpminsd_avx(auVar22._16_16_,auVar26._16_16_);
  auVar189 = vpminsd_avx(auVar138,auVar162);
  auVar328._16_16_ = auVar229;
  auVar328._0_16_ = auVar189;
  auVar203 = auVar21._16_16_;
  auVar325 = ZEXT1664(auVar203);
  auVar229 = vpminsd_avx(auVar203,auVar27._16_16_);
  auVar189 = vpminsd_avx(auVar225,auVar201);
  auVar335._16_16_ = auVar229;
  auVar335._0_16_ = auVar189;
  auVar147 = vmaxps_avx(auVar328,auVar335);
  auVar229 = vpminsd_avx(auVar28._16_16_,auVar19._16_16_);
  auVar189 = vpminsd_avx(auVar264,auVar183);
  auVar348._16_16_ = auVar229;
  auVar348._0_16_ = auVar189;
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar356._4_4_ = uVar135;
  auVar356._0_4_ = uVar135;
  auVar356._8_4_ = uVar135;
  auVar356._12_4_ = uVar135;
  auVar356._16_4_ = uVar135;
  auVar356._20_4_ = uVar135;
  auVar356._24_4_ = uVar135;
  auVar356._28_4_ = uVar135;
  auVar21 = vmaxps_avx(auVar348,auVar356);
  auVar147 = vmaxps_avx(auVar147,auVar21);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar229 = vpmaxsd_avx(auVar22._16_16_,auVar26._16_16_);
  auVar189 = vpmaxsd_avx(auVar138,auVar162);
  auVar142._16_16_ = auVar229;
  auVar142._0_16_ = auVar189;
  auVar229 = vpmaxsd_avx(auVar203,auVar27._16_16_);
  auVar189 = vpmaxsd_avx(auVar225,auVar201);
  auVar167._16_16_ = auVar229;
  auVar167._0_16_ = auVar189;
  auVar147 = vminps_avx(auVar142,auVar167);
  auVar229 = vpmaxsd_avx(auVar28._16_16_,auVar19._16_16_);
  auVar189 = vpmaxsd_avx(auVar264,auVar183);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar207._4_4_ = uVar135;
  auVar207._0_4_ = uVar135;
  auVar207._8_4_ = uVar135;
  auVar207._12_4_ = uVar135;
  auVar207._16_4_ = uVar135;
  auVar207._20_4_ = uVar135;
  auVar207._24_4_ = uVar135;
  auVar207._28_4_ = uVar135;
  auVar168._16_16_ = auVar229;
  auVar168._0_16_ = auVar189;
  auVar21 = vminps_avx(auVar168,auVar207);
  auVar147 = vminps_avx(auVar147,auVar21);
  auVar20._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar20._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar20._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar20._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar20._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar20._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar20._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar20._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_80,auVar20,2);
  auVar229 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar169._16_16_ = auVar229;
  auVar169._0_16_ = auVar229;
  auVar21 = vcvtdq2ps_avx(auVar169);
  auVar21 = vcmpps_avx(_DAT_01f7b060,auVar21,1);
  auVar147 = vandps_avx(auVar147,auVar21);
  uVar135 = vmovmskps_avx(auVar147);
  uVar128 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar135);
  local_508 = pre->ray_space + k;
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_6e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_848 = pre;
  do {
    if (uVar128 == 0) {
      return;
    }
    auVar147 = auVar325._0_32_;
    lVar136 = 0;
    if (uVar128 != 0) {
      for (; (uVar128 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
      }
    }
    uVar130 = *(uint *)(prim + 2);
    uVar127 = *(uint *)(prim + lVar136 * 4 + 6);
    pGVar134 = (context->scene->geometries).items[CONCAT44(0,uVar130)].ptr;
    uVar131 = (ulong)*(uint *)(*(long *)&pGVar134->field_0x58 +
                              CONCAT44(0,uVar127) *
                              pGVar134[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    lVar133 = (long)pGVar134[1].intersectionFilterN * uVar131;
    pfVar1 = (float *)(pGVar134[2].intersectionFilterN + uVar131 * (long)pGVar134[2].pointQueryFunc)
    ;
    pfVar2 = (float *)(pGVar134[2].intersectionFilterN +
                      (long)pGVar134[2].pointQueryFunc * (uVar131 + 1));
    auVar184._0_4_ = *pfVar2 * 0.33333334;
    auVar184._4_4_ = pfVar2[1] * 0.33333334;
    auVar184._8_4_ = pfVar2[2] * 0.33333334;
    auVar184._12_4_ = pfVar2[3] * 0.33333334;
    lVar129 = (long)pGVar134[1].intersectionFilterN * (uVar131 + 1);
    lVar136 = *(long *)&pGVar134[1].time_range.upper;
    _local_7a0 = *(undefined1 (*) [16])(lVar136 + lVar133);
    _local_7b0 = *(undefined1 (*) [16])(lVar136 + lVar129);
    fVar262 = *(float *)(lVar136 + 0xc + lVar133);
    auVar281._4_4_ = fVar262;
    auVar281._0_4_ = fVar262;
    auVar281._8_4_ = fVar262;
    auVar281._12_4_ = fVar262;
    fStack_f0 = fVar262;
    _local_100 = auVar281;
    fStack_ec = fVar262;
    fStack_e8 = fVar262;
    register0x000013dc = fVar262;
    uVar15 = (uint)pGVar134[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    fVar337 = local_7a0._0_4_ + *pfVar1 * 0.33333334;
    fVar345 = local_7a0._4_4_ + pfVar1[1] * 0.33333334;
    auVar338._0_8_ = CONCAT44(fVar345,fVar337);
    auVar338._8_4_ = local_7a0._8_4_ + pfVar1[2] * 0.33333334;
    auVar338._12_4_ = local_7a0._12_4_ + pfVar1[3] * 0.33333334;
    _local_7d0 = vsubps_avx(_local_7b0,auVar184);
    auVar193 = vsubps_avx(_local_7a0,auVar229);
    auVar189 = vshufps_avx(auVar193,auVar193,0);
    auVar203 = vshufps_avx(auVar193,auVar193,0x55);
    auVar193 = vshufps_avx(auVar193,auVar193,0xaa);
    fVar271 = (local_508->vx).field_0.m128[0];
    fVar272 = (local_508->vx).field_0.m128[1];
    fVar273 = (local_508->vx).field_0.m128[2];
    fVar274 = (local_508->vx).field_0.m128[3];
    fVar275 = (local_508->vy).field_0.m128[0];
    fVar276 = (local_508->vy).field_0.m128[1];
    fVar224 = (local_508->vy).field_0.m128[2];
    fVar237 = (local_508->vy).field_0.m128[3];
    fVar239 = (local_508->vz).field_0.m128[0];
    fVar241 = (local_508->vz).field_0.m128[1];
    fVar243 = (local_508->vz).field_0.m128[2];
    fVar244 = (local_508->vz).field_0.m128[3];
    auVar202._0_8_ =
         CONCAT44(auVar189._4_4_ * fVar272 + auVar203._4_4_ * fVar276 + fVar241 * auVar193._4_4_,
                  auVar189._0_4_ * fVar271 + auVar203._0_4_ * fVar275 + fVar239 * auVar193._0_4_);
    auVar202._8_4_ = auVar189._8_4_ * fVar273 + auVar203._8_4_ * fVar224 + fVar243 * auVar193._8_4_;
    auVar202._12_4_ =
         auVar189._12_4_ * fVar274 + auVar203._12_4_ * fVar237 + fVar244 * auVar193._12_4_;
    auVar193 = vinsertps_avx(auVar202,auVar281,0x30);
    auVar191 = vsubps_avx(auVar338,auVar229);
    auVar189 = vshufps_avx(auVar191,auVar191,0);
    auVar203 = vshufps_avx(auVar191,auVar191,0x55);
    auVar191 = vshufps_avx(auVar191,auVar191,0xaa);
    auVar361._0_4_ = auVar189._0_4_ * fVar271 + auVar203._0_4_ * fVar275 + fVar239 * auVar191._0_4_;
    auVar361._4_4_ = auVar189._4_4_ * fVar272 + auVar203._4_4_ * fVar276 + fVar241 * auVar191._4_4_;
    auVar361._8_4_ = auVar189._8_4_ * fVar273 + auVar203._8_4_ * fVar224 + fVar243 * auVar191._8_4_;
    auVar361._12_4_ =
         auVar189._12_4_ * fVar274 + auVar203._12_4_ * fVar237 + fVar244 * auVar191._12_4_;
    auVar189 = vblendps_avx(auVar361,auVar338,8);
    auVar228 = vsubps_avx(_local_7d0,auVar229);
    auVar203 = vshufps_avx(auVar228,auVar228,0);
    auVar191 = vshufps_avx(auVar228,auVar228,0x55);
    auVar228 = vshufps_avx(auVar228,auVar228,0xaa);
    auVar226._0_4_ = auVar203._0_4_ * fVar271 + auVar191._0_4_ * fVar275 + auVar228._0_4_ * fVar239;
    auVar226._4_4_ = auVar203._4_4_ * fVar272 + auVar191._4_4_ * fVar276 + auVar228._4_4_ * fVar241;
    auVar226._8_4_ = auVar203._8_4_ * fVar273 + auVar191._8_4_ * fVar224 + auVar228._8_4_ * fVar243;
    auVar226._12_4_ =
         auVar203._12_4_ * fVar274 + auVar191._12_4_ * fVar237 + auVar228._12_4_ * fVar244;
    auVar203 = vblendps_avx(auVar226,_local_7d0,8);
    auVar228 = vsubps_avx(_local_7b0,auVar229);
    auVar229 = vshufps_avx(auVar228,auVar228,0xaa);
    auVar191 = vshufps_avx(auVar228,auVar228,0);
    auVar228 = vshufps_avx(auVar228,auVar228,0x55);
    auVar163._0_4_ = auVar191._0_4_ * fVar271 + auVar228._0_4_ * fVar275 + auVar229._0_4_ * fVar239;
    auVar163._4_4_ = auVar191._4_4_ * fVar272 + auVar228._4_4_ * fVar276 + auVar229._4_4_ * fVar241;
    auVar163._8_4_ = auVar191._8_4_ * fVar273 + auVar228._8_4_ * fVar224 + auVar229._8_4_ * fVar243;
    auVar163._12_4_ =
         auVar191._12_4_ * fVar274 + auVar228._12_4_ * fVar237 + auVar229._12_4_ * fVar244;
    fVar271 = *(float *)(lVar136 + 0xc + lVar129);
    auVar185._4_4_ = fVar271;
    auVar185._0_4_ = fVar271;
    auVar185._8_4_ = fVar271;
    auVar185._12_4_ = fVar271;
    fStack_110 = fVar271;
    _local_120 = auVar185;
    fStack_10c = fVar271;
    fStack_108 = fVar271;
    fStack_104 = fVar271;
    auVar191 = vinsertps_avx(auVar163,auVar185,0x30);
    auVar227._8_4_ = 0x7fffffff;
    auVar227._0_8_ = 0x7fffffff7fffffff;
    auVar227._12_4_ = 0x7fffffff;
    auVar229 = vandps_avx(auVar193,auVar227);
    auVar189 = vandps_avx(auVar189,auVar227);
    auVar193 = vmaxps_avx(auVar229,auVar189);
    auVar229 = vandps_avx(auVar203,auVar227);
    auVar189 = vandps_avx(auVar191,auVar227);
    auVar229 = vmaxps_avx(auVar229,auVar189);
    auVar229 = vmaxps_avx(auVar193,auVar229);
    auVar189 = vmovshdup_avx(auVar229);
    auVar189 = vmaxss_avx(auVar189,auVar229);
    auVar229 = vshufpd_avx(auVar229,auVar229,1);
    auVar229 = vmaxss_avx(auVar229,auVar189);
    auVar132 = (undefined1  [8])(long)(int)uVar15;
    lVar136 = (long)auVar132 * 0x44;
    fVar276 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
    fVar224 = *(float *)(bezier_basis0 + lVar136 + 0x90c);
    fVar241 = *(float *)(bezier_basis0 + lVar136 + 0x910);
    fVar243 = *(float *)(bezier_basis0 + lVar136 + 0x914);
    fVar247 = *(float *)(bezier_basis0 + lVar136 + 0x918);
    fVar252 = *(float *)(bezier_basis0 + lVar136 + 0x91c);
    fVar254 = *(float *)(bezier_basis0 + lVar136 + 0x920);
    auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
    auVar189 = vshufps_avx(auVar226,auVar226,0);
    register0x00001250 = auVar189;
    _local_580 = auVar189;
    fVar256 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
    fVar258 = *(float *)(bezier_basis0 + lVar136 + 0xd90);
    fVar259 = *(float *)(bezier_basis0 + lVar136 + 0xd94);
    fVar260 = *(float *)(bezier_basis0 + lVar136 + 0xd98);
    fVar292 = *(float *)(bezier_basis0 + lVar136 + 0xd9c);
    fVar346 = *(float *)(bezier_basis0 + lVar136 + 0xda0);
    fVar303 = *(float *)(bezier_basis0 + lVar136 + 0xda4);
    auVar119 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
    auVar203 = vshufps_avx(auVar163,auVar163,0);
    register0x00001550 = auVar203;
    _local_400 = auVar203;
    fVar294 = auVar203._0_4_;
    fVar296 = auVar203._4_4_;
    fVar298 = auVar203._8_4_;
    fVar299 = auVar203._12_4_;
    fVar160 = auVar189._0_4_;
    fVar178 = auVar189._4_4_;
    fVar179 = auVar189._8_4_;
    fVar180 = auVar189._12_4_;
    auVar189 = vshufps_avx(auVar226,auVar226,0x55);
    register0x000014d0 = auVar189;
    _local_720 = auVar189;
    auVar203 = vshufps_avx(auVar163,auVar163,0x55);
    register0x00001350 = auVar203;
    _local_6c0 = auVar203;
    fVar248 = auVar203._0_4_;
    fVar253 = auVar203._4_4_;
    fVar255 = auVar203._8_4_;
    fVar257 = auVar203._12_4_;
    fVar215 = auVar189._0_4_;
    fVar216 = auVar189._4_4_;
    fVar218 = auVar189._8_4_;
    fVar277 = auVar189._12_4_;
    auVar189 = vshufps_avx(_local_7d0,_local_7d0,0xff);
    register0x00001310 = auVar189;
    _local_a0 = auVar189;
    fVar158 = auVar189._0_4_;
    fVar181 = auVar189._4_4_;
    fVar200 = auVar189._8_4_;
    auVar203 = vshufps_avx(auVar361,auVar361,0);
    pauVar4 = (undefined1 (*) [32])(bezier_basis0 + lVar136 + 0x484);
    fVar217 = *(float *)*pauVar4;
    fVar293 = *(float *)(bezier_basis0 + lVar136 + 0x488);
    fVar311 = *(float *)(bezier_basis0 + lVar136 + 0x48c);
    fVar312 = *(float *)(bezier_basis0 + lVar136 + 0x490);
    fVar219 = *(float *)(bezier_basis0 + lVar136 + 0x494);
    fVar295 = *(float *)(bezier_basis0 + lVar136 + 0x498);
    fVar314 = *(float *)(bezier_basis0 + lVar136 + 0x49c);
    auVar121 = *(undefined1 (*) [28])*pauVar4;
    _auStack_550 = SUB3216(*pauVar4,0x10);
    fVar272 = auVar203._0_4_;
    fVar274 = auVar203._4_4_;
    fVar237 = auVar203._8_4_;
    fVar244 = auVar203._12_4_;
    auVar203 = vshufps_avx(auVar361,auVar361,0x55);
    register0x000013d0 = auVar203;
    _local_760 = auVar203;
    fVar273 = auVar203._0_4_;
    fVar275 = auVar203._4_4_;
    fVar239 = auVar203._8_4_;
    fVar245 = auVar203._12_4_;
    auVar203 = vshufps_avx(auVar338,auVar338,0xff);
    register0x00001590 = auVar203;
    _local_180 = auVar203;
    fVar238 = auVar203._0_4_;
    fVar240 = auVar203._4_4_;
    fVar242 = auVar203._8_4_;
    fVar278 = auVar203._12_4_;
    auVar113._8_4_ = auVar202._8_4_;
    auVar113._0_8_ = auVar202._0_8_;
    auVar113._12_4_ = auVar202._12_4_;
    auVar203 = vshufps_avx(auVar113,auVar113,0);
    register0x00001290 = auVar203;
    _local_140 = auVar203;
    fVar315 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136);
    fVar221 = *(float *)(bezier_basis0 + lVar136 + 4);
    fVar297 = *(float *)(bezier_basis0 + lVar136 + 8);
    fVar316 = *(float *)(bezier_basis0 + lVar136 + 0xc);
    fVar317 = *(float *)(bezier_basis0 + lVar136 + 0x10);
    fVar159 = *(float *)(bezier_basis0 + lVar136 + 0x14);
    fVar182 = *(float *)(bezier_basis0 + lVar136 + 0x18);
    auVar122 = *(undefined1 (*) [28])(bezier_basis0 + lVar136);
    fVar157 = auVar203._0_4_;
    fVar246 = auVar203._4_4_;
    fVar261 = auVar203._8_4_;
    fVar279 = auVar203._12_4_;
    auVar304._0_4_ = fVar157 * fVar315 + fVar217 * fVar272 + fVar160 * fVar276 + fVar294 * fVar256;
    auVar304._4_4_ = fVar246 * fVar221 + fVar293 * fVar274 + fVar178 * fVar224 + fVar296 * fVar258;
    auVar304._8_4_ = fVar261 * fVar297 + fVar311 * fVar237 + fVar179 * fVar241 + fVar298 * fVar259;
    auVar304._12_4_ = fVar279 * fVar316 + fVar312 * fVar244 + fVar180 * fVar243 + fVar299 * fVar260;
    auVar305._16_4_ = fVar157 * fVar317 + fVar219 * fVar272 + fVar160 * fVar247 + fVar294 * fVar292;
    auVar305._0_16_ = auVar304;
    auVar305._20_4_ = fVar246 * fVar159 + fVar295 * fVar274 + fVar178 * fVar252 + fVar296 * fVar346;
    auVar305._24_4_ = fVar261 * fVar182 + fVar314 * fVar237 + fVar179 * fVar254 + fVar298 * fVar303;
    auVar305._28_4_ = fVar244 + fVar180 + 0.0 + 0.0;
    auVar203 = vshufps_avx(auVar113,auVar113,0x55);
    register0x00001510 = auVar203;
    _local_160 = auVar203;
    fVar220 = auVar203._0_4_;
    fVar222 = auVar203._4_4_;
    fVar223 = auVar203._8_4_;
    fVar301 = auVar203._12_4_;
    auVar320._0_4_ = fVar217 * fVar273 + fVar215 * fVar276 + fVar248 * fVar256 + fVar220 * fVar315;
    auVar320._4_4_ = fVar293 * fVar275 + fVar216 * fVar224 + fVar253 * fVar258 + fVar222 * fVar221;
    auVar320._8_4_ = fVar311 * fVar239 + fVar218 * fVar241 + fVar255 * fVar259 + fVar223 * fVar297;
    auVar320._12_4_ = fVar312 * fVar245 + fVar277 * fVar243 + fVar257 * fVar260 + fVar301 * fVar316;
    auVar320._16_4_ = fVar219 * fVar273 + fVar215 * fVar247 + fVar248 * fVar292 + fVar220 * fVar317;
    auVar320._20_4_ = fVar295 * fVar275 + fVar216 * fVar252 + fVar253 * fVar346 + fVar222 * fVar159;
    auVar320._24_4_ = fVar314 * fVar239 + fVar218 * fVar254 + fVar255 * fVar303 + fVar223 * fVar182;
    auVar320._28_4_ = 0;
    local_880._0_4_ = fVar238 * fVar217 + fVar158 * fVar276 + fVar271 * fVar256 + fVar262 * fVar315;
    local_880._4_4_ = fVar240 * fVar293 + fVar181 * fVar224 + fVar271 * fVar258 + fVar262 * fVar221;
    fStack_878 = fVar242 * fVar311 + fVar200 * fVar241 + fVar271 * fVar259 + fVar262 * fVar297;
    fStack_874 = fVar278 * fVar312 + auVar189._12_4_ * fVar243 + fVar271 * fVar260 +
                 fVar262 * fVar316;
    fStack_870 = fVar238 * fVar219 + fVar158 * fVar247 + fVar271 * fVar292 + fVar262 * fVar317;
    fStack_86c = fVar240 * fVar295 + fVar181 * fVar252 + fVar271 * fVar346 + fVar262 * fVar159;
    fStack_868 = fVar242 * fVar314 + fVar200 * fVar254 + fVar271 * fVar303 + fVar262 * fVar182;
    fStack_864 = *(float *)(bezier_basis0 + lVar136 + 0x924) + 0.0 + 0.0 +
                 *(float *)(bezier_basis0 + lVar136 + 0x1c);
    fVar346 = *(float *)(bezier_basis1 + lVar136 + 0x908);
    fVar303 = *(float *)(bezier_basis1 + lVar136 + 0x90c);
    fVar217 = *(float *)(bezier_basis1 + lVar136 + 0x910);
    fVar293 = *(float *)(bezier_basis1 + lVar136 + 0x914);
    fVar311 = *(float *)(bezier_basis1 + lVar136 + 0x918);
    fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x91c);
    fVar219 = *(float *)(bezier_basis1 + lVar136 + 0x920);
    fVar276 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
    fVar224 = *(float *)(bezier_basis1 + lVar136 + 0xd90);
    fVar241 = *(float *)(bezier_basis1 + lVar136 + 0xd94);
    fVar243 = *(float *)(bezier_basis1 + lVar136 + 0xd98);
    fVar247 = *(float *)(bezier_basis1 + lVar136 + 0xd9c);
    fVar252 = *(float *)(bezier_basis1 + lVar136 + 0xda0);
    fVar254 = *(float *)(bezier_basis1 + lVar136 + 0xda4);
    auVar123 = *(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
    fVar295 = *(float *)(bezier_basis1 + lVar136 + 0x484);
    fVar314 = *(float *)(bezier_basis1 + lVar136 + 0x488);
    fVar315 = *(float *)(bezier_basis1 + lVar136 + 0x48c);
    fVar221 = *(float *)(bezier_basis1 + lVar136 + 0x490);
    fVar297 = *(float *)(bezier_basis1 + lVar136 + 0x494);
    fVar316 = *(float *)(bezier_basis1 + lVar136 + 0x498);
    fVar317 = *(float *)(bezier_basis1 + lVar136 + 0x49c);
    fVar159 = *(float *)(bezier_basis1 + lVar136);
    fVar182 = *(float *)(bezier_basis1 + lVar136 + 4);
    fVar280 = *(float *)(bezier_basis1 + lVar136 + 8);
    fVar333 = *(float *)(bezier_basis1 + lVar136 + 0xc);
    fVar137 = *(float *)(bezier_basis1 + lVar136 + 0x10);
    fVar155 = *(float *)(bezier_basis1 + lVar136 + 0x14);
    fVar156 = *(float *)(bezier_basis1 + lVar136 + 0x18);
    auVar232._0_4_ = fVar157 * fVar159 + fVar272 * fVar295 + fVar346 * fVar160 + fVar294 * fVar276;
    auVar232._4_4_ = fVar246 * fVar182 + fVar274 * fVar314 + fVar303 * fVar178 + fVar296 * fVar224;
    auVar232._8_4_ = fVar261 * fVar280 + fVar237 * fVar315 + fVar217 * fVar179 + fVar298 * fVar241;
    auVar232._12_4_ = fVar279 * fVar333 + fVar244 * fVar221 + fVar293 * fVar180 + fVar299 * fVar243;
    auVar232._16_4_ = fVar157 * fVar137 + fVar272 * fVar297 + fVar311 * fVar160 + fVar294 * fVar247;
    auVar232._20_4_ = fVar246 * fVar155 + fVar274 * fVar316 + fVar312 * fVar178 + fVar296 * fVar252;
    auVar232._24_4_ = fVar261 * fVar156 + fVar237 * fVar317 + fVar219 * fVar179 + fVar298 * fVar254;
    auVar232._28_4_ = fVar278 + fVar299 + 0.0;
    auVar208._0_4_ = fVar220 * fVar159 + fVar273 * fVar295 + fVar215 * fVar346 + fVar248 * fVar276;
    auVar208._4_4_ = fVar222 * fVar182 + fVar275 * fVar314 + fVar216 * fVar303 + fVar253 * fVar224;
    auVar208._8_4_ = fVar223 * fVar280 + fVar239 * fVar315 + fVar218 * fVar217 + fVar255 * fVar241;
    auVar208._12_4_ = fVar301 * fVar333 + fVar245 * fVar221 + fVar277 * fVar293 + fVar257 * fVar243;
    auVar208._16_4_ = fVar220 * fVar137 + fVar273 * fVar297 + fVar215 * fVar311 + fVar248 * fVar247;
    auVar208._20_4_ = fVar222 * fVar155 + fVar275 * fVar316 + fVar216 * fVar312 + fVar253 * fVar252;
    auVar208._24_4_ = fVar223 * fVar156 + fVar239 * fVar317 + fVar218 * fVar219 + fVar255 * fVar254;
    auVar208._28_4_ = fVar279 + fVar299 + 0.0;
    auVar250._0_4_ = fVar238 * fVar295 + fVar158 * fVar346 + fVar276 * fVar271 + fVar262 * fVar159;
    auVar250._4_4_ = fVar240 * fVar314 + fVar181 * fVar303 + fVar224 * fVar271 + fVar262 * fVar182;
    auVar250._8_4_ = fVar242 * fVar315 + fVar200 * fVar217 + fVar241 * fVar271 + fVar262 * fVar280;
    auVar250._12_4_ =
         fVar278 * fVar221 + auVar189._12_4_ * fVar293 + fVar243 * fVar271 + fVar262 * fVar333;
    auVar250._16_4_ = fVar238 * fVar297 + fVar158 * fVar311 + fVar247 * fVar271 + fVar262 * fVar137;
    auVar250._20_4_ = fVar240 * fVar316 + fVar181 * fVar312 + fVar252 * fVar271 + fVar262 * fVar155;
    auVar250._24_4_ = fVar242 * fVar317 + fVar200 * fVar219 + fVar254 * fVar271 + fVar262 * fVar156;
    auVar250._28_4_ = fVar299 + fVar245 + 0.0 + fVar279;
    auVar23 = vsubps_avx(auVar232,auVar305);
    auVar24 = vsubps_avx(auVar208,auVar320);
    fVar262 = auVar23._0_4_;
    fVar276 = auVar23._4_4_;
    auVar29._4_4_ = auVar320._4_4_ * fVar276;
    auVar29._0_4_ = auVar320._0_4_ * fVar262;
    fVar241 = auVar23._8_4_;
    auVar29._8_4_ = auVar320._8_4_ * fVar241;
    fVar247 = auVar23._12_4_;
    auVar29._12_4_ = auVar320._12_4_ * fVar247;
    fVar254 = auVar23._16_4_;
    auVar29._16_4_ = auVar320._16_4_ * fVar254;
    fVar258 = auVar23._20_4_;
    auVar29._20_4_ = auVar320._20_4_ * fVar258;
    fVar260 = auVar23._24_4_;
    auVar29._24_4_ = auVar320._24_4_ * fVar260;
    auVar29._28_4_ = fVar279;
    fVar271 = auVar24._0_4_;
    fVar224 = auVar24._4_4_;
    auVar30._4_4_ = auVar304._4_4_ * fVar224;
    auVar30._0_4_ = auVar304._0_4_ * fVar271;
    fVar243 = auVar24._8_4_;
    auVar30._8_4_ = auVar304._8_4_ * fVar243;
    fVar252 = auVar24._12_4_;
    auVar30._12_4_ = auVar304._12_4_ * fVar252;
    fVar256 = auVar24._16_4_;
    auVar30._16_4_ = auVar305._16_4_ * fVar256;
    fVar259 = auVar24._20_4_;
    auVar30._20_4_ = auVar305._20_4_ * fVar259;
    fVar292 = auVar24._24_4_;
    auVar30._24_4_ = auVar305._24_4_ * fVar292;
    auVar30._28_4_ = auVar208._28_4_;
    auVar22 = vsubps_avx(auVar29,auVar30);
    auVar21 = vmaxps_avx(_local_880,auVar250);
    auVar31._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar276 * fVar276 + fVar224 * fVar224);
    auVar31._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar262 * fVar262 + fVar271 * fVar271);
    auVar31._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar241 * fVar241 + fVar243 * fVar243);
    auVar31._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar247 * fVar247 + fVar252 * fVar252);
    auVar31._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar254 * fVar254 + fVar256 * fVar256);
    auVar31._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
    auVar31._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar260 * fVar260 + fVar292 * fVar292);
    auVar31._28_4_ = auVar232._28_4_ + auVar208._28_4_;
    auVar32._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar32._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar32._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar32._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar32._16_4_ = auVar22._16_4_ * auVar22._16_4_;
    auVar32._20_4_ = auVar22._20_4_ * auVar22._20_4_;
    auVar32._24_4_ = auVar22._24_4_ * auVar22._24_4_;
    auVar32._28_4_ = auVar22._28_4_;
    auVar21 = vcmpps_avx(auVar32,auVar31,2);
    local_5e0._0_4_ = (undefined4)(int)uVar15;
    local_5e0._4_12_ = auVar304._4_12_;
    auVar228 = ZEXT416((uint)(auVar229._0_4_ * 4.7683716e-07));
    local_840._0_16_ = auVar228;
    auVar229 = vshufps_avx(local_5e0,local_5e0,0);
    auVar209._16_16_ = auVar229;
    auVar209._0_16_ = auVar229;
    auVar22 = vcmpps_avx(_DAT_01f7b060,auVar209,1);
    auVar114._8_4_ = auVar202._8_4_;
    auVar114._0_8_ = auVar202._0_8_;
    auVar114._12_4_ = auVar202._12_4_;
    auVar229 = vpermilps_avx(auVar114,0xaa);
    register0x00001550 = auVar229;
    _local_1a0 = auVar229;
    auVar189 = vpermilps_avx(auVar361,0xaa);
    register0x00001590 = auVar189;
    _local_440 = auVar189;
    auVar203 = vpermilps_avx(auVar226,0xaa);
    register0x00001410 = auVar203;
    _local_c0 = auVar203;
    auVar193 = vpermilps_avx(auVar163,0xaa);
    register0x00001310 = auVar193;
    _local_6e0 = auVar193;
    auVar25 = auVar22 & auVar21;
    local_820 = *(uint *)(ray + k * 4 + 0x30);
    uStack_81c = 0;
    uStack_818 = 0;
    uStack_814 = 0;
    uStack_6f8 = auVar226._8_8_;
    local_700 = CONCAT44(0,uVar130);
    local_5f0 = ZEXT416(uVar130);
    uStack_5c8 = auVar163._8_8_;
    local_5d0 = CONCAT44(0,uVar127);
    auVar191 = ZEXT416(uVar127);
    fVar262 = fVar248;
    fVar271 = fVar253;
    fVar276 = fVar255;
    fVar224 = fVar257;
    fVar241 = fVar160;
    fVar243 = fVar178;
    fVar247 = fVar179;
    fVar252 = fVar180;
    _local_7c0 = auVar338;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0x7f,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar25 >> 0xbf,0) == '\0') &&
        (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f]) {
      auVar325 = ZEXT3264(auVar147);
      auVar344 = ZEXT3264(_local_720);
      auVar336 = ZEXT3264(_local_760);
    }
    else {
      auVar191 = ZEXT416(uVar127);
      local_5c0._0_16_ = auVar191;
      local_300 = vandps_avx(auVar21,auVar22);
      fVar347 = auVar229._0_4_;
      fVar352 = auVar229._4_4_;
      fVar353 = auVar229._8_4_;
      fVar354 = auVar229._12_4_;
      fVar355 = auVar189._0_4_;
      fVar358 = auVar189._4_4_;
      fVar359 = auVar189._8_4_;
      fVar360 = auVar189._12_4_;
      fVar302 = auVar203._0_4_;
      fVar309 = auVar203._4_4_;
      fVar310 = auVar203._8_4_;
      fVar313 = auVar203._12_4_;
      local_480._0_4_ = auVar123._0_4_;
      local_480._4_4_ = auVar123._4_4_;
      fStack_478 = auVar123._8_4_;
      fStack_474 = auVar123._12_4_;
      fStack_470 = auVar123._16_4_;
      fStack_46c = auVar123._20_4_;
      fStack_468 = auVar123._24_4_;
      fVar200 = auVar193._0_4_;
      fVar238 = auVar193._4_4_;
      fVar240 = auVar193._8_4_;
      fVar242 = auVar193._12_4_;
      local_480._0_4_ =
           fVar347 * fVar159 +
           fVar355 * fVar295 + fVar302 * fVar346 + fVar200 * (float)local_480._0_4_;
      local_480._4_4_ =
           fVar352 * fVar182 +
           fVar358 * fVar314 + fVar309 * fVar303 + fVar238 * (float)local_480._4_4_;
      fStack_478 = fVar353 * fVar280 + fVar359 * fVar315 + fVar310 * fVar217 + fVar240 * fStack_478;
      fStack_474 = fVar354 * fVar333 + fVar360 * fVar221 + fVar313 * fVar293 + fVar242 * fStack_474;
      fStack_470 = fVar347 * fVar137 + fVar355 * fVar297 + fVar302 * fVar311 + fVar200 * fStack_470;
      fStack_46c = fVar352 * fVar155 + fVar358 * fVar316 + fVar309 * fVar312 + fVar238 * fStack_46c;
      fStack_468 = fVar353 * fVar156 + fVar359 * fVar317 + fVar310 * fVar219 + fVar240 * fStack_468;
      fStack_464 = local_300._28_4_ +
                   auVar22._28_4_ + *(float *)(bezier_basis1 + lVar136 + 0x4a0) + 0.0;
      local_460._0_4_ = auVar122._0_4_;
      local_460._4_4_ = auVar122._4_4_;
      fStack_458 = auVar122._8_4_;
      fStack_454 = auVar122._12_4_;
      fStack_450 = auVar122._16_4_;
      fStack_44c = auVar122._20_4_;
      fStack_448 = auVar122._24_4_;
      local_560._0_4_ = auVar121._0_4_;
      local_560._4_4_ = auVar121._4_4_;
      fStack_558 = auVar121._8_4_;
      fStack_554 = auVar121._12_4_;
      auStack_550._0_4_ = auVar121._16_4_;
      auStack_550._4_4_ = auVar121._20_4_;
      fStack_548 = auVar121._24_4_;
      local_5a0._0_4_ = auVar120._0_4_;
      local_5a0._4_4_ = auVar120._4_4_;
      fStack_598 = auVar120._8_4_;
      fStack_594 = auVar120._12_4_;
      fStack_590 = auVar120._16_4_;
      fStack_58c = auVar120._20_4_;
      fStack_588 = auVar120._24_4_;
      local_6a0._0_4_ = auVar119._0_4_;
      local_6a0._4_4_ = auVar119._4_4_;
      fStack_698 = auVar119._8_4_;
      fStack_694 = auVar119._12_4_;
      fStack_690 = auVar119._16_4_;
      fStack_68c = auVar119._20_4_;
      fStack_688 = auVar119._24_4_;
      local_5a0._0_4_ =
           fVar347 * (float)local_460._0_4_ +
           fVar355 * (float)local_560._0_4_ +
           fVar302 * (float)local_5a0._0_4_ + fVar200 * (float)local_6a0._0_4_;
      local_5a0._4_4_ =
           fVar352 * (float)local_460._4_4_ +
           fVar358 * (float)local_560._4_4_ +
           fVar309 * (float)local_5a0._4_4_ + fVar238 * (float)local_6a0._4_4_;
      fStack_598 = fVar353 * fStack_458 +
                   fVar359 * fStack_558 + fVar310 * fStack_598 + fVar240 * fStack_698;
      fStack_594 = fVar354 * fStack_454 +
                   fVar360 * fStack_554 + fVar313 * fStack_594 + fVar242 * fStack_694;
      fStack_590 = fVar347 * fStack_450 +
                   fVar355 * (float)auStack_550._0_4_ + fVar302 * fStack_590 + fVar200 * fStack_690;
      fStack_58c = fVar352 * fStack_44c +
                   fVar358 * (float)auStack_550._4_4_ + fVar309 * fStack_58c + fVar238 * fStack_68c;
      fStack_588 = fVar353 * fStack_448 +
                   fVar359 * fStack_548 + fVar310 * fStack_588 + fVar240 * fStack_688;
      fStack_584 = fVar301 + fStack_464 + local_300._28_4_ + auVar22._28_4_;
      fVar254 = *(float *)(bezier_basis0 + lVar136 + 0x1210);
      fVar256 = *(float *)(bezier_basis0 + lVar136 + 0x1214);
      fVar258 = *(float *)(bezier_basis0 + lVar136 + 0x1218);
      fVar259 = *(float *)(bezier_basis0 + lVar136 + 0x121c);
      fVar260 = *(float *)(bezier_basis0 + lVar136 + 0x1220);
      fVar292 = *(float *)(bezier_basis0 + lVar136 + 0x1224);
      fVar346 = *(float *)(bezier_basis0 + lVar136 + 0x1228);
      fVar303 = *(float *)(bezier_basis0 + lVar136 + 0x1694);
      fVar217 = *(float *)(bezier_basis0 + lVar136 + 0x1698);
      fVar293 = *(float *)(bezier_basis0 + lVar136 + 0x169c);
      fVar311 = *(float *)(bezier_basis0 + lVar136 + 0x16a0);
      fVar312 = *(float *)(bezier_basis0 + lVar136 + 0x16a4);
      fVar219 = *(float *)(bezier_basis0 + lVar136 + 0x16a8);
      fVar295 = *(float *)(bezier_basis0 + lVar136 + 0x16ac);
      fVar314 = *(float *)(bezier_basis0 + lVar136 + 0x1b18);
      fVar315 = *(float *)(bezier_basis0 + lVar136 + 0x1b1c);
      fVar221 = *(float *)(bezier_basis0 + lVar136 + 0x1b20);
      fVar297 = *(float *)(bezier_basis0 + lVar136 + 0x1b24);
      fVar316 = *(float *)(bezier_basis0 + lVar136 + 0x1b28);
      fVar317 = *(float *)(bezier_basis0 + lVar136 + 0x1b2c);
      fVar159 = *(float *)(bezier_basis0 + lVar136 + 0x1b30);
      fVar182 = *(float *)(bezier_basis0 + lVar136 + 0x1f9c);
      fVar280 = *(float *)(bezier_basis0 + lVar136 + 0x1fa0);
      fVar333 = *(float *)(bezier_basis0 + lVar136 + 0x1fa4);
      fVar137 = *(float *)(bezier_basis0 + lVar136 + 0x1fa8);
      fVar155 = *(float *)(bezier_basis0 + lVar136 + 0x1fac);
      fVar156 = *(float *)(bezier_basis0 + lVar136 + 0x1fb0);
      fVar158 = *(float *)(bezier_basis0 + lVar136 + 0x1fb4);
      fVar278 = *(float *)(bezier_basis1 + lVar136 + 0x4a0) + 0.0;
      fVar181 = *(float *)(bezier_basis0 + lVar136 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar136 + 0x1fb8);
      fVar326 = fVar278 + *(float *)(bezier_basis1 + lVar136 + 0x1c) + 0.0;
      fVar300 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) + fVar181;
      local_460._4_4_ =
           fVar246 * fVar256 + fVar217 * fVar274 + fVar178 * fVar315 + fVar296 * fVar280;
      local_460._0_4_ =
           fVar157 * fVar254 + fVar303 * fVar272 + fVar160 * fVar314 + fVar294 * fVar182;
      fStack_458 = fVar261 * fVar258 + fVar293 * fVar237 + fVar179 * fVar221 + fVar298 * fVar333;
      fStack_454 = fVar279 * fVar259 + fVar311 * fVar244 + fVar180 * fVar297 + fVar299 * fVar137;
      fStack_450 = fVar157 * fVar260 + fVar312 * fVar272 + fVar160 * fVar316 + fVar294 * fVar155;
      fStack_44c = fVar246 * fVar292 + fVar219 * fVar274 + fVar178 * fVar317 + fVar296 * fVar156;
      fStack_448 = fVar261 * fVar346 + fVar295 * fVar237 + fVar179 * fVar159 + fVar298 * fVar158;
      fStack_444 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar136 + 0x1fb8) + fVar278;
      auVar170._0_4_ = fVar273 * fVar303 + fVar215 * fVar314 + fVar248 * fVar182 + fVar220 * fVar254
      ;
      auVar170._4_4_ = fVar275 * fVar217 + fVar216 * fVar315 + fVar253 * fVar280 + fVar222 * fVar256
      ;
      auVar170._8_4_ = fVar239 * fVar293 + fVar218 * fVar221 + fVar255 * fVar333 + fVar223 * fVar258
      ;
      auVar170._12_4_ =
           fVar245 * fVar311 + fVar277 * fVar297 + fVar257 * fVar137 + fVar301 * fVar259;
      auVar170._16_4_ =
           fVar273 * fVar312 + fVar215 * fVar316 + fVar248 * fVar155 + fVar220 * fVar260;
      auVar170._20_4_ =
           fVar275 * fVar219 + fVar216 * fVar317 + fVar253 * fVar156 + fVar222 * fVar292;
      auVar170._24_4_ =
           fVar239 * fVar295 + fVar218 * fVar159 + fVar255 * fVar158 + fVar223 * fVar346;
      auVar170._28_4_ = fVar326 + fVar181;
      local_4a0 = fVar347 * fVar254 + fVar355 * fVar303 + fVar302 * fVar314 + fVar200 * fVar182;
      fStack_49c = fVar352 * fVar256 + fVar358 * fVar217 + fVar309 * fVar315 + fVar238 * fVar280;
      fStack_498 = fVar353 * fVar258 + fVar359 * fVar293 + fVar310 * fVar221 + fVar240 * fVar333;
      fStack_494 = fVar354 * fVar259 + fVar360 * fVar311 + fVar313 * fVar297 + fVar242 * fVar137;
      fStack_490 = fVar347 * fVar260 + fVar355 * fVar312 + fVar302 * fVar316 + fVar200 * fVar155;
      fStack_48c = fVar352 * fVar292 + fVar358 * fVar219 + fVar309 * fVar317 + fVar238 * fVar156;
      fStack_488 = fVar353 * fVar346 + fVar359 * fVar295 + fVar310 * fVar159 + fVar240 * fVar158;
      fStack_484 = *(float *)(bezier_basis0 + lVar136 + 0x122c) + fVar300;
      fVar254 = *(float *)(bezier_basis1 + lVar136 + 0x1b18);
      fVar256 = *(float *)(bezier_basis1 + lVar136 + 0x1b1c);
      fVar258 = *(float *)(bezier_basis1 + lVar136 + 0x1b20);
      fVar259 = *(float *)(bezier_basis1 + lVar136 + 0x1b24);
      fVar260 = *(float *)(bezier_basis1 + lVar136 + 0x1b28);
      fVar292 = *(float *)(bezier_basis1 + lVar136 + 0x1b2c);
      fVar346 = *(float *)(bezier_basis1 + lVar136 + 0x1b30);
      fVar303 = *(float *)(bezier_basis1 + lVar136 + 0x1f9c);
      fVar217 = *(float *)(bezier_basis1 + lVar136 + 0x1fa0);
      fVar293 = *(float *)(bezier_basis1 + lVar136 + 0x1fa4);
      fVar311 = *(float *)(bezier_basis1 + lVar136 + 0x1fa8);
      fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x1fac);
      fVar219 = *(float *)(bezier_basis1 + lVar136 + 0x1fb0);
      fVar295 = *(float *)(bezier_basis1 + lVar136 + 0x1fb4);
      fVar314 = *(float *)(bezier_basis1 + lVar136 + 0x1694);
      fVar315 = *(float *)(bezier_basis1 + lVar136 + 0x1698);
      fVar221 = *(float *)(bezier_basis1 + lVar136 + 0x169c);
      fVar297 = *(float *)(bezier_basis1 + lVar136 + 0x16a0);
      fVar316 = *(float *)(bezier_basis1 + lVar136 + 0x16a4);
      fVar317 = *(float *)(bezier_basis1 + lVar136 + 0x16a8);
      fVar159 = *(float *)(bezier_basis1 + lVar136 + 0x16ac);
      fVar182 = *(float *)(bezier_basis1 + lVar136 + 0x1210);
      fVar280 = *(float *)(bezier_basis1 + lVar136 + 0x1214);
      fVar333 = *(float *)(bezier_basis1 + lVar136 + 0x1218);
      fVar137 = *(float *)(bezier_basis1 + lVar136 + 0x121c);
      fVar155 = *(float *)(bezier_basis1 + lVar136 + 0x1220);
      fVar156 = *(float *)(bezier_basis1 + lVar136 + 0x1224);
      fVar158 = *(float *)(bezier_basis1 + lVar136 + 0x1228);
      auVar288._0_4_ = fVar157 * fVar182 + fVar314 * fVar272 + fVar160 * fVar254 + fVar294 * fVar303
      ;
      auVar288._4_4_ = fVar246 * fVar280 + fVar315 * fVar274 + fVar178 * fVar256 + fVar296 * fVar217
      ;
      auVar288._8_4_ = fVar261 * fVar333 + fVar221 * fVar237 + fVar179 * fVar258 + fVar298 * fVar293
      ;
      auVar288._12_4_ =
           fVar279 * fVar137 + fVar297 * fVar244 + fVar180 * fVar259 + fVar299 * fVar311;
      auVar288._16_4_ =
           fVar157 * fVar155 + fVar316 * fVar272 + fVar160 * fVar260 + fVar294 * fVar312;
      auVar288._20_4_ =
           fVar246 * fVar156 + fVar317 * fVar274 + fVar178 * fVar292 + fVar296 * fVar219;
      auVar288._24_4_ =
           fVar261 * fVar158 + fVar159 * fVar237 + fVar179 * fVar346 + fVar298 * fVar295;
      auVar288._28_4_ = fVar180 + fVar180 + fVar326 + fVar300;
      auVar321._0_4_ = fVar220 * fVar182 + fVar273 * fVar314 + fVar215 * fVar254 + fVar248 * fVar303
      ;
      auVar321._4_4_ = fVar222 * fVar280 + fVar275 * fVar315 + fVar216 * fVar256 + fVar253 * fVar217
      ;
      auVar321._8_4_ = fVar223 * fVar333 + fVar239 * fVar221 + fVar218 * fVar258 + fVar255 * fVar293
      ;
      auVar321._12_4_ =
           fVar301 * fVar137 + fVar245 * fVar297 + fVar277 * fVar259 + fVar257 * fVar311;
      auVar321._16_4_ =
           fVar220 * fVar155 + fVar273 * fVar316 + fVar215 * fVar260 + fVar248 * fVar312;
      auVar321._20_4_ =
           fVar222 * fVar156 + fVar275 * fVar317 + fVar216 * fVar292 + fVar253 * fVar219;
      auVar321._24_4_ =
           fVar223 * fVar158 + fVar239 * fVar159 + fVar218 * fVar346 + fVar255 * fVar295;
      auVar321._28_4_ = fVar180 + fVar180 + fVar180 + fVar326;
      auVar197._0_4_ = fVar347 * fVar182 + fVar355 * fVar314 + fVar302 * fVar254 + fVar200 * fVar303
      ;
      auVar197._4_4_ = fVar352 * fVar280 + fVar358 * fVar315 + fVar309 * fVar256 + fVar238 * fVar217
      ;
      auVar197._8_4_ = fVar353 * fVar333 + fVar359 * fVar221 + fVar310 * fVar258 + fVar240 * fVar293
      ;
      auVar197._12_4_ =
           fVar354 * fVar137 + fVar360 * fVar297 + fVar313 * fVar259 + fVar242 * fVar311;
      auVar197._16_4_ =
           fVar347 * fVar155 + fVar355 * fVar316 + fVar302 * fVar260 + fVar200 * fVar312;
      auVar197._20_4_ =
           fVar352 * fVar156 + fVar358 * fVar317 + fVar309 * fVar292 + fVar238 * fVar219;
      auVar197._24_4_ =
           fVar353 * fVar158 + fVar359 * fVar159 + fVar310 * fVar346 + fVar240 * fVar295;
      auVar197._28_4_ =
           *(float *)(bezier_basis1 + lVar136 + 0x122c) +
           *(float *)(bezier_basis1 + lVar136 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar136 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar136 + 0x1fb8);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar233._16_4_ = 0x7fffffff;
      auVar233._20_4_ = 0x7fffffff;
      auVar233._24_4_ = 0x7fffffff;
      auVar233._28_4_ = 0x7fffffff;
      auVar21 = vandps_avx(_local_460,auVar233);
      auVar22 = vandps_avx(auVar170,auVar233);
      auVar22 = vmaxps_avx(auVar21,auVar22);
      auVar117._4_4_ = fStack_49c;
      auVar117._0_4_ = local_4a0;
      auVar117._8_4_ = fStack_498;
      auVar117._12_4_ = fStack_494;
      auVar117._16_4_ = fStack_490;
      auVar117._20_4_ = fStack_48c;
      auVar117._24_4_ = fStack_488;
      auVar117._28_4_ = fStack_484;
      auVar21 = vandps_avx(auVar233,auVar117);
      auVar21 = vmaxps_avx(auVar22,auVar21);
      auVar229 = vpermilps_avx(auVar228,0);
      auVar267._16_16_ = auVar229;
      auVar267._0_16_ = auVar229;
      auVar21 = vcmpps_avx(auVar21,auVar267,1);
      auVar25 = vblendvps_avx(_local_460,auVar23,auVar21);
      auVar26 = vblendvps_avx(auVar170,auVar24,auVar21);
      auVar21 = vandps_avx(auVar288,auVar233);
      auVar22 = vandps_avx(auVar321,auVar233);
      auVar27 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vandps_avx(auVar197,auVar233);
      auVar21 = vmaxps_avx(auVar27,auVar21);
      auVar27 = vcmpps_avx(auVar21,auVar267,1);
      auVar21 = vblendvps_avx(auVar288,auVar23,auVar27);
      auVar23 = vblendvps_avx(auVar321,auVar24,auVar27);
      fVar156 = auVar25._0_4_;
      fVar157 = auVar25._4_4_;
      fVar246 = auVar25._8_4_;
      fVar261 = auVar25._12_4_;
      fVar279 = auVar25._16_4_;
      fVar158 = auVar25._20_4_;
      fVar181 = auVar25._24_4_;
      fVar200 = auVar21._0_4_;
      fVar215 = auVar21._4_4_;
      fVar216 = auVar21._8_4_;
      fVar218 = auVar21._12_4_;
      fVar220 = auVar21._16_4_;
      fVar222 = auVar21._20_4_;
      fVar223 = auVar21._24_4_;
      fVar301 = -auVar21._28_4_;
      fVar273 = auVar26._0_4_;
      fVar256 = auVar26._4_4_;
      fVar292 = auVar26._8_4_;
      fVar293 = auVar26._12_4_;
      fVar295 = auVar26._16_4_;
      fVar297 = auVar26._20_4_;
      fVar182 = auVar26._24_4_;
      auVar143._0_4_ = fVar273 * fVar273 + fVar156 * fVar156;
      auVar143._4_4_ = fVar256 * fVar256 + fVar157 * fVar157;
      auVar143._8_4_ = fVar292 * fVar292 + fVar246 * fVar246;
      auVar143._12_4_ = fVar293 * fVar293 + fVar261 * fVar261;
      auVar143._16_4_ = fVar295 * fVar295 + fVar279 * fVar279;
      auVar143._20_4_ = fVar297 * fVar297 + fVar158 * fVar158;
      auVar143._24_4_ = fVar182 * fVar182 + fVar181 * fVar181;
      auVar143._28_4_ = auVar321._28_4_ + auVar25._28_4_;
      auVar24 = vrsqrtps_avx(auVar143);
      fVar275 = auVar24._0_4_;
      fVar239 = auVar24._4_4_;
      auVar33._4_4_ = fVar239 * 1.5;
      auVar33._0_4_ = fVar275 * 1.5;
      fVar254 = auVar24._8_4_;
      auVar33._8_4_ = fVar254 * 1.5;
      fVar258 = auVar24._12_4_;
      auVar33._12_4_ = fVar258 * 1.5;
      fVar259 = auVar24._16_4_;
      auVar33._16_4_ = fVar259 * 1.5;
      fVar260 = auVar24._20_4_;
      auVar33._20_4_ = fVar260 * 1.5;
      fVar346 = auVar24._24_4_;
      fVar155 = auVar22._28_4_;
      auVar33._24_4_ = fVar346 * 1.5;
      auVar33._28_4_ = fVar155;
      auVar34._4_4_ = fVar239 * fVar239 * fVar239 * auVar143._4_4_ * 0.5;
      auVar34._0_4_ = fVar275 * fVar275 * fVar275 * auVar143._0_4_ * 0.5;
      auVar34._8_4_ = fVar254 * fVar254 * fVar254 * auVar143._8_4_ * 0.5;
      auVar34._12_4_ = fVar258 * fVar258 * fVar258 * auVar143._12_4_ * 0.5;
      auVar34._16_4_ = fVar259 * fVar259 * fVar259 * auVar143._16_4_ * 0.5;
      auVar34._20_4_ = fVar260 * fVar260 * fVar260 * auVar143._20_4_ * 0.5;
      auVar34._24_4_ = fVar346 * fVar346 * fVar346 * auVar143._24_4_ * 0.5;
      auVar34._28_4_ = auVar143._28_4_;
      auVar22 = vsubps_avx(auVar33,auVar34);
      fVar275 = auVar22._0_4_;
      fVar258 = auVar22._4_4_;
      fVar346 = auVar22._8_4_;
      fVar311 = auVar22._12_4_;
      fVar314 = auVar22._16_4_;
      fVar316 = auVar22._20_4_;
      fVar280 = auVar22._24_4_;
      fVar239 = auVar23._0_4_;
      fVar259 = auVar23._4_4_;
      fVar303 = auVar23._8_4_;
      fVar312 = auVar23._12_4_;
      fVar315 = auVar23._16_4_;
      fVar317 = auVar23._20_4_;
      fVar333 = auVar23._24_4_;
      auVar144._0_4_ = fVar239 * fVar239 + fVar200 * fVar200;
      auVar144._4_4_ = fVar259 * fVar259 + fVar215 * fVar215;
      auVar144._8_4_ = fVar303 * fVar303 + fVar216 * fVar216;
      auVar144._12_4_ = fVar312 * fVar312 + fVar218 * fVar218;
      auVar144._16_4_ = fVar315 * fVar315 + fVar220 * fVar220;
      auVar144._20_4_ = fVar317 * fVar317 + fVar222 * fVar222;
      auVar144._24_4_ = fVar333 * fVar333 + fVar223 * fVar223;
      auVar144._28_4_ = auVar21._28_4_ + auVar22._28_4_;
      auVar21 = vrsqrtps_avx(auVar144);
      fVar254 = auVar21._0_4_;
      fVar260 = auVar21._4_4_;
      auVar35._4_4_ = fVar260 * 1.5;
      auVar35._0_4_ = fVar254 * 1.5;
      fVar217 = auVar21._8_4_;
      auVar35._8_4_ = fVar217 * 1.5;
      fVar219 = auVar21._12_4_;
      auVar35._12_4_ = fVar219 * 1.5;
      fVar221 = auVar21._16_4_;
      auVar35._16_4_ = fVar221 * 1.5;
      fVar159 = auVar21._20_4_;
      auVar35._20_4_ = fVar159 * 1.5;
      fVar137 = auVar21._24_4_;
      auVar35._24_4_ = fVar137 * 1.5;
      auVar35._28_4_ = fVar155;
      auVar36._4_4_ = fVar260 * fVar260 * fVar260 * auVar144._4_4_ * 0.5;
      auVar36._0_4_ = fVar254 * fVar254 * fVar254 * auVar144._0_4_ * 0.5;
      auVar36._8_4_ = fVar217 * fVar217 * fVar217 * auVar144._8_4_ * 0.5;
      auVar36._12_4_ = fVar219 * fVar219 * fVar219 * auVar144._12_4_ * 0.5;
      auVar36._16_4_ = fVar221 * fVar221 * fVar221 * auVar144._16_4_ * 0.5;
      auVar36._20_4_ = fVar159 * fVar159 * fVar159 * auVar144._20_4_ * 0.5;
      auVar36._24_4_ = fVar137 * fVar137 * fVar137 * auVar144._24_4_ * 0.5;
      auVar36._28_4_ = auVar144._28_4_;
      auVar21 = vsubps_avx(auVar35,auVar36);
      fVar254 = auVar21._0_4_;
      fVar260 = auVar21._4_4_;
      fVar217 = auVar21._8_4_;
      fVar219 = auVar21._12_4_;
      fVar221 = auVar21._16_4_;
      fVar159 = auVar21._20_4_;
      fVar137 = auVar21._24_4_;
      fVar273 = (float)local_880._0_4_ * fVar273 * fVar275;
      fVar256 = (float)local_880._4_4_ * fVar256 * fVar258;
      auVar37._4_4_ = fVar256;
      auVar37._0_4_ = fVar273;
      fVar292 = fStack_878 * fVar292 * fVar346;
      auVar37._8_4_ = fVar292;
      fVar293 = fStack_874 * fVar293 * fVar311;
      auVar37._12_4_ = fVar293;
      fVar295 = fStack_870 * fVar295 * fVar314;
      auVar37._16_4_ = fVar295;
      fVar297 = fStack_86c * fVar297 * fVar316;
      auVar37._20_4_ = fVar297;
      fVar182 = fStack_868 * fVar182 * fVar280;
      auVar37._24_4_ = fVar182;
      auVar37._28_4_ = fVar301;
      local_6a0._4_4_ = auVar304._4_4_ + fVar256;
      local_6a0._0_4_ = auVar304._0_4_ + fVar273;
      fStack_698 = auVar304._8_4_ + fVar292;
      fStack_694 = auVar304._12_4_ + fVar293;
      fStack_690 = auVar305._16_4_ + fVar295;
      fStack_68c = auVar305._20_4_ + fVar297;
      fStack_688 = auVar305._24_4_ + fVar182;
      fStack_684 = auVar305._28_4_ + fVar301;
      fVar273 = (float)local_880._0_4_ * fVar275 * -fVar156;
      fVar256 = (float)local_880._4_4_ * fVar258 * -fVar157;
      auVar38._4_4_ = fVar256;
      auVar38._0_4_ = fVar273;
      fVar292 = fStack_878 * fVar346 * -fVar246;
      auVar38._8_4_ = fVar292;
      fVar293 = fStack_874 * fVar311 * -fVar261;
      auVar38._12_4_ = fVar293;
      fVar295 = fStack_870 * fVar314 * -fVar279;
      auVar38._16_4_ = fVar295;
      fVar297 = fStack_86c * fVar316 * -fVar158;
      auVar38._20_4_ = fVar297;
      fVar182 = fStack_868 * fVar280 * -fVar181;
      auVar38._24_4_ = fVar182;
      auVar38._28_4_ = fVar155;
      local_560._4_4_ = fVar256 + auVar320._4_4_;
      local_560._0_4_ = fVar273 + auVar320._0_4_;
      fStack_558 = fVar292 + auVar320._8_4_;
      fStack_554 = fVar293 + auVar320._12_4_;
      auStack_550._0_4_ = fVar295 + auVar320._16_4_;
      auStack_550._4_4_ = fVar297 + auVar320._20_4_;
      fStack_548 = fVar182 + auVar320._24_4_;
      fStack_544 = fVar155 + 0.0;
      fVar273 = (float)local_880._0_4_ * fVar275 * 0.0;
      fVar275 = (float)local_880._4_4_ * fVar258 * 0.0;
      auVar39._4_4_ = fVar275;
      auVar39._0_4_ = fVar273;
      fVar256 = fStack_878 * fVar346 * 0.0;
      auVar39._8_4_ = fVar256;
      fVar258 = fStack_874 * fVar311 * 0.0;
      auVar39._12_4_ = fVar258;
      fVar292 = fStack_870 * fVar314 * 0.0;
      auVar39._16_4_ = fVar292;
      fVar346 = fStack_86c * fVar316 * 0.0;
      auVar39._20_4_ = fVar346;
      fVar293 = fStack_868 * fVar280 * 0.0;
      auVar39._24_4_ = fVar293;
      auVar39._28_4_ = fVar277;
      auVar268._0_4_ = fVar273 + (float)local_5a0._0_4_;
      auVar268._4_4_ = fVar275 + (float)local_5a0._4_4_;
      auVar268._8_4_ = fVar256 + fStack_598;
      auVar268._12_4_ = fVar258 + fStack_594;
      auVar268._16_4_ = fVar292 + fStack_590;
      auVar268._20_4_ = fVar346 + fStack_58c;
      auVar268._24_4_ = fVar293 + fStack_588;
      auVar268._28_4_ = fVar277 + fStack_584;
      fVar273 = auVar250._0_4_ * fVar239 * fVar254;
      fVar275 = auVar250._4_4_ * fVar259 * fVar260;
      auVar40._4_4_ = fVar275;
      auVar40._0_4_ = fVar273;
      fVar239 = auVar250._8_4_ * fVar303 * fVar217;
      auVar40._8_4_ = fVar239;
      fVar256 = auVar250._12_4_ * fVar312 * fVar219;
      auVar40._12_4_ = fVar256;
      fVar258 = auVar250._16_4_ * fVar315 * fVar221;
      auVar40._16_4_ = fVar258;
      fVar259 = auVar250._20_4_ * fVar317 * fVar159;
      auVar40._20_4_ = fVar259;
      fVar292 = auVar250._24_4_ * fVar333 * fVar137;
      auVar40._24_4_ = fVar292;
      auVar40._28_4_ = auVar23._28_4_;
      auVar27 = vsubps_avx(auVar305,auVar37);
      auVar322._0_4_ = auVar232._0_4_ + fVar273;
      auVar322._4_4_ = auVar232._4_4_ + fVar275;
      auVar322._8_4_ = auVar232._8_4_ + fVar239;
      auVar322._12_4_ = auVar232._12_4_ + fVar256;
      auVar322._16_4_ = auVar232._16_4_ + fVar258;
      auVar322._20_4_ = auVar232._20_4_ + fVar259;
      auVar322._24_4_ = auVar232._24_4_ + fVar292;
      auVar322._28_4_ = auVar232._28_4_ + auVar23._28_4_;
      fVar273 = auVar250._0_4_ * fVar254 * -fVar200;
      fVar275 = auVar250._4_4_ * fVar260 * -fVar215;
      auVar41._4_4_ = fVar275;
      auVar41._0_4_ = fVar273;
      fVar239 = auVar250._8_4_ * fVar217 * -fVar216;
      auVar41._8_4_ = fVar239;
      fVar256 = auVar250._12_4_ * fVar219 * -fVar218;
      auVar41._12_4_ = fVar256;
      fVar258 = auVar250._16_4_ * fVar221 * -fVar220;
      auVar41._16_4_ = fVar258;
      fVar259 = auVar250._20_4_ * fVar159 * -fVar222;
      auVar41._20_4_ = fVar259;
      fVar292 = auVar250._24_4_ * fVar137 * -fVar223;
      auVar41._24_4_ = fVar292;
      auVar41._28_4_ = fVar354;
      auVar28 = vsubps_avx(auVar320,auVar38);
      auVar329._0_4_ = fVar273 + auVar208._0_4_;
      auVar329._4_4_ = fVar275 + auVar208._4_4_;
      auVar329._8_4_ = fVar239 + auVar208._8_4_;
      auVar329._12_4_ = fVar256 + auVar208._12_4_;
      auVar329._16_4_ = fVar258 + auVar208._16_4_;
      auVar329._20_4_ = fVar259 + auVar208._20_4_;
      auVar329._24_4_ = fVar292 + auVar208._24_4_;
      auVar329._28_4_ = fVar354 + auVar208._28_4_;
      fVar273 = auVar250._0_4_ * fVar254 * 0.0;
      fVar275 = auVar250._4_4_ * fVar260 * 0.0;
      auVar42._4_4_ = fVar275;
      auVar42._0_4_ = fVar273;
      fVar239 = auVar250._8_4_ * fVar217 * 0.0;
      auVar42._8_4_ = fVar239;
      fVar254 = auVar250._12_4_ * fVar219 * 0.0;
      auVar42._12_4_ = fVar254;
      fVar256 = auVar250._16_4_ * fVar221 * 0.0;
      auVar42._16_4_ = fVar256;
      fVar258 = auVar250._20_4_ * fVar159 * 0.0;
      auVar42._20_4_ = fVar258;
      fVar259 = auVar250._24_4_ * fVar137 * 0.0;
      auVar42._24_4_ = fVar259;
      auVar42._28_4_ = 0x3f000000;
      auVar19 = vsubps_avx(_local_5a0,auVar39);
      auVar357._0_4_ = fVar273 + (float)local_480._0_4_;
      auVar357._4_4_ = fVar275 + (float)local_480._4_4_;
      auVar357._8_4_ = fVar239 + fStack_478;
      auVar357._12_4_ = fVar254 + fStack_474;
      auVar357._16_4_ = fVar256 + fStack_470;
      auVar357._20_4_ = fVar258 + fStack_46c;
      auVar357._24_4_ = fVar259 + fStack_468;
      auVar357._28_4_ = fStack_464 + 0.5;
      auVar21 = vsubps_avx(auVar232,auVar40);
      auVar22 = vsubps_avx(auVar208,auVar41);
      auVar141 = vsubps_avx(_local_480,auVar42);
      auVar23 = vsubps_avx(auVar329,auVar28);
      auVar24 = vsubps_avx(auVar357,auVar19);
      auVar43._4_4_ = auVar19._4_4_ * auVar23._4_4_;
      auVar43._0_4_ = auVar19._0_4_ * auVar23._0_4_;
      auVar43._8_4_ = auVar19._8_4_ * auVar23._8_4_;
      auVar43._12_4_ = auVar19._12_4_ * auVar23._12_4_;
      auVar43._16_4_ = auVar19._16_4_ * auVar23._16_4_;
      auVar43._20_4_ = auVar19._20_4_ * auVar23._20_4_;
      auVar43._24_4_ = auVar19._24_4_ * auVar23._24_4_;
      auVar43._28_4_ = fVar245;
      auVar44._4_4_ = auVar28._4_4_ * auVar24._4_4_;
      auVar44._0_4_ = auVar28._0_4_ * auVar24._0_4_;
      auVar44._8_4_ = auVar28._8_4_ * auVar24._8_4_;
      auVar44._12_4_ = auVar28._12_4_ * auVar24._12_4_;
      auVar44._16_4_ = auVar28._16_4_ * auVar24._16_4_;
      auVar44._20_4_ = auVar28._20_4_ * auVar24._20_4_;
      auVar44._24_4_ = auVar28._24_4_ * auVar24._24_4_;
      auVar44._28_4_ = auVar208._28_4_;
      auVar25 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = auVar27._4_4_ * auVar24._4_4_;
      auVar45._0_4_ = auVar27._0_4_ * auVar24._0_4_;
      auVar45._8_4_ = auVar27._8_4_ * auVar24._8_4_;
      auVar45._12_4_ = auVar27._12_4_ * auVar24._12_4_;
      auVar45._16_4_ = auVar27._16_4_ * auVar24._16_4_;
      auVar45._20_4_ = auVar27._20_4_ * auVar24._20_4_;
      auVar45._24_4_ = auVar27._24_4_ * auVar24._24_4_;
      auVar45._28_4_ = auVar24._28_4_;
      auVar26 = vsubps_avx(auVar322,auVar27);
      auVar46._4_4_ = auVar19._4_4_ * auVar26._4_4_;
      auVar46._0_4_ = auVar19._0_4_ * auVar26._0_4_;
      auVar46._8_4_ = auVar19._8_4_ * auVar26._8_4_;
      auVar46._12_4_ = auVar19._12_4_ * auVar26._12_4_;
      auVar46._16_4_ = auVar19._16_4_ * auVar26._16_4_;
      auVar46._20_4_ = auVar19._20_4_ * auVar26._20_4_;
      auVar46._24_4_ = auVar19._24_4_ * auVar26._24_4_;
      auVar46._28_4_ = auVar232._28_4_;
      auVar20 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = auVar26._4_4_ * auVar28._4_4_;
      auVar47._0_4_ = auVar26._0_4_ * auVar28._0_4_;
      auVar47._8_4_ = auVar26._8_4_ * auVar28._8_4_;
      auVar47._12_4_ = auVar26._12_4_ * auVar28._12_4_;
      auVar47._16_4_ = auVar26._16_4_ * auVar28._16_4_;
      auVar47._20_4_ = auVar26._20_4_ * auVar28._20_4_;
      auVar47._24_4_ = auVar26._24_4_ * auVar28._24_4_;
      auVar47._28_4_ = auVar24._28_4_;
      auVar48._4_4_ = auVar27._4_4_ * auVar23._4_4_;
      auVar48._0_4_ = auVar27._0_4_ * auVar23._0_4_;
      auVar48._8_4_ = auVar27._8_4_ * auVar23._8_4_;
      auVar48._12_4_ = auVar27._12_4_ * auVar23._12_4_;
      auVar48._16_4_ = auVar27._16_4_ * auVar23._16_4_;
      auVar48._20_4_ = auVar27._20_4_ * auVar23._20_4_;
      auVar48._24_4_ = auVar27._24_4_ * auVar23._24_4_;
      auVar48._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(auVar48,auVar47);
      auVar145._0_4_ = auVar25._0_4_ * 0.0 + auVar23._0_4_ + auVar20._0_4_ * 0.0;
      auVar145._4_4_ = auVar25._4_4_ * 0.0 + auVar23._4_4_ + auVar20._4_4_ * 0.0;
      auVar145._8_4_ = auVar25._8_4_ * 0.0 + auVar23._8_4_ + auVar20._8_4_ * 0.0;
      auVar145._12_4_ = auVar25._12_4_ * 0.0 + auVar23._12_4_ + auVar20._12_4_ * 0.0;
      auVar145._16_4_ = auVar25._16_4_ * 0.0 + auVar23._16_4_ + auVar20._16_4_ * 0.0;
      auVar145._20_4_ = auVar25._20_4_ * 0.0 + auVar23._20_4_ + auVar20._20_4_ * 0.0;
      auVar145._24_4_ = auVar25._24_4_ * 0.0 + auVar23._24_4_ + auVar20._24_4_ * 0.0;
      auVar145._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar20._28_4_;
      auVar20 = vcmpps_avx(auVar145,ZEXT432(0) << 0x20,2);
      auVar21 = vblendvps_avx(auVar21,_local_6a0,auVar20);
      auVar22 = vblendvps_avx(auVar22,_local_560,auVar20);
      auVar23 = vblendvps_avx(auVar141,auVar268,auVar20);
      auVar24 = vblendvps_avx(auVar27,auVar322,auVar20);
      auVar25 = vblendvps_avx(auVar28,auVar329,auVar20);
      auVar26 = vblendvps_avx(auVar19,auVar357,auVar20);
      auVar27 = vblendvps_avx(auVar322,auVar27,auVar20);
      auVar28 = vblendvps_avx(auVar329,auVar28,auVar20);
      _local_620 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      _auStack_610 = auVar305._16_16_;
      auVar19 = vblendvps_avx(auVar357,auVar19,auVar20);
      auVar27 = vsubps_avx(auVar27,auVar21);
      auVar142 = vsubps_avx(auVar28,auVar22);
      auVar19 = vsubps_avx(auVar19,auVar23);
      auVar166 = vsubps_avx(auVar22,auVar25);
      fVar273 = auVar142._0_4_;
      fVar158 = auVar23._0_4_;
      fVar256 = auVar142._4_4_;
      fVar181 = auVar23._4_4_;
      auVar49._4_4_ = fVar181 * fVar256;
      auVar49._0_4_ = fVar158 * fVar273;
      fVar346 = auVar142._8_4_;
      fVar200 = auVar23._8_4_;
      auVar49._8_4_ = fVar200 * fVar346;
      fVar312 = auVar142._12_4_;
      fVar215 = auVar23._12_4_;
      auVar49._12_4_ = fVar215 * fVar312;
      fVar221 = auVar142._16_4_;
      fVar216 = auVar23._16_4_;
      auVar49._16_4_ = fVar216 * fVar221;
      fVar182 = auVar142._20_4_;
      fVar218 = auVar23._20_4_;
      auVar49._20_4_ = fVar218 * fVar182;
      fVar156 = auVar142._24_4_;
      fVar277 = auVar23._24_4_;
      auVar49._24_4_ = fVar277 * fVar156;
      auVar49._28_4_ = auVar28._28_4_;
      fVar275 = auVar22._0_4_;
      fVar299 = auVar19._0_4_;
      fVar258 = auVar22._4_4_;
      fVar238 = auVar19._4_4_;
      auVar50._4_4_ = fVar238 * fVar258;
      auVar50._0_4_ = fVar299 * fVar275;
      fVar303 = auVar22._8_4_;
      fVar240 = auVar19._8_4_;
      auVar50._8_4_ = fVar240 * fVar303;
      fVar219 = auVar22._12_4_;
      fVar242 = auVar19._12_4_;
      auVar50._12_4_ = fVar242 * fVar219;
      fVar297 = auVar22._16_4_;
      fVar278 = auVar19._16_4_;
      auVar50._16_4_ = fVar278 * fVar297;
      fVar280 = auVar22._20_4_;
      fVar300 = auVar19._20_4_;
      auVar50._20_4_ = fVar300 * fVar280;
      fVar157 = auVar22._24_4_;
      fVar302 = auVar19._24_4_;
      uVar135 = auVar141._28_4_;
      auVar50._24_4_ = fVar302 * fVar157;
      auVar50._28_4_ = uVar135;
      auVar28 = vsubps_avx(auVar50,auVar49);
      fVar239 = auVar21._0_4_;
      fVar259 = auVar21._4_4_;
      auVar51._4_4_ = fVar238 * fVar259;
      auVar51._0_4_ = fVar299 * fVar239;
      fVar217 = auVar21._8_4_;
      auVar51._8_4_ = fVar240 * fVar217;
      fVar295 = auVar21._12_4_;
      auVar51._12_4_ = fVar242 * fVar295;
      fVar316 = auVar21._16_4_;
      auVar51._16_4_ = fVar278 * fVar316;
      fVar333 = auVar21._20_4_;
      auVar51._20_4_ = fVar300 * fVar333;
      fVar246 = auVar21._24_4_;
      auVar51._24_4_ = fVar302 * fVar246;
      auVar51._28_4_ = uVar135;
      fVar245 = auVar27._0_4_;
      fVar260 = auVar27._4_4_;
      auVar52._4_4_ = fVar181 * fVar260;
      auVar52._0_4_ = fVar158 * fVar245;
      fVar293 = auVar27._8_4_;
      auVar52._8_4_ = fVar200 * fVar293;
      fVar314 = auVar27._12_4_;
      auVar52._12_4_ = fVar215 * fVar314;
      fVar317 = auVar27._16_4_;
      auVar52._16_4_ = fVar216 * fVar317;
      fVar137 = auVar27._20_4_;
      auVar52._20_4_ = fVar218 * fVar137;
      fVar261 = auVar27._24_4_;
      auVar52._24_4_ = fVar277 * fVar261;
      auVar52._28_4_ = auVar357._28_4_;
      auVar141 = vsubps_avx(auVar52,auVar51);
      auVar53._4_4_ = fVar258 * fVar260;
      auVar53._0_4_ = fVar275 * fVar245;
      auVar53._8_4_ = fVar303 * fVar293;
      auVar53._12_4_ = fVar219 * fVar314;
      auVar53._16_4_ = fVar297 * fVar317;
      auVar53._20_4_ = fVar280 * fVar137;
      auVar53._24_4_ = fVar157 * fVar261;
      auVar53._28_4_ = uVar135;
      auVar362._0_4_ = fVar239 * fVar273;
      auVar362._4_4_ = fVar259 * fVar256;
      auVar362._8_4_ = fVar217 * fVar346;
      auVar362._12_4_ = fVar295 * fVar312;
      auVar362._16_4_ = fVar316 * fVar221;
      auVar362._20_4_ = fVar333 * fVar182;
      auVar362._24_4_ = fVar246 * fVar156;
      auVar362._28_4_ = 0;
      auVar167 = vsubps_avx(auVar362,auVar53);
      auVar168 = vsubps_avx(auVar23,auVar26);
      fVar254 = auVar167._28_4_ + auVar141._28_4_;
      auVar171._0_4_ = auVar167._0_4_ + auVar141._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
      auVar171._4_4_ = auVar167._4_4_ + auVar141._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
      auVar171._8_4_ = auVar167._8_4_ + auVar141._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
      auVar171._12_4_ = auVar167._12_4_ + auVar141._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
      auVar171._16_4_ = auVar167._16_4_ + auVar141._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
      auVar171._20_4_ = auVar167._20_4_ + auVar141._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
      auVar171._24_4_ = auVar167._24_4_ + auVar141._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
      auVar171._28_4_ = fVar254 + auVar28._28_4_;
      fVar220 = auVar166._0_4_;
      fVar222 = auVar166._4_4_;
      auVar54._4_4_ = fVar222 * auVar26._4_4_;
      auVar54._0_4_ = fVar220 * auVar26._0_4_;
      fVar223 = auVar166._8_4_;
      auVar54._8_4_ = fVar223 * auVar26._8_4_;
      fVar301 = auVar166._12_4_;
      auVar54._12_4_ = fVar301 * auVar26._12_4_;
      fVar294 = auVar166._16_4_;
      auVar54._16_4_ = fVar294 * auVar26._16_4_;
      fVar296 = auVar166._20_4_;
      auVar54._20_4_ = fVar296 * auVar26._20_4_;
      fVar298 = auVar166._24_4_;
      auVar54._24_4_ = fVar298 * auVar26._24_4_;
      auVar54._28_4_ = fVar254;
      fVar254 = auVar168._0_4_;
      fVar292 = auVar168._4_4_;
      auVar55._4_4_ = auVar25._4_4_ * fVar292;
      auVar55._0_4_ = auVar25._0_4_ * fVar254;
      fVar311 = auVar168._8_4_;
      auVar55._8_4_ = auVar25._8_4_ * fVar311;
      fVar315 = auVar168._12_4_;
      auVar55._12_4_ = auVar25._12_4_ * fVar315;
      fVar159 = auVar168._16_4_;
      auVar55._16_4_ = auVar25._16_4_ * fVar159;
      fVar155 = auVar168._20_4_;
      auVar55._20_4_ = auVar25._20_4_ * fVar155;
      fVar279 = auVar168._24_4_;
      auVar55._24_4_ = auVar25._24_4_ * fVar279;
      auVar55._28_4_ = auVar167._28_4_;
      auVar141 = vsubps_avx(auVar55,auVar54);
      auVar166 = vsubps_avx(auVar21,auVar24);
      fVar309 = auVar166._0_4_;
      fVar310 = auVar166._4_4_;
      auVar56._4_4_ = fVar310 * auVar26._4_4_;
      auVar56._0_4_ = fVar309 * auVar26._0_4_;
      fVar313 = auVar166._8_4_;
      auVar56._8_4_ = fVar313 * auVar26._8_4_;
      fVar326 = auVar166._12_4_;
      auVar56._12_4_ = fVar326 * auVar26._12_4_;
      fVar347 = auVar166._16_4_;
      auVar56._16_4_ = fVar347 * auVar26._16_4_;
      fVar352 = auVar166._20_4_;
      auVar56._20_4_ = fVar352 * auVar26._20_4_;
      fVar353 = auVar166._24_4_;
      auVar56._24_4_ = fVar353 * auVar26._24_4_;
      auVar56._28_4_ = auVar26._28_4_;
      auVar57._4_4_ = auVar24._4_4_ * fVar292;
      auVar57._0_4_ = auVar24._0_4_ * fVar254;
      auVar57._8_4_ = auVar24._8_4_ * fVar311;
      auVar57._12_4_ = auVar24._12_4_ * fVar315;
      auVar57._16_4_ = auVar24._16_4_ * fVar159;
      auVar57._20_4_ = auVar24._20_4_ * fVar155;
      auVar57._24_4_ = auVar24._24_4_ * fVar279;
      auVar57._28_4_ = auVar28._28_4_;
      auVar28 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar25._4_4_ * fVar310;
      auVar58._0_4_ = auVar25._0_4_ * fVar309;
      auVar58._8_4_ = auVar25._8_4_ * fVar313;
      auVar58._12_4_ = auVar25._12_4_ * fVar326;
      auVar58._16_4_ = auVar25._16_4_ * fVar347;
      auVar58._20_4_ = auVar25._20_4_ * fVar352;
      auVar58._24_4_ = auVar25._24_4_ * fVar353;
      auVar58._28_4_ = auVar26._28_4_;
      auVar59._4_4_ = auVar24._4_4_ * fVar222;
      auVar59._0_4_ = auVar24._0_4_ * fVar220;
      auVar59._8_4_ = auVar24._8_4_ * fVar223;
      auVar59._12_4_ = auVar24._12_4_ * fVar301;
      auVar59._16_4_ = auVar24._16_4_ * fVar294;
      auVar59._20_4_ = auVar24._20_4_ * fVar296;
      auVar59._24_4_ = auVar24._24_4_ * fVar298;
      auVar59._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar59,auVar58);
      auVar234._0_4_ = auVar141._0_4_ * 0.0 + auVar24._0_4_ + auVar28._0_4_ * 0.0;
      auVar234._4_4_ = auVar141._4_4_ * 0.0 + auVar24._4_4_ + auVar28._4_4_ * 0.0;
      auVar234._8_4_ = auVar141._8_4_ * 0.0 + auVar24._8_4_ + auVar28._8_4_ * 0.0;
      auVar234._12_4_ = auVar141._12_4_ * 0.0 + auVar24._12_4_ + auVar28._12_4_ * 0.0;
      auVar234._16_4_ = auVar141._16_4_ * 0.0 + auVar24._16_4_ + auVar28._16_4_ * 0.0;
      auVar234._20_4_ = auVar141._20_4_ * 0.0 + auVar24._20_4_ + auVar28._20_4_ * 0.0;
      auVar234._24_4_ = auVar141._24_4_ * 0.0 + auVar24._24_4_ + auVar28._24_4_ * 0.0;
      auVar234._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar28._28_4_;
      auVar24 = vmaxps_avx(auVar171,auVar234);
      auVar24 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,2);
      auVar229 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      auVar229 = vpand_avx(auVar229,_local_620);
      auVar189 = vpmovsxwd_avx(auVar229);
      auVar203 = vpunpckhwd_avx(auVar229,auVar229);
      auVar210._16_16_ = auVar203;
      auVar210._0_16_ = auVar189;
      if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar210 >> 0x7f,0) == '\0') &&
            (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar203 >> 0x3f,0) == '\0') &&
          (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar203[0xf]
         ) {
LAB_009e74c1:
        auVar154 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar325 = ZEXT3264(auVar147);
      }
      else {
        auVar60._4_4_ = fVar292 * fVar256;
        auVar60._0_4_ = fVar254 * fVar273;
        auVar60._8_4_ = fVar311 * fVar346;
        auVar60._12_4_ = fVar315 * fVar312;
        auVar60._16_4_ = fVar159 * fVar221;
        auVar60._20_4_ = fVar155 * fVar182;
        auVar60._24_4_ = fVar279 * fVar156;
        auVar60._28_4_ = auVar203._12_4_;
        auVar340._0_4_ = fVar220 * fVar299;
        auVar340._4_4_ = fVar222 * fVar238;
        auVar340._8_4_ = fVar223 * fVar240;
        auVar340._12_4_ = fVar301 * fVar242;
        auVar340._16_4_ = fVar294 * fVar278;
        auVar340._20_4_ = fVar296 * fVar300;
        auVar340._24_4_ = fVar298 * fVar302;
        auVar340._28_4_ = 0;
        auVar24 = vsubps_avx(auVar340,auVar60);
        auVar61._4_4_ = fVar310 * fVar238;
        auVar61._0_4_ = fVar309 * fVar299;
        auVar61._8_4_ = fVar313 * fVar240;
        auVar61._12_4_ = fVar326 * fVar242;
        auVar61._16_4_ = fVar347 * fVar278;
        auVar61._20_4_ = fVar352 * fVar300;
        auVar61._24_4_ = fVar353 * fVar302;
        auVar61._28_4_ = auVar19._28_4_;
        auVar62._4_4_ = fVar292 * fVar260;
        auVar62._0_4_ = fVar254 * fVar245;
        auVar62._8_4_ = fVar311 * fVar293;
        auVar62._12_4_ = fVar315 * fVar314;
        auVar62._16_4_ = fVar159 * fVar317;
        auVar62._20_4_ = fVar155 * fVar137;
        auVar62._24_4_ = fVar279 * fVar261;
        auVar62._28_4_ = auVar168._28_4_;
        auVar26 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = fVar222 * fVar260;
        auVar63._0_4_ = fVar220 * fVar245;
        auVar63._8_4_ = fVar223 * fVar293;
        auVar63._12_4_ = fVar301 * fVar314;
        auVar63._16_4_ = fVar294 * fVar317;
        auVar63._20_4_ = fVar296 * fVar137;
        auVar63._24_4_ = fVar298 * fVar261;
        auVar63._28_4_ = auVar171._28_4_;
        auVar64._4_4_ = fVar310 * fVar256;
        auVar64._0_4_ = fVar309 * fVar273;
        auVar64._8_4_ = fVar313 * fVar346;
        auVar64._12_4_ = fVar326 * fVar312;
        auVar64._16_4_ = fVar347 * fVar221;
        auVar64._20_4_ = fVar352 * fVar182;
        auVar64._24_4_ = fVar353 * fVar156;
        auVar64._28_4_ = auVar142._28_4_;
        auVar28 = vsubps_avx(auVar64,auVar63);
        auVar289._0_4_ = auVar24._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
        auVar289._4_4_ = auVar24._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
        auVar289._8_4_ = auVar24._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
        auVar289._12_4_ = auVar24._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
        auVar289._16_4_ = auVar24._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
        auVar289._20_4_ = auVar24._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
        auVar289._24_4_ = auVar24._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
        auVar289._28_4_ = auVar142._28_4_ + auVar28._28_4_ + auVar171._28_4_;
        auVar25 = vrcpps_avx(auVar289);
        fVar273 = auVar25._0_4_;
        fVar245 = auVar25._4_4_;
        auVar65._4_4_ = auVar289._4_4_ * fVar245;
        auVar65._0_4_ = auVar289._0_4_ * fVar273;
        fVar254 = auVar25._8_4_;
        auVar65._8_4_ = auVar289._8_4_ * fVar254;
        fVar256 = auVar25._12_4_;
        auVar65._12_4_ = auVar289._12_4_ * fVar256;
        fVar260 = auVar25._16_4_;
        auVar65._16_4_ = auVar289._16_4_ * fVar260;
        fVar292 = auVar25._20_4_;
        auVar65._20_4_ = auVar289._20_4_ * fVar292;
        fVar346 = auVar25._24_4_;
        auVar65._24_4_ = auVar289._24_4_ * fVar346;
        auVar65._28_4_ = auVar168._28_4_;
        auVar341._8_4_ = 0x3f800000;
        auVar341._0_8_ = 0x3f8000003f800000;
        auVar341._12_4_ = 0x3f800000;
        auVar341._16_4_ = 0x3f800000;
        auVar341._20_4_ = 0x3f800000;
        auVar341._24_4_ = 0x3f800000;
        auVar341._28_4_ = 0x3f800000;
        auVar19 = vsubps_avx(auVar341,auVar65);
        fVar273 = auVar19._0_4_ * fVar273 + fVar273;
        fVar245 = auVar19._4_4_ * fVar245 + fVar245;
        fVar254 = auVar19._8_4_ * fVar254 + fVar254;
        fVar256 = auVar19._12_4_ * fVar256 + fVar256;
        fVar260 = auVar19._16_4_ * fVar260 + fVar260;
        fVar292 = auVar19._20_4_ * fVar292 + fVar292;
        fVar346 = auVar19._24_4_ * fVar346 + fVar346;
        auVar66._4_4_ =
             (auVar24._4_4_ * fVar259 + auVar26._4_4_ * fVar258 + auVar28._4_4_ * fVar181) * fVar245
        ;
        auVar66._0_4_ =
             (auVar24._0_4_ * fVar239 + auVar26._0_4_ * fVar275 + auVar28._0_4_ * fVar158) * fVar273
        ;
        auVar66._8_4_ =
             (auVar24._8_4_ * fVar217 + auVar26._8_4_ * fVar303 + auVar28._8_4_ * fVar200) * fVar254
        ;
        auVar66._12_4_ =
             (auVar24._12_4_ * fVar295 + auVar26._12_4_ * fVar219 + auVar28._12_4_ * fVar215) *
             fVar256;
        auVar66._16_4_ =
             (auVar24._16_4_ * fVar316 + auVar26._16_4_ * fVar297 + auVar28._16_4_ * fVar216) *
             fVar260;
        auVar66._20_4_ =
             (auVar24._20_4_ * fVar333 + auVar26._20_4_ * fVar280 + auVar28._20_4_ * fVar218) *
             fVar292;
        auVar66._24_4_ =
             (auVar24._24_4_ * fVar246 + auVar26._24_4_ * fVar157 + auVar28._24_4_ * fVar277) *
             fVar346;
        auVar66._28_4_ = auVar27._28_4_ + auVar23._28_4_;
        auVar189 = vpermilps_avx(ZEXT416(local_820),0);
        auVar146._16_16_ = auVar189;
        auVar146._0_16_ = auVar189;
        auVar23 = vcmpps_avx(auVar146,auVar66,2);
        uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar211._4_4_ = uVar135;
        auVar211._0_4_ = uVar135;
        auVar211._8_4_ = uVar135;
        auVar211._12_4_ = uVar135;
        auVar211._16_4_ = uVar135;
        auVar211._20_4_ = uVar135;
        auVar211._24_4_ = uVar135;
        auVar211._28_4_ = uVar135;
        auVar24 = vcmpps_avx(auVar66,auVar211,2);
        auVar23 = vandps_avx(auVar24,auVar23);
        auVar189 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar229 = vpand_avx(auVar229,auVar189);
        auVar189 = vpmovsxwd_avx(auVar229);
        auVar203 = vpshufd_avx(auVar229,0xee);
        auVar203 = vpmovsxwd_avx(auVar203);
        auVar212._16_16_ = auVar203;
        auVar212._0_16_ = auVar189;
        if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar212 >> 0x7f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar203 >> 0x3f,0) == '\0') &&
            (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar203[0xf]) goto LAB_009e74c1;
        auVar23 = vcmpps_avx(ZEXT832(0) << 0x20,auVar289,4);
        auVar189 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar229 = vpand_avx(auVar229,auVar189);
        auVar189 = vpmovsxwd_avx(auVar229);
        auVar229 = vpunpckhwd_avx(auVar229,auVar229);
        auVar269._16_16_ = auVar229;
        auVar269._0_16_ = auVar189;
        auVar154 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar325 = ZEXT3264(auVar147);
        if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar269 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar269 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar269 >> 0x7f,0) != '\0') ||
              (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar229 >> 0x3f,0) != '\0') ||
            (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar229[0xf] < '\0') {
          auVar67._4_4_ = auVar171._4_4_ * fVar245;
          auVar67._0_4_ = auVar171._0_4_ * fVar273;
          auVar67._8_4_ = auVar171._8_4_ * fVar254;
          auVar67._12_4_ = auVar171._12_4_ * fVar256;
          auVar67._16_4_ = auVar171._16_4_ * fVar260;
          auVar67._20_4_ = auVar171._20_4_ * fVar292;
          auVar67._24_4_ = auVar171._24_4_ * fVar346;
          auVar67._28_4_ = SUB84(uStack_4e8,4);
          auVar68._4_4_ = auVar234._4_4_ * fVar245;
          auVar68._0_4_ = auVar234._0_4_ * fVar273;
          auVar68._8_4_ = auVar234._8_4_ * fVar254;
          auVar68._12_4_ = auVar234._12_4_ * fVar256;
          auVar68._16_4_ = auVar234._16_4_ * fVar260;
          auVar68._20_4_ = auVar234._20_4_ * fVar292;
          auVar68._24_4_ = auVar234._24_4_ * fVar346;
          auVar68._28_4_ = auVar19._28_4_ + auVar25._28_4_;
          auVar235._8_4_ = 0x3f800000;
          auVar235._0_8_ = 0x3f8000003f800000;
          auVar235._12_4_ = 0x3f800000;
          auVar235._16_4_ = 0x3f800000;
          auVar235._20_4_ = 0x3f800000;
          auVar235._24_4_ = 0x3f800000;
          auVar235._28_4_ = 0x3f800000;
          auVar147 = vsubps_avx(auVar235,auVar67);
          auVar147 = vblendvps_avx(auVar147,auVar67,auVar20);
          auVar325 = ZEXT3264(auVar147);
          auVar147 = vsubps_avx(auVar235,auVar68);
          _local_320 = vblendvps_avx(auVar147,auVar68,auVar20);
          auVar154 = ZEXT3264(auVar269);
          local_420 = auVar66;
        }
      }
      auVar291 = ZEXT1664(auVar228);
      auVar344 = ZEXT3264(_local_720);
      auVar336 = ZEXT3264(_local_760);
      auVar147 = auVar154._0_32_;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0x7f,0) != '\0') ||
            (auVar154 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar147 >> 0xbf,0) != '\0') ||
          (auVar154 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar154[0x1f] < '\0') {
        auVar23 = vsubps_avx(auVar250,_local_880);
        local_880._0_4_ = (float)local_880._0_4_ + auVar325._0_4_ * auVar23._0_4_;
        local_880._4_4_ = (float)local_880._4_4_ + auVar325._4_4_ * auVar23._4_4_;
        fStack_878 = fStack_878 + auVar325._8_4_ * auVar23._8_4_;
        fStack_874 = fStack_874 + auVar325._12_4_ * auVar23._12_4_;
        fStack_870 = fStack_870 + auVar325._16_4_ * auVar23._16_4_;
        fStack_86c = fStack_86c + auVar325._20_4_ * auVar23._20_4_;
        fStack_868 = fStack_868 + auVar325._24_4_ * auVar23._24_4_;
        fStack_864 = fStack_864 + auVar23._28_4_;
        fVar273 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar69._4_4_ = ((float)local_880._4_4_ + (float)local_880._4_4_) * fVar273;
        auVar69._0_4_ = ((float)local_880._0_4_ + (float)local_880._0_4_) * fVar273;
        auVar69._8_4_ = (fStack_878 + fStack_878) * fVar273;
        auVar69._12_4_ = (fStack_874 + fStack_874) * fVar273;
        auVar69._16_4_ = (fStack_870 + fStack_870) * fVar273;
        auVar69._20_4_ = (fStack_86c + fStack_86c) * fVar273;
        auVar69._24_4_ = (fStack_868 + fStack_868) * fVar273;
        auVar69._28_4_ = fStack_864 + fStack_864;
        auVar23 = vcmpps_avx(local_420,auVar69,6);
        auVar24 = auVar147 & auVar23;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
          local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
          uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
          uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
          uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
          uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
          uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
          uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
          local_800 = auVar325._0_32_;
          local_2e0 = local_800;
          auVar125 = _local_320;
          auVar24 = _local_320;
          local_2c0 = (float)local_320._0_4_;
          fStack_2bc = (float)local_320._4_4_;
          fStack_2b8 = (float)uStack_318;
          fStack_2b4 = uStack_318._4_4_;
          fStack_2b0 = (float)uStack_310;
          fStack_2ac = uStack_310._4_4_;
          fStack_2a8 = (float)uStack_308;
          fStack_2a4 = uStack_308._4_4_;
          local_2a0 = local_420;
          local_280 = 0;
          local_27c = uVar15;
          local_270 = local_7a0;
          uStack_268 = uStack_798;
          uStack_7b8 = auVar338._8_8_;
          local_260 = auVar338._0_8_;
          uStack_258 = uStack_7b8;
          local_250 = local_7d0;
          uStack_248 = uStack_7c8;
          local_240 = local_7b0;
          uStack_238 = uStack_7a8;
          _local_320 = auVar24;
          if ((pGVar134->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_540 = vandps_avx(auVar23,auVar147);
            auVar186._0_4_ = 1.0 / (float)local_5e0._0_4_;
            auVar186._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar229 = vshufps_avx(auVar186,auVar186,0);
            local_200[0] = auVar229._0_4_ * (auVar325._0_4_ + 0.0);
            local_200[1] = auVar229._4_4_ * (auVar325._4_4_ + 1.0);
            local_200[2] = auVar229._8_4_ * (auVar325._8_4_ + 2.0);
            local_200[3] = auVar229._12_4_ * (auVar325._12_4_ + 3.0);
            fStack_1f0 = auVar229._0_4_ * (auVar325._16_4_ + 4.0);
            fStack_1ec = auVar229._4_4_ * (auVar325._20_4_ + 5.0);
            fStack_1e8 = auVar229._8_4_ * (auVar325._24_4_ + 6.0);
            fStack_1e4 = auVar325._28_4_ + 7.0;
            uStack_310 = auVar125._16_8_;
            uStack_308 = auVar24._24_8_;
            local_1e0 = local_320;
            uStack_1d8 = uStack_318;
            uStack_1d0 = uStack_310;
            uStack_1c8 = uStack_308;
            local_1c0 = local_420;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar172,local_420,local_540);
            auVar23 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar23 = vminps_avx(auVar147,auVar23);
            auVar24 = vshufpd_avx(auVar23,auVar23,5);
            auVar23 = vminps_avx(auVar23,auVar24);
            auVar24 = vperm2f128_avx(auVar23,auVar23,1);
            auVar23 = vminps_avx(auVar23,auVar24);
            auVar23 = vcmpps_avx(auVar147,auVar23,0);
            auVar24 = local_540 & auVar23;
            auVar147 = local_540;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar23,local_540);
            }
            uVar126 = vmovmskps_avx(auVar147);
            uVar18 = 0;
            if (uVar126 != 0) {
              for (; (uVar126 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar131 = (ulong)uVar18;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar134->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar262 = local_200[uVar131];
              uVar135 = *(undefined4 *)((long)&local_1e0 + uVar131 * 4);
              fVar273 = 1.0 - fVar262;
              fVar271 = fVar262 * fVar273 + fVar262 * fVar273;
              auVar229 = ZEXT416((uint)(fVar262 * fVar262 * 3.0));
              auVar229 = vshufps_avx(auVar229,auVar229,0);
              auVar189 = ZEXT416((uint)((fVar271 - fVar262 * fVar262) * 3.0));
              auVar189 = vshufps_avx(auVar189,auVar189,0);
              auVar203 = ZEXT416((uint)((fVar273 * fVar273 - fVar271) * 3.0));
              auVar203 = vshufps_avx(auVar203,auVar203,0);
              auVar193 = ZEXT416((uint)(fVar273 * fVar273 * -3.0));
              auVar193 = vshufps_avx(auVar193,auVar193,0);
              auVar187._0_4_ =
                   auVar193._0_4_ * local_7a0._0_4_ +
                   auVar203._0_4_ * fVar337 +
                   auVar229._0_4_ * (float)local_7b0._0_4_ + auVar189._0_4_ * (float)local_7d0._0_4_
              ;
              auVar187._4_4_ =
                   auVar193._4_4_ * local_7a0._4_4_ +
                   auVar203._4_4_ * fVar345 +
                   auVar229._4_4_ * (float)local_7b0._4_4_ + auVar189._4_4_ * (float)local_7d0._4_4_
              ;
              auVar187._8_4_ =
                   auVar193._8_4_ * local_7a0._8_4_ +
                   auVar203._8_4_ * auVar338._8_4_ +
                   auVar229._8_4_ * (float)uStack_7a8 + auVar189._8_4_ * (float)uStack_7c8;
              auVar187._12_4_ =
                   auVar193._12_4_ * local_7a0._12_4_ +
                   auVar203._12_4_ * auVar338._12_4_ +
                   auVar229._12_4_ * uStack_7a8._4_4_ + auVar189._12_4_ * uStack_7c8._4_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar131 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar187._0_4_;
              uVar16 = vextractps_avx(auVar187,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
              uVar16 = vextractps_avx(auVar187,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
              *(float *)(ray + k * 4 + 0xf0) = fVar262;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar135;
              *(uint *)(ray + k * 4 + 0x110) = uVar127;
              *(uint *)(ray + k * 4 + 0x120) = uVar130;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_620 = auVar132;
              _local_640 = vpermilps_avx(local_5f0,0);
              _auStack_630 = auVar21._16_16_;
              _local_660 = vpshufd_avx(auVar191,0);
              _auStack_650 = auVar22._16_16_;
              _auStack_670 = auVar208._16_16_;
              _local_680 = *local_6e8;
              auStack_730 = auVar250._16_16_;
              local_740 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              while( true ) {
                local_3a0 = local_200[uVar131];
                local_390 = *(undefined4 *)((long)&local_1e0 + uVar131 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar131 * 4);
                fVar271 = 1.0 - local_3a0;
                fVar262 = local_3a0 * fVar271 + local_3a0 * fVar271;
                auVar229 = ZEXT416((uint)(local_3a0 * local_3a0 * 3.0));
                auVar229 = vshufps_avx(auVar229,auVar229,0);
                auVar189 = ZEXT416((uint)((fVar262 - local_3a0 * local_3a0) * 3.0));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar203 = ZEXT416((uint)((fVar271 * fVar271 - fVar262) * 3.0));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                local_790.context = context->user;
                auVar193 = ZEXT416((uint)(fVar271 * fVar271 * -3.0));
                auVar193 = vshufps_avx(auVar193,auVar193,0);
                auVar194._0_4_ =
                     auVar193._0_4_ * (float)local_7a0._0_4_ +
                     auVar203._0_4_ * (float)local_7c0._0_4_ +
                     auVar229._0_4_ * (float)local_7b0._0_4_ +
                     auVar189._0_4_ * (float)local_7d0._0_4_;
                auVar194._4_4_ =
                     auVar193._4_4_ * (float)local_7a0._4_4_ +
                     auVar203._4_4_ * (float)local_7c0._4_4_ +
                     auVar229._4_4_ * (float)local_7b0._4_4_ +
                     auVar189._4_4_ * (float)local_7d0._4_4_;
                auVar194._8_4_ =
                     auVar193._8_4_ * (float)uStack_798 +
                     auVar203._8_4_ * (float)uStack_7b8 +
                     auVar229._8_4_ * (float)uStack_7a8 + auVar189._8_4_ * (float)uStack_7c8;
                auVar194._12_4_ =
                     auVar193._12_4_ * uStack_798._4_4_ +
                     auVar203._12_4_ * uStack_7b8._4_4_ +
                     auVar229._12_4_ * uStack_7a8._4_4_ + auVar189._12_4_ * uStack_7c8._4_4_;
                auVar229 = vshufps_avx(auVar194,auVar194,0);
                local_3d0[0] = (RTCHitN)auVar229[0];
                local_3d0[1] = (RTCHitN)auVar229[1];
                local_3d0[2] = (RTCHitN)auVar229[2];
                local_3d0[3] = (RTCHitN)auVar229[3];
                local_3d0[4] = (RTCHitN)auVar229[4];
                local_3d0[5] = (RTCHitN)auVar229[5];
                local_3d0[6] = (RTCHitN)auVar229[6];
                local_3d0[7] = (RTCHitN)auVar229[7];
                local_3d0[8] = (RTCHitN)auVar229[8];
                local_3d0[9] = (RTCHitN)auVar229[9];
                local_3d0[10] = (RTCHitN)auVar229[10];
                local_3d0[0xb] = (RTCHitN)auVar229[0xb];
                local_3d0[0xc] = (RTCHitN)auVar229[0xc];
                local_3d0[0xd] = (RTCHitN)auVar229[0xd];
                local_3d0[0xe] = (RTCHitN)auVar229[0xe];
                local_3d0[0xf] = (RTCHitN)auVar229[0xf];
                auVar229 = vshufps_avx(auVar194,auVar194,0x55);
                local_3c0 = auVar229;
                local_3b0 = vshufps_avx(auVar194,auVar194,0xaa);
                fStack_39c = local_3a0;
                fStack_398 = local_3a0;
                fStack_394 = local_3a0;
                uStack_38c = local_390;
                uStack_388 = local_390;
                uStack_384 = local_390;
                local_380 = local_660;
                uStack_378 = uStack_658;
                local_370 = _local_640;
                vcmpps_avx(ZEXT1632(_local_640),ZEXT1632(_local_640),0xf);
                uStack_35c = (local_790.context)->instID[0];
                local_360 = uStack_35c;
                uStack_358 = uStack_35c;
                uStack_354 = uStack_35c;
                uStack_350 = (local_790.context)->instPrimID[0];
                uStack_34c = uStack_350;
                uStack_348 = uStack_350;
                uStack_344 = uStack_350;
                local_860 = _local_680;
                local_790.valid = (int *)local_860;
                local_790.geometryUserPtr = pGVar134->userPtr;
                local_790.hit = local_3d0;
                local_790.N = 4;
                local_790.ray = (RTCRayN *)ray;
                if (pGVar134->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar134->intersectionFilterN)(&local_790);
                  auVar291 = ZEXT1664(local_840._0_16_);
                  auVar336 = ZEXT3264(_local_760);
                  auVar344 = ZEXT3264(_local_720);
                  auVar325 = ZEXT3264(local_800);
                  pre = local_848;
                }
                if (local_860 == (undefined1  [16])0x0) {
                  auVar229 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar229 = auVar229 ^ _DAT_01f46b70;
                  auVar191 = local_5c0._0_16_;
                }
                else {
                  p_Var17 = context->args->filter;
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar134->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var17)(&local_790);
                    auVar291 = ZEXT1664(local_840._0_16_);
                    auVar336 = ZEXT3264(_local_760);
                    auVar344 = ZEXT3264(_local_720);
                    auVar325 = ZEXT3264(local_800);
                    pre = local_848;
                  }
                  auVar189 = vpcmpeqd_avx(local_860,_DAT_01f45a50);
                  auVar203 = vpcmpeqd_avx(auVar229,auVar229);
                  auVar229 = auVar189 ^ auVar203;
                  auVar191 = local_5c0._0_16_;
                  if (local_860 != (undefined1  [16])0x0) {
                    auVar189 = auVar189 ^ auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])local_790.hit);
                    *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar203;
                    auVar203 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar203;
                    auVar189 = vmaskmovps_avx(auVar189,*(undefined1 (*) [16])(local_790.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar189;
                  }
                }
                auVar147 = local_420;
                auVar228 = auVar291._0_16_;
                auVar165._8_8_ = 0x100000001;
                auVar165._0_8_ = 0x100000001;
                if ((auVar165 & auVar229) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_740._0_4_;
                  auVar229 = local_740;
                }
                else {
                  auVar229 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_540 + uVar131 * 4) = 0;
                local_740 = auVar229;
                auVar229 = vshufps_avx(auVar229,auVar229,0);
                auVar153._16_16_ = auVar229;
                auVar153._0_16_ = auVar229;
                auVar22 = vcmpps_avx(auVar147,auVar153,2);
                auVar21 = vandps_avx(auVar22,local_540);
                local_540 = local_540 & auVar22;
                auVar132 = local_620;
                if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_540 >> 0x7f,0) == '\0') &&
                      (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_540 >> 0xbf,0) == '\0') &&
                    (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_540[0x1f]) break;
                auVar177._8_4_ = 0x7f800000;
                auVar177._0_8_ = 0x7f8000007f800000;
                auVar177._12_4_ = 0x7f800000;
                auVar177._16_4_ = 0x7f800000;
                auVar177._20_4_ = 0x7f800000;
                auVar177._24_4_ = 0x7f800000;
                auVar177._28_4_ = 0x7f800000;
                auVar147 = vblendvps_avx(auVar177,auVar147,auVar21);
                auVar22 = vshufps_avx(auVar147,auVar147,0xb1);
                auVar22 = vminps_avx(auVar147,auVar22);
                auVar23 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar23);
                auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                auVar22 = vminps_avx(auVar22,auVar23);
                auVar22 = vcmpps_avx(auVar147,auVar22,0);
                auVar23 = auVar21 & auVar22;
                auVar147 = auVar21;
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar147 = vandps_avx(auVar22,auVar21);
                }
                uVar127 = vmovmskps_avx(auVar147);
                uVar130 = 0;
                if (uVar127 != 0) {
                  for (; (uVar127 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                  }
                }
                uVar131 = (ulong)uVar130;
                local_540 = auVar21;
              }
            }
          }
          fVar248 = (float)local_6c0._0_4_;
          fVar253 = (float)local_6c0._4_4_;
          fVar255 = fStack_6b8;
          fVar257 = fStack_6b4;
          fVar262 = fStack_6b0;
          fVar271 = fStack_6ac;
          fVar276 = fStack_6a8;
          fVar224 = fStack_6a4;
          fVar160 = (float)local_580._0_4_;
          fVar178 = (float)local_580._4_4_;
          fVar179 = fStack_578;
          fVar180 = fStack_574;
          fVar241 = fStack_570;
          fVar243 = fStack_56c;
          fVar247 = fStack_568;
          fVar252 = fStack_564;
        }
      }
    }
    local_740._0_8_ = prim;
    if (8 < (int)uVar15) {
      _local_560 = vpshufd_avx(ZEXT416(uVar15),0);
      auVar229 = vpshufd_avx(auVar228,0);
      local_5c0._16_16_ = auVar229;
      local_5c0._0_16_ = auVar229;
      auVar115._4_4_ = uStack_81c;
      auVar115._0_4_ = local_820;
      auVar115._8_4_ = uStack_818;
      auVar115._12_4_ = uStack_814;
      auVar229 = vpermilps_avx(auVar115,0);
      local_300._16_16_ = auVar229;
      local_300._0_16_ = auVar229;
      auVar139._0_4_ = 1.0 / (float)local_5e0._0_4_;
      auVar139._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar229 = vshufps_avx(auVar139,auVar139,0);
      register0x00001210 = auVar229;
      _local_e0 = auVar229;
      local_5e0 = vpermilps_avx(local_5f0,0);
      local_5f0 = vpshufd_avx(auVar191,0);
      auVar154 = ZEXT1664(local_5f0);
      lVar129 = 8;
      local_800 = auVar325._0_32_;
      _local_760 = auVar336._0_32_;
      while( true ) {
        if ((long)auVar132 <= lVar129) break;
        pauVar3 = (undefined1 (*) [28])(bezier_basis0 + lVar129 * 4 + lVar136);
        fVar273 = *(float *)*pauVar3;
        fVar275 = *(float *)(*pauVar3 + 4);
        fVar239 = *(float *)(*pauVar3 + 8);
        fVar245 = *(float *)(*pauVar3 + 0xc);
        fVar254 = *(float *)(*pauVar3 + 0x10);
        fVar256 = *(float *)(*pauVar3 + 0x14);
        fVar258 = *(float *)(*pauVar3 + 0x18);
        auVar122 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21fb768 + lVar129 * 4);
        fVar259 = *(float *)*pauVar3;
        fVar260 = *(float *)(*pauVar3 + 4);
        fVar292 = *(float *)(*pauVar3 + 8);
        fVar346 = *(float *)(*pauVar3 + 0xc);
        fVar303 = *(float *)(*pauVar3 + 0x10);
        fVar217 = *(float *)(*pauVar3 + 0x14);
        fVar293 = *(float *)(*pauVar3 + 0x18);
        auVar121 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21fbbec + lVar129 * 4);
        fVar311 = *(float *)*pauVar3;
        fVar312 = *(float *)(*pauVar3 + 4);
        fVar219 = *(float *)(*pauVar3 + 8);
        fVar295 = *(float *)(*pauVar3 + 0xc);
        fVar314 = *(float *)(*pauVar3 + 0x10);
        fVar315 = *(float *)(*pauVar3 + 0x14);
        fVar221 = *(float *)(*pauVar3 + 0x18);
        auVar120 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21fc070 + lVar129 * 4);
        fVar297 = *(float *)*pauVar3;
        fVar316 = *(float *)(*pauVar3 + 4);
        fVar317 = *(float *)(*pauVar3 + 8);
        fVar159 = *(float *)(*pauVar3 + 0xc);
        fVar182 = *(float *)(*pauVar3 + 0x10);
        fVar280 = *(float *)(*pauVar3 + 0x14);
        fVar333 = *(float *)(*pauVar3 + 0x18);
        auVar119 = *pauVar3;
        fVar246 = fVar252 + fVar252 + fVar224;
        local_880._0_4_ =
             (float)local_140._0_4_ * fVar273 +
             fVar272 * fVar259 + fVar311 * fVar160 + (float)local_400._0_4_ * fVar297;
        local_880._4_4_ =
             (float)local_140._4_4_ * fVar275 +
             fVar274 * fVar260 + fVar312 * fVar178 + (float)local_400._4_4_ * fVar316;
        fStack_878 = fStack_138 * fVar239 +
                     fVar237 * fVar292 + fVar219 * fVar179 + fStack_3f8 * fVar317;
        fStack_874 = fStack_134 * fVar245 +
                     fVar244 * fVar346 + fVar295 * fVar180 + fStack_3f4 * fVar159;
        fStack_870 = fStack_130 * fVar254 +
                     fVar272 * fVar303 + fVar314 * fVar241 + fStack_3f0 * fVar182;
        fStack_86c = fStack_12c * fVar256 +
                     fVar274 * fVar217 + fVar315 * fVar243 + fStack_3ec * fVar280;
        fStack_868 = fStack_128 * fVar258 +
                     fVar237 * fVar293 + fVar221 * fVar247 + fStack_3e8 * fVar333;
        fStack_864 = fVar252 + fVar224 + fVar252 + fVar252 + auVar154._28_4_;
        local_840._0_4_ =
             (float)local_160._0_4_ * fVar273 +
             auVar336._0_4_ * fVar259 + auVar344._0_4_ * fVar311 + fVar297 * fVar248;
        local_840._4_4_ =
             (float)local_160._4_4_ * fVar275 +
             auVar336._4_4_ * fVar260 + auVar344._4_4_ * fVar312 + fVar316 * fVar253;
        local_840._8_4_ =
             fStack_158 * fVar239 +
             auVar336._8_4_ * fVar292 + auVar344._8_4_ * fVar219 + fVar317 * fVar255;
        local_840._12_4_ =
             fStack_154 * fVar245 +
             auVar336._12_4_ * fVar346 + auVar344._12_4_ * fVar295 + fVar159 * fVar257;
        local_840._16_4_ =
             fStack_150 * fVar254 +
             auVar336._16_4_ * fVar303 + auVar344._16_4_ * fVar314 + fVar182 * fVar262;
        local_840._20_4_ =
             fStack_14c * fVar256 +
             auVar336._20_4_ * fVar217 + auVar344._20_4_ * fVar315 + fVar280 * fVar271;
        local_840._24_4_ =
             fStack_148 * fVar258 +
             auVar336._24_4_ * fVar293 + auVar344._24_4_ * fVar221 + fVar333 * fVar276;
        local_840._28_4_ = fStack_864 + fVar252 + fVar252 + fStack_4c4;
        fVar137 = (float)local_100._0_4_ * fVar273 +
                  fVar259 * (float)local_180._0_4_ +
                  (float)local_a0._0_4_ * fVar311 + fVar297 * (float)local_120._0_4_;
        fVar155 = (float)local_100._4_4_ * fVar275 +
                  fVar260 * (float)local_180._4_4_ +
                  (float)local_a0._4_4_ * fVar312 + fVar316 * (float)local_120._4_4_;
        fVar156 = fStack_f8 * fVar239 +
                  fVar292 * fStack_178 + fStack_98 * fVar219 + fVar317 * fStack_118;
        fVar157 = fStack_f4 * fVar245 +
                  fVar346 * fStack_174 + fStack_94 * fVar295 + fVar159 * fStack_114;
        fStack_810 = fStack_f0 * fVar254 +
                     fVar303 * fStack_170 + fStack_90 * fVar314 + fVar182 * fStack_110;
        fStack_80c = fStack_ec * fVar256 +
                     fVar217 * fStack_16c + fStack_8c * fVar315 + fVar280 * fStack_10c;
        fStack_808 = fStack_e8 * fVar258 +
                     fVar293 * fStack_168 + fStack_88 * fVar221 + fVar333 * fStack_108;
        fStack_804 = fStack_864 + fVar246;
        pfVar1 = (float *)(bezier_basis1 + lVar129 * 4 + lVar136);
        fVar245 = *pfVar1;
        fVar252 = pfVar1[1];
        fVar254 = pfVar1[2];
        fVar256 = pfVar1[3];
        fVar258 = pfVar1[4];
        fVar259 = pfVar1[5];
        fVar260 = pfVar1[6];
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21fdb88 + lVar129 * 4);
        fVar273 = *(float *)*pauVar3;
        fVar275 = *(float *)(*pauVar3 + 4);
        fVar239 = *(float *)(*pauVar3 + 8);
        fVar292 = *(float *)(*pauVar3 + 0xc);
        fVar346 = *(float *)(*pauVar3 + 0x10);
        fVar303 = *(float *)(*pauVar3 + 0x14);
        fVar217 = *(float *)(*pauVar3 + 0x18);
        auVar124 = *pauVar3;
        pfVar2 = (float *)(lVar136 + 0x21fe00c + lVar129 * 4);
        fVar293 = *pfVar2;
        fVar311 = pfVar2[1];
        fVar312 = pfVar2[2];
        fVar219 = pfVar2[3];
        fVar295 = pfVar2[4];
        fVar314 = pfVar2[5];
        fVar315 = pfVar2[6];
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21fe490 + lVar129 * 4);
        fVar221 = *(float *)*pauVar3;
        fVar297 = *(float *)(*pauVar3 + 4);
        fVar316 = *(float *)(*pauVar3 + 8);
        fVar317 = *(float *)(*pauVar3 + 0xc);
        fVar159 = *(float *)(*pauVar3 + 0x10);
        fVar182 = *(float *)(*pauVar3 + 0x14);
        fVar280 = *(float *)(*pauVar3 + 0x18);
        auVar123 = *pauVar3;
        fVar333 = *(float *)pauVar3[1];
        fVar279 = fVar333 + fStack_104;
        fVar246 = fVar333 + fVar333 + fVar246;
        fVar261 = fVar333 + fVar333 + fVar224;
        auVar349._0_4_ =
             (float)local_140._0_4_ * fVar245 +
             fVar273 * fVar272 + fVar160 * fVar293 + (float)local_400._0_4_ * fVar221;
        auVar349._4_4_ =
             (float)local_140._4_4_ * fVar252 +
             fVar275 * fVar274 + fVar178 * fVar311 + (float)local_400._4_4_ * fVar297;
        auVar349._8_4_ =
             fStack_138 * fVar254 + fVar239 * fVar237 + fVar179 * fVar312 + fStack_3f8 * fVar316;
        auVar349._12_4_ =
             fStack_134 * fVar256 + fVar292 * fVar244 + fVar180 * fVar219 + fStack_3f4 * fVar317;
        auVar349._16_4_ =
             fStack_130 * fVar258 + fVar346 * fVar272 + fVar241 * fVar295 + fStack_3f0 * fVar159;
        auVar349._20_4_ =
             fStack_12c * fVar259 + fVar303 * fVar274 + fVar243 * fVar314 + fStack_3ec * fVar182;
        auVar349._24_4_ =
             fStack_128 * fVar260 + fVar217 * fVar237 + fVar247 * fVar315 + fStack_3e8 * fVar280;
        auVar349._28_4_ = fVar279 + fVar246;
        auVar198._0_4_ =
             fVar245 * (float)local_160._0_4_ +
             auVar336._0_4_ * fVar273 + auVar344._0_4_ * fVar293 + fVar248 * fVar221;
        auVar198._4_4_ =
             fVar252 * (float)local_160._4_4_ +
             auVar336._4_4_ * fVar275 + auVar344._4_4_ * fVar311 + fVar253 * fVar297;
        auVar198._8_4_ =
             fVar254 * fStack_158 +
             auVar336._8_4_ * fVar239 + auVar344._8_4_ * fVar312 + fVar255 * fVar316;
        auVar198._12_4_ =
             fVar256 * fStack_154 +
             auVar336._12_4_ * fVar292 + auVar344._12_4_ * fVar219 + fVar257 * fVar317;
        auVar198._16_4_ =
             fVar258 * fStack_150 +
             auVar336._16_4_ * fVar346 + auVar344._16_4_ * fVar295 + fVar262 * fVar159;
        auVar198._20_4_ =
             fVar259 * fStack_14c +
             auVar336._20_4_ * fVar303 + auVar344._20_4_ * fVar314 + fVar271 * fVar182;
        auVar198._24_4_ =
             fVar260 * fStack_148 +
             auVar336._24_4_ * fVar217 + auVar344._24_4_ * fVar315 + fVar276 * fVar280;
        auVar198._28_4_ = fVar246 + fVar261;
        auVar290._0_4_ =
             fVar273 * (float)local_180._0_4_ +
             (float)local_a0._0_4_ * fVar293 + (float)local_120._0_4_ * fVar221 +
             (float)local_100._0_4_ * fVar245;
        auVar290._4_4_ =
             fVar275 * (float)local_180._4_4_ +
             (float)local_a0._4_4_ * fVar311 + (float)local_120._4_4_ * fVar297 +
             (float)local_100._4_4_ * fVar252;
        auVar290._8_4_ =
             fVar239 * fStack_178 + fStack_98 * fVar312 + fStack_118 * fVar316 + fStack_f8 * fVar254
        ;
        auVar290._12_4_ =
             fVar292 * fStack_174 + fStack_94 * fVar219 + fStack_114 * fVar317 + fStack_f4 * fVar256
        ;
        auVar290._16_4_ =
             fVar346 * fStack_170 + fStack_90 * fVar295 + fStack_110 * fVar159 + fStack_f0 * fVar258
        ;
        auVar290._20_4_ =
             fVar303 * fStack_16c + fStack_8c * fVar314 + fStack_10c * fVar182 + fStack_ec * fVar259
        ;
        auVar290._24_4_ =
             fVar217 * fStack_168 + fStack_88 * fVar315 + fStack_108 * fVar280 + fStack_e8 * fVar260
        ;
        auVar290._28_4_ = fVar333 + fVar279 + fVar246;
        auVar21 = vsubps_avx(auVar349,_local_880);
        _local_480 = vsubps_avx(auVar198,local_840);
        auVar154 = ZEXT3264(_local_480);
        fVar241 = auVar21._0_4_;
        fVar243 = auVar21._4_4_;
        auVar70._4_4_ = fVar243 * local_840._4_4_;
        auVar70._0_4_ = fVar241 * local_840._0_4_;
        fVar247 = auVar21._8_4_;
        auVar70._8_4_ = fVar247 * local_840._8_4_;
        fVar292 = auVar21._12_4_;
        auVar70._12_4_ = fVar292 * local_840._12_4_;
        fVar346 = auVar21._16_4_;
        auVar70._16_4_ = fVar346 * local_840._16_4_;
        fVar303 = auVar21._20_4_;
        auVar70._20_4_ = fVar303 * local_840._20_4_;
        fVar217 = auVar21._24_4_;
        auVar70._24_4_ = fVar217 * local_840._24_4_;
        auVar70._28_4_ = fVar246;
        fVar262 = local_480._0_4_;
        fVar271 = local_480._4_4_;
        auVar71._4_4_ = (float)local_880._4_4_ * fVar271;
        auVar71._0_4_ = (float)local_880._0_4_ * fVar262;
        fVar273 = local_480._8_4_;
        auVar71._8_4_ = fStack_878 * fVar273;
        fVar275 = local_480._12_4_;
        auVar71._12_4_ = fStack_874 * fVar275;
        fVar276 = local_480._16_4_;
        auVar71._16_4_ = fStack_870 * fVar276;
        fVar224 = local_480._20_4_;
        auVar71._20_4_ = fStack_86c * fVar224;
        fVar239 = local_480._24_4_;
        auVar71._24_4_ = fStack_868 * fVar239;
        auVar71._28_4_ = fVar261;
        auVar22 = vsubps_avx(auVar70,auVar71);
        auVar116._4_4_ = fVar155;
        auVar116._0_4_ = fVar137;
        auVar116._8_4_ = fVar156;
        auVar116._12_4_ = fVar157;
        auVar116._16_4_ = fStack_810;
        auVar116._20_4_ = fStack_80c;
        auVar116._24_4_ = fStack_808;
        auVar116._28_4_ = fStack_804;
        auVar147 = vmaxps_avx(auVar116,auVar290);
        auVar72._4_4_ = auVar147._4_4_ * auVar147._4_4_ * (fVar243 * fVar243 + fVar271 * fVar271);
        auVar72._0_4_ = auVar147._0_4_ * auVar147._0_4_ * (fVar241 * fVar241 + fVar262 * fVar262);
        auVar72._8_4_ = auVar147._8_4_ * auVar147._8_4_ * (fVar247 * fVar247 + fVar273 * fVar273);
        auVar72._12_4_ = auVar147._12_4_ * auVar147._12_4_ * (fVar292 * fVar292 + fVar275 * fVar275)
        ;
        auVar72._16_4_ = auVar147._16_4_ * auVar147._16_4_ * (fVar346 * fVar346 + fVar276 * fVar276)
        ;
        auVar72._20_4_ = auVar147._20_4_ * auVar147._20_4_ * (fVar303 * fVar303 + fVar224 * fVar224)
        ;
        auVar72._24_4_ = auVar147._24_4_ * auVar147._24_4_ * (fVar217 * fVar217 + fVar239 * fVar239)
        ;
        auVar72._28_4_ = fVar279 + fVar261;
        auVar73._4_4_ = auVar22._4_4_ * auVar22._4_4_;
        auVar73._0_4_ = auVar22._0_4_ * auVar22._0_4_;
        auVar73._8_4_ = auVar22._8_4_ * auVar22._8_4_;
        auVar73._12_4_ = auVar22._12_4_ * auVar22._12_4_;
        auVar73._16_4_ = auVar22._16_4_ * auVar22._16_4_;
        auVar73._20_4_ = auVar22._20_4_ * auVar22._20_4_;
        auVar73._24_4_ = auVar22._24_4_ * auVar22._24_4_;
        auVar73._28_4_ = auVar22._28_4_;
        _local_460 = vcmpps_avx(auVar73,auVar72,2);
        local_280 = (uint)lVar129;
        auVar189 = vpshufd_avx(ZEXT416(local_280),0);
        auVar229 = vpor_avx(auVar189,_DAT_01f4ad30);
        auVar189 = vpor_avx(auVar189,_DAT_01f7afa0);
        auVar229 = vpcmpgtd_avx(_local_560,auVar229);
        auVar189 = vpcmpgtd_avx(_local_560,auVar189);
        auVar199._16_16_ = auVar189;
        auVar199._0_16_ = auVar229;
        auVar147 = auVar199 & _local_460;
        fVar248 = (float)local_6c0._0_4_;
        fVar253 = (float)local_6c0._4_4_;
        fVar255 = fStack_6b8;
        fVar257 = fStack_6b4;
        fVar262 = fStack_6b0;
        fVar271 = fStack_6ac;
        fVar276 = fStack_6a8;
        fVar224 = fStack_6a4;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar325 = ZEXT3264(local_800);
          auVar344 = ZEXT3264(_local_720);
          auVar336 = ZEXT3264(_local_760);
        }
        else {
          local_5a0._0_4_ = auVar124._0_4_;
          local_5a0._4_4_ = auVar124._4_4_;
          fStack_598 = auVar124._8_4_;
          fStack_594 = auVar124._12_4_;
          fStack_590 = auVar124._16_4_;
          fStack_58c = auVar124._20_4_;
          fStack_588 = auVar124._24_4_;
          local_6a0._0_4_ = auVar123._0_4_;
          local_6a0._4_4_ = auVar123._4_4_;
          fStack_698 = auVar123._8_4_;
          fStack_694 = auVar123._12_4_;
          fStack_690 = auVar123._16_4_;
          fStack_68c = auVar123._20_4_;
          fStack_688 = auVar123._24_4_;
          local_6a0._0_4_ =
               fVar245 * (float)local_1a0._0_4_ +
               (float)local_440._0_4_ * (float)local_5a0._0_4_ +
               (float)local_c0._0_4_ * fVar293 + (float)local_6e0._0_4_ * (float)local_6a0._0_4_;
          local_6a0._4_4_ =
               fVar252 * (float)local_1a0._4_4_ +
               (float)local_440._4_4_ * (float)local_5a0._4_4_ +
               (float)local_c0._4_4_ * fVar311 + (float)local_6e0._4_4_ * (float)local_6a0._4_4_;
          fStack_698 = fVar254 * fStack_198 +
                       fStack_438 * fStack_598 + fStack_b8 * fVar312 + fStack_6d8 * fStack_698;
          fStack_694 = fVar256 * fStack_194 +
                       fStack_434 * fStack_594 + fStack_b4 * fVar219 + fStack_6d4 * fStack_694;
          fStack_690 = fVar258 * fStack_190 +
                       fStack_430 * fStack_590 + fStack_b0 * fVar295 + fStack_6d0 * fStack_690;
          fStack_68c = fVar259 * fStack_18c +
                       fStack_42c * fStack_58c + fStack_ac * fVar314 + fStack_6cc * fStack_68c;
          fStack_688 = fVar260 * fStack_188 +
                       fStack_428 * fStack_588 + fStack_a8 * fVar315 + fStack_6c8 * fStack_688;
          fStack_684 = pfVar1[7] + local_480._28_4_ + pfVar2[7] + 0.0;
          local_640._0_4_ = auVar121._0_4_;
          local_640._4_4_ = auVar121._4_4_;
          fStack_638 = auVar121._8_4_;
          fStack_634 = auVar121._12_4_;
          auStack_630._0_4_ = auVar121._16_4_;
          auStack_630._4_4_ = auVar121._20_4_;
          fStack_628 = auVar121._24_4_;
          local_660._0_4_ = auVar120._0_4_;
          local_660._4_4_ = auVar120._4_4_;
          uStack_658._0_4_ = auVar120._8_4_;
          uStack_658._4_4_ = auVar120._12_4_;
          auStack_650._0_4_ = auVar120._16_4_;
          auStack_650._4_4_ = auVar120._20_4_;
          fStack_648 = auVar120._24_4_;
          local_680._0_4_ = auVar119._0_4_;
          local_680._4_4_ = auVar119._4_4_;
          fStack_678 = auVar119._8_4_;
          fStack_674 = auVar119._12_4_;
          auStack_670._0_4_ = auVar119._16_4_;
          auStack_670._4_4_ = auVar119._20_4_;
          fStack_668 = auVar119._24_4_;
          pfVar1 = (float *)(lVar136 + 0x21fcdfc + lVar129 * 4);
          fVar273 = *pfVar1;
          fVar275 = pfVar1[1];
          fVar239 = pfVar1[2];
          fVar241 = pfVar1[3];
          fVar243 = pfVar1[4];
          fVar245 = pfVar1[5];
          fVar247 = pfVar1[6];
          pfVar5 = (float *)(lVar136 + 0x21fd280 + lVar129 * 4);
          fVar252 = *pfVar5;
          fVar254 = pfVar5[1];
          fVar256 = pfVar5[2];
          fVar258 = pfVar5[3];
          fVar259 = pfVar5[4];
          fVar260 = pfVar5[5];
          fVar292 = pfVar5[6];
          pfVar6 = (float *)(lVar136 + 0x21fc978 + lVar129 * 4);
          fVar346 = *pfVar6;
          fVar303 = pfVar6[1];
          fVar217 = pfVar6[2];
          fVar293 = pfVar6[3];
          fVar311 = pfVar6[4];
          fVar312 = pfVar6[5];
          fVar219 = pfVar6[6];
          fVar159 = pfVar1[7] + pfVar5[7];
          fVar182 = pfVar5[7] + fStack_864 + 0.0;
          fVar280 = fStack_864 + auVar349._28_4_ + fStack_864 + 0.0;
          pfVar1 = (float *)(lVar136 + 0x21fc4f4 + lVar129 * 4);
          fVar295 = *pfVar1;
          fVar314 = pfVar1[1];
          fVar315 = pfVar1[2];
          fVar221 = pfVar1[3];
          fVar297 = pfVar1[4];
          fVar316 = pfVar1[5];
          fVar317 = pfVar1[6];
          local_4a0 = (float)local_140._0_4_ * fVar295 +
                      fVar346 * fVar272 +
                      (float)local_580._0_4_ * fVar273 + (float)local_400._0_4_ * fVar252;
          fStack_49c = (float)local_140._4_4_ * fVar314 +
                       fVar303 * fVar274 +
                       (float)local_580._4_4_ * fVar275 + (float)local_400._4_4_ * fVar254;
          fStack_498 = fStack_138 * fVar315 +
                       fVar217 * fVar237 + fStack_578 * fVar239 + fStack_3f8 * fVar256;
          fStack_494 = fStack_134 * fVar221 +
                       fVar293 * fVar244 + fStack_574 * fVar241 + fStack_3f4 * fVar258;
          fStack_490 = fStack_130 * fVar297 +
                       fVar311 * fVar272 + fStack_570 * fVar243 + fStack_3f0 * fVar259;
          fStack_48c = fStack_12c * fVar316 +
                       fVar312 * fVar274 + fStack_56c * fVar245 + fStack_3ec * fVar260;
          fStack_488 = fStack_128 * fVar317 +
                       fVar219 * fVar237 + fStack_568 * fVar247 + fStack_3e8 * fVar292;
          fStack_484 = fVar159 + fVar182;
          auVar173._0_4_ =
               (float)local_160._0_4_ * fVar295 +
               (float)local_720._0_4_ * fVar273 + (float)local_6c0._0_4_ * fVar252 +
               (float)local_760._0_4_ * fVar346;
          auVar173._4_4_ =
               (float)local_160._4_4_ * fVar314 +
               (float)local_720._4_4_ * fVar275 + (float)local_6c0._4_4_ * fVar254 +
               (float)local_760._4_4_ * fVar303;
          auVar173._8_4_ =
               fStack_158 * fVar315 +
               fStack_718 * fVar239 + fStack_6b8 * fVar256 + fStack_758 * fVar217;
          auVar173._12_4_ =
               fStack_154 * fVar221 +
               fStack_714 * fVar241 + fStack_6b4 * fVar258 + fStack_754 * fVar293;
          auVar173._16_4_ =
               fStack_150 * fVar297 +
               fStack_710 * fVar243 + fStack_6b0 * fVar259 + fStack_750 * fVar311;
          auVar173._20_4_ =
               fStack_14c * fVar316 +
               fStack_70c * fVar245 + fStack_6ac * fVar260 + fStack_74c * fVar312;
          auVar173._24_4_ =
               fStack_148 * fVar317 +
               fStack_708 * fVar247 + fStack_6a8 * fVar292 + fStack_748 * fVar219;
          auVar173._28_4_ = fVar182 + fVar280;
          auVar350._0_4_ =
               fVar346 * (float)local_440._0_4_ +
               (float)local_c0._0_4_ * fVar273 + (float)local_6e0._0_4_ * fVar252 +
               fVar295 * (float)local_1a0._0_4_;
          auVar350._4_4_ =
               fVar303 * (float)local_440._4_4_ +
               (float)local_c0._4_4_ * fVar275 + (float)local_6e0._4_4_ * fVar254 +
               fVar314 * (float)local_1a0._4_4_;
          auVar350._8_4_ =
               fVar217 * fStack_438 + fStack_b8 * fVar239 + fStack_6d8 * fVar256 +
               fVar315 * fStack_198;
          auVar350._12_4_ =
               fVar293 * fStack_434 + fStack_b4 * fVar241 + fStack_6d4 * fVar258 +
               fVar221 * fStack_194;
          auVar350._16_4_ =
               fVar311 * fStack_430 + fStack_b0 * fVar243 + fStack_6d0 * fVar259 +
               fVar297 * fStack_190;
          auVar350._20_4_ =
               fVar312 * fStack_42c + fStack_ac * fVar245 + fStack_6cc * fVar260 +
               fVar316 * fStack_18c;
          auVar350._24_4_ =
               fVar219 * fStack_428 + fStack_a8 * fVar247 + fStack_6c8 * fVar292 +
               fVar317 * fStack_188;
          auVar350._28_4_ = pfVar6[7] + fVar159 + fVar280;
          pfVar1 = (float *)(lVar136 + 0x21ff21c + lVar129 * 4);
          fVar273 = *pfVar1;
          fVar275 = pfVar1[1];
          fVar239 = pfVar1[2];
          fVar241 = pfVar1[3];
          fVar243 = pfVar1[4];
          fVar245 = pfVar1[5];
          fVar247 = pfVar1[6];
          pfVar5 = (float *)(lVar136 + 0x21ff6a0 + lVar129 * 4);
          fVar252 = *pfVar5;
          fVar254 = pfVar5[1];
          fVar256 = pfVar5[2];
          fVar258 = pfVar5[3];
          fVar259 = pfVar5[4];
          fVar260 = pfVar5[5];
          fVar292 = pfVar5[6];
          pfVar6 = (float *)(lVar136 + 0x21fed98 + lVar129 * 4);
          fVar346 = *pfVar6;
          fVar303 = pfVar6[1];
          fVar217 = pfVar6[2];
          fVar293 = pfVar6[3];
          fVar311 = pfVar6[4];
          fVar312 = pfVar6[5];
          fVar219 = pfVar6[6];
          pfVar7 = (float *)(lVar136 + 0x21fe914 + lVar129 * 4);
          fVar295 = *pfVar7;
          fVar314 = pfVar7[1];
          fVar315 = pfVar7[2];
          fVar221 = pfVar7[3];
          fVar297 = pfVar7[4];
          fVar316 = pfVar7[5];
          fVar317 = pfVar7[6];
          auVar323._0_4_ =
               (float)local_140._0_4_ * fVar295 +
               fVar346 * fVar272 +
               (float)local_580._0_4_ * fVar273 + (float)local_400._0_4_ * fVar252;
          auVar323._4_4_ =
               (float)local_140._4_4_ * fVar314 +
               fVar303 * fVar274 +
               (float)local_580._4_4_ * fVar275 + (float)local_400._4_4_ * fVar254;
          auVar323._8_4_ =
               fStack_138 * fVar315 +
               fVar217 * fVar237 + fStack_578 * fVar239 + fStack_3f8 * fVar256;
          auVar323._12_4_ =
               fStack_134 * fVar221 +
               fVar293 * fVar244 + fStack_574 * fVar241 + fStack_3f4 * fVar258;
          auVar323._16_4_ =
               fStack_130 * fVar297 +
               fVar311 * fVar272 + fStack_570 * fVar243 + fStack_3f0 * fVar259;
          auVar323._20_4_ =
               fStack_12c * fVar316 +
               fVar312 * fVar274 + fStack_56c * fVar245 + fStack_3ec * fVar260;
          auVar323._24_4_ =
               fStack_128 * fVar317 +
               fVar219 * fVar237 + fStack_568 * fVar247 + fStack_3e8 * fVar292;
          auVar323._28_4_ = fStack_3e4 + fStack_3e4 + fStack_564 + fStack_3e4;
          auVar342._0_4_ =
               fVar295 * (float)local_160._0_4_ +
               (float)local_760._0_4_ * fVar346 +
               (float)local_720._0_4_ * fVar273 + fVar252 * (float)local_6c0._0_4_;
          auVar342._4_4_ =
               fVar314 * (float)local_160._4_4_ +
               (float)local_760._4_4_ * fVar303 +
               (float)local_720._4_4_ * fVar275 + fVar254 * (float)local_6c0._4_4_;
          auVar342._8_4_ =
               fVar315 * fStack_158 +
               fStack_758 * fVar217 + fStack_718 * fVar239 + fVar256 * fStack_6b8;
          auVar342._12_4_ =
               fVar221 * fStack_154 +
               fStack_754 * fVar293 + fStack_714 * fVar241 + fVar258 * fStack_6b4;
          auVar342._16_4_ =
               fVar297 * fStack_150 +
               fStack_750 * fVar311 + fStack_710 * fVar243 + fVar259 * fStack_6b0;
          auVar342._20_4_ =
               fVar316 * fStack_14c +
               fStack_74c * fVar312 + fStack_70c * fVar245 + fVar260 * fStack_6ac;
          auVar342._24_4_ =
               fVar317 * fStack_148 +
               fStack_748 * fVar219 + fStack_708 * fVar247 + fVar292 * fStack_6a8;
          auVar342._28_4_ = fStack_3e4 + fStack_3e4 + fStack_144 + fStack_3e4;
          auVar251._8_4_ = 0x7fffffff;
          auVar251._0_8_ = 0x7fffffff7fffffff;
          auVar251._12_4_ = 0x7fffffff;
          auVar251._16_4_ = 0x7fffffff;
          auVar251._20_4_ = 0x7fffffff;
          auVar251._24_4_ = 0x7fffffff;
          auVar251._28_4_ = 0x7fffffff;
          auVar118._4_4_ = fStack_49c;
          auVar118._0_4_ = local_4a0;
          auVar118._8_4_ = fStack_498;
          auVar118._12_4_ = fStack_494;
          auVar118._16_4_ = fStack_490;
          auVar118._20_4_ = fStack_48c;
          auVar118._24_4_ = fStack_488;
          auVar118._28_4_ = fStack_484;
          auVar147 = vandps_avx(auVar118,auVar251);
          auVar22 = vandps_avx(auVar173,auVar251);
          auVar22 = vmaxps_avx(auVar147,auVar22);
          auVar147 = vandps_avx(auVar350,auVar251);
          auVar22 = vmaxps_avx(auVar22,auVar147);
          auVar22 = vcmpps_avx(auVar22,local_5c0,1);
          auVar23 = vblendvps_avx(auVar118,auVar21,auVar22);
          auVar149._0_4_ =
               fVar295 * (float)local_1a0._0_4_ +
               fVar346 * (float)local_440._0_4_ +
               fVar252 * (float)local_6e0._0_4_ + (float)local_c0._0_4_ * fVar273;
          auVar149._4_4_ =
               fVar314 * (float)local_1a0._4_4_ +
               fVar303 * (float)local_440._4_4_ +
               fVar254 * (float)local_6e0._4_4_ + (float)local_c0._4_4_ * fVar275;
          auVar149._8_4_ =
               fVar315 * fStack_198 +
               fVar217 * fStack_438 + fVar256 * fStack_6d8 + fStack_b8 * fVar239;
          auVar149._12_4_ =
               fVar221 * fStack_194 +
               fVar293 * fStack_434 + fVar258 * fStack_6d4 + fStack_b4 * fVar241;
          auVar149._16_4_ =
               fVar297 * fStack_190 +
               fVar311 * fStack_430 + fVar259 * fStack_6d0 + fStack_b0 * fVar243;
          auVar149._20_4_ =
               fVar316 * fStack_18c +
               fVar312 * fStack_42c + fVar260 * fStack_6cc + fStack_ac * fVar245;
          auVar149._24_4_ =
               fVar317 * fStack_188 +
               fVar219 * fStack_428 + fVar292 * fStack_6c8 + fStack_a8 * fVar247;
          auVar149._28_4_ = auVar147._28_4_ + pfVar6[7] + pfVar5[7] + pfVar1[7];
          auVar24 = vblendvps_avx(auVar173,_local_480,auVar22);
          auVar147 = vandps_avx(auVar323,auVar251);
          auVar22 = vandps_avx(auVar342,auVar251);
          auVar25 = vmaxps_avx(auVar147,auVar22);
          auVar147 = vandps_avx(auVar149,auVar251);
          auVar147 = vmaxps_avx(auVar25,auVar147);
          local_620._0_4_ = auVar122._0_4_;
          local_620._4_4_ = auVar122._4_4_;
          fStack_618 = auVar122._8_4_;
          fStack_614 = auVar122._12_4_;
          auStack_610._0_4_ = auVar122._16_4_;
          auStack_610._4_4_ = auVar122._20_4_;
          fStack_608 = auVar122._24_4_;
          auVar22 = vcmpps_avx(auVar147,local_5c0,1);
          auVar147 = vblendvps_avx(auVar323,auVar21,auVar22);
          auVar150._0_4_ =
               (float)local_1a0._0_4_ * (float)local_620._0_4_ +
               (float)local_440._0_4_ * (float)local_640._0_4_ +
               (float)local_c0._0_4_ * (float)local_660._0_4_ +
               (float)local_6e0._0_4_ * (float)local_680._0_4_;
          auVar150._4_4_ =
               (float)local_1a0._4_4_ * (float)local_620._4_4_ +
               (float)local_440._4_4_ * (float)local_640._4_4_ +
               (float)local_c0._4_4_ * (float)local_660._4_4_ +
               (float)local_6e0._4_4_ * (float)local_680._4_4_;
          auVar150._8_4_ =
               fStack_198 * fStack_618 +
               fStack_438 * fStack_638 + fStack_b8 * (float)uStack_658 + fStack_6d8 * fStack_678;
          auVar150._12_4_ =
               fStack_194 * fStack_614 +
               fStack_434 * fStack_634 + fStack_b4 * uStack_658._4_4_ + fStack_6d4 * fStack_674;
          auVar150._16_4_ =
               fStack_190 * (float)auStack_610._0_4_ +
               fStack_430 * (float)auStack_630._0_4_ +
               fStack_b0 * (float)auStack_650._0_4_ + fStack_6d0 * (float)auStack_670._0_4_;
          auVar150._20_4_ =
               fStack_18c * (float)auStack_610._4_4_ +
               fStack_42c * (float)auStack_630._4_4_ +
               fStack_ac * (float)auStack_650._4_4_ + fStack_6cc * (float)auStack_670._4_4_;
          auVar150._24_4_ =
               fStack_188 * fStack_608 +
               fStack_428 * fStack_628 + fStack_a8 * fStack_648 + fStack_6c8 * fStack_668;
          auVar150._28_4_ = auVar25._28_4_ + fStack_684 + pfVar2[7] + 0.0;
          auVar22 = vblendvps_avx(auVar342,_local_480,auVar22);
          fVar180 = auVar23._0_4_;
          fVar246 = auVar23._4_4_;
          fVar261 = auVar23._8_4_;
          fVar279 = auVar23._12_4_;
          fVar158 = auVar23._16_4_;
          fVar181 = auVar23._20_4_;
          fVar200 = auVar23._24_4_;
          fVar215 = auVar23._28_4_;
          fVar346 = auVar147._0_4_;
          fVar217 = auVar147._4_4_;
          fVar311 = auVar147._8_4_;
          fVar219 = auVar147._12_4_;
          fVar314 = auVar147._16_4_;
          fVar221 = auVar147._20_4_;
          fVar316 = auVar147._24_4_;
          fVar273 = auVar24._0_4_;
          fVar239 = auVar24._4_4_;
          fVar243 = auVar24._8_4_;
          fVar247 = auVar24._12_4_;
          fVar254 = auVar24._16_4_;
          fVar258 = auVar24._20_4_;
          fVar260 = auVar24._24_4_;
          auVar330._0_4_ = fVar273 * fVar273 + fVar180 * fVar180;
          auVar330._4_4_ = fVar239 * fVar239 + fVar246 * fVar246;
          auVar330._8_4_ = fVar243 * fVar243 + fVar261 * fVar261;
          auVar330._12_4_ = fVar247 * fVar247 + fVar279 * fVar279;
          auVar330._16_4_ = fVar254 * fVar254 + fVar158 * fVar158;
          auVar330._20_4_ = fVar258 * fVar258 + fVar181 * fVar181;
          auVar330._24_4_ = fVar260 * fVar260 + fVar200 * fVar200;
          auVar330._28_4_ = auVar21._28_4_ + fStack_744;
          auVar21 = vrsqrtps_avx(auVar330);
          fVar275 = auVar21._0_4_;
          fVar241 = auVar21._4_4_;
          auVar74._4_4_ = fVar241 * 1.5;
          auVar74._0_4_ = fVar275 * 1.5;
          fVar245 = auVar21._8_4_;
          auVar74._8_4_ = fVar245 * 1.5;
          fVar252 = auVar21._12_4_;
          auVar74._12_4_ = fVar252 * 1.5;
          fVar256 = auVar21._16_4_;
          auVar74._16_4_ = fVar256 * 1.5;
          fVar259 = auVar21._20_4_;
          auVar74._20_4_ = fVar259 * 1.5;
          fVar292 = auVar21._24_4_;
          auVar74._24_4_ = fVar292 * 1.5;
          auVar74._28_4_ = auVar342._28_4_;
          auVar75._4_4_ = fVar241 * fVar241 * fVar241 * auVar330._4_4_ * 0.5;
          auVar75._0_4_ = fVar275 * fVar275 * fVar275 * auVar330._0_4_ * 0.5;
          auVar75._8_4_ = fVar245 * fVar245 * fVar245 * auVar330._8_4_ * 0.5;
          auVar75._12_4_ = fVar252 * fVar252 * fVar252 * auVar330._12_4_ * 0.5;
          auVar75._16_4_ = fVar256 * fVar256 * fVar256 * auVar330._16_4_ * 0.5;
          auVar75._20_4_ = fVar259 * fVar259 * fVar259 * auVar330._20_4_ * 0.5;
          auVar75._24_4_ = fVar292 * fVar292 * fVar292 * auVar330._24_4_ * 0.5;
          auVar75._28_4_ = auVar330._28_4_;
          auVar23 = vsubps_avx(auVar74,auVar75);
          fVar159 = auVar23._0_4_;
          fVar182 = auVar23._4_4_;
          fVar280 = auVar23._8_4_;
          fVar333 = auVar23._12_4_;
          fVar160 = auVar23._16_4_;
          fVar178 = auVar23._20_4_;
          fVar179 = auVar23._24_4_;
          fVar275 = auVar22._0_4_;
          fVar241 = auVar22._4_4_;
          fVar245 = auVar22._8_4_;
          fVar252 = auVar22._12_4_;
          fVar256 = auVar22._16_4_;
          fVar259 = auVar22._20_4_;
          fVar292 = auVar22._24_4_;
          auVar306._0_4_ = fVar275 * fVar275 + fVar346 * fVar346;
          auVar306._4_4_ = fVar241 * fVar241 + fVar217 * fVar217;
          auVar306._8_4_ = fVar245 * fVar245 + fVar311 * fVar311;
          auVar306._12_4_ = fVar252 * fVar252 + fVar219 * fVar219;
          auVar306._16_4_ = fVar256 * fVar256 + fVar314 * fVar314;
          auVar306._20_4_ = fVar259 * fVar259 + fVar221 * fVar221;
          auVar306._24_4_ = fVar292 * fVar292 + fVar316 * fVar316;
          auVar306._28_4_ = auVar21._28_4_ + auVar147._28_4_;
          auVar147 = vrsqrtps_avx(auVar306);
          fVar303 = auVar147._0_4_;
          fVar293 = auVar147._4_4_;
          auVar76._4_4_ = fVar293 * 1.5;
          auVar76._0_4_ = fVar303 * 1.5;
          fVar312 = auVar147._8_4_;
          auVar76._8_4_ = fVar312 * 1.5;
          fVar295 = auVar147._12_4_;
          auVar76._12_4_ = fVar295 * 1.5;
          fVar315 = auVar147._16_4_;
          auVar76._16_4_ = fVar315 * 1.5;
          fVar297 = auVar147._20_4_;
          auVar76._20_4_ = fVar297 * 1.5;
          fVar317 = auVar147._24_4_;
          auVar76._24_4_ = fVar317 * 1.5;
          auVar76._28_4_ = auVar342._28_4_;
          auVar77._4_4_ = fVar293 * fVar293 * fVar293 * auVar306._4_4_ * 0.5;
          auVar77._0_4_ = fVar303 * fVar303 * fVar303 * auVar306._0_4_ * 0.5;
          auVar77._8_4_ = fVar312 * fVar312 * fVar312 * auVar306._8_4_ * 0.5;
          auVar77._12_4_ = fVar295 * fVar295 * fVar295 * auVar306._12_4_ * 0.5;
          auVar77._16_4_ = fVar315 * fVar315 * fVar315 * auVar306._16_4_ * 0.5;
          auVar77._20_4_ = fVar297 * fVar297 * fVar297 * auVar306._20_4_ * 0.5;
          auVar77._24_4_ = fVar317 * fVar317 * fVar317 * auVar306._24_4_ * 0.5;
          auVar77._28_4_ = auVar306._28_4_;
          auVar21 = vsubps_avx(auVar76,auVar77);
          fVar303 = auVar21._0_4_;
          fVar293 = auVar21._4_4_;
          fVar312 = auVar21._8_4_;
          fVar295 = auVar21._12_4_;
          fVar315 = auVar21._16_4_;
          fVar297 = auVar21._20_4_;
          fVar317 = auVar21._24_4_;
          fVar273 = fVar137 * fVar159 * fVar273;
          fVar239 = fVar155 * fVar182 * fVar239;
          auVar78._4_4_ = fVar239;
          auVar78._0_4_ = fVar273;
          fVar243 = fVar156 * fVar280 * fVar243;
          auVar78._8_4_ = fVar243;
          fVar247 = fVar157 * fVar333 * fVar247;
          auVar78._12_4_ = fVar247;
          fVar254 = fStack_810 * fVar160 * fVar254;
          auVar78._16_4_ = fVar254;
          fVar258 = fStack_80c * fVar178 * fVar258;
          auVar78._20_4_ = fVar258;
          fVar260 = fStack_808 * fVar179 * fVar260;
          auVar78._24_4_ = fVar260;
          auVar78._28_4_ = auVar147._28_4_;
          local_620._4_4_ = fVar239 + (float)local_880._4_4_;
          local_620._0_4_ = fVar273 + (float)local_880._0_4_;
          fStack_618 = fVar243 + fStack_878;
          fStack_614 = fVar247 + fStack_874;
          auStack_610._0_4_ = fVar254 + fStack_870;
          auStack_610._4_4_ = fVar258 + fStack_86c;
          fStack_608 = fVar260 + fStack_868;
          fStack_604 = auVar147._28_4_ + fStack_864;
          fVar273 = fVar137 * fVar159 * -fVar180;
          fVar239 = fVar155 * fVar182 * -fVar246;
          auVar79._4_4_ = fVar239;
          auVar79._0_4_ = fVar273;
          fVar243 = fVar156 * fVar280 * -fVar261;
          auVar79._8_4_ = fVar243;
          fVar247 = fVar157 * fVar333 * -fVar279;
          auVar79._12_4_ = fVar247;
          fVar254 = fStack_810 * fVar160 * -fVar158;
          auVar79._16_4_ = fVar254;
          fVar258 = fStack_80c * fVar178 * -fVar181;
          auVar79._20_4_ = fVar258;
          fVar260 = fStack_808 * fVar179 * -fVar200;
          auVar79._24_4_ = fVar260;
          auVar79._28_4_ = -fVar215;
          local_680._4_4_ = local_840._4_4_ + fVar239;
          local_680._0_4_ = local_840._0_4_ + fVar273;
          fStack_678 = local_840._8_4_ + fVar243;
          fStack_674 = local_840._12_4_ + fVar247;
          auStack_670._0_4_ = local_840._16_4_ + fVar254;
          auStack_670._4_4_ = local_840._20_4_ + fVar258;
          fStack_668 = local_840._24_4_ + fVar260;
          fStack_664 = local_840._28_4_ + -fVar215;
          fVar273 = fVar159 * 0.0 * fVar137;
          fVar239 = fVar182 * 0.0 * fVar155;
          auVar80._4_4_ = fVar239;
          auVar80._0_4_ = fVar273;
          fVar243 = fVar280 * 0.0 * fVar156;
          auVar80._8_4_ = fVar243;
          fVar247 = fVar333 * 0.0 * fVar157;
          auVar80._12_4_ = fVar247;
          fVar254 = fVar160 * 0.0 * fStack_810;
          auVar80._16_4_ = fVar254;
          fVar258 = fVar178 * 0.0 * fStack_80c;
          auVar80._20_4_ = fVar258;
          fVar260 = fVar179 * 0.0 * fStack_808;
          auVar80._24_4_ = fVar260;
          auVar80._28_4_ = fVar215;
          auVar147 = vsubps_avx(_local_880,auVar78);
          auVar363._0_4_ = fVar273 + auVar150._0_4_;
          auVar363._4_4_ = fVar239 + auVar150._4_4_;
          auVar363._8_4_ = fVar243 + auVar150._8_4_;
          auVar363._12_4_ = fVar247 + auVar150._12_4_;
          auVar363._16_4_ = fVar254 + auVar150._16_4_;
          auVar363._20_4_ = fVar258 + auVar150._20_4_;
          auVar363._24_4_ = fVar260 + auVar150._24_4_;
          auVar363._28_4_ = fVar215 + auVar150._28_4_;
          fVar273 = auVar290._0_4_ * fVar303 * fVar275;
          fVar275 = auVar290._4_4_ * fVar293 * fVar241;
          auVar81._4_4_ = fVar275;
          auVar81._0_4_ = fVar273;
          fVar239 = auVar290._8_4_ * fVar312 * fVar245;
          auVar81._8_4_ = fVar239;
          fVar241 = auVar290._12_4_ * fVar295 * fVar252;
          auVar81._12_4_ = fVar241;
          fVar243 = auVar290._16_4_ * fVar315 * fVar256;
          auVar81._16_4_ = fVar243;
          fVar245 = auVar290._20_4_ * fVar297 * fVar259;
          auVar81._20_4_ = fVar245;
          fVar247 = auVar290._24_4_ * fVar317 * fVar292;
          auVar81._24_4_ = fVar247;
          auVar81._28_4_ = fStack_864;
          auVar141 = vsubps_avx(local_840,auVar79);
          auVar351._0_4_ = auVar349._0_4_ + fVar273;
          auVar351._4_4_ = auVar349._4_4_ + fVar275;
          auVar351._8_4_ = auVar349._8_4_ + fVar239;
          auVar351._12_4_ = auVar349._12_4_ + fVar241;
          auVar351._16_4_ = auVar349._16_4_ + fVar243;
          auVar351._20_4_ = auVar349._20_4_ + fVar245;
          auVar351._24_4_ = auVar349._24_4_ + fVar247;
          auVar351._28_4_ = auVar349._28_4_ + fStack_864;
          fVar273 = fVar303 * -fVar346 * auVar290._0_4_;
          fVar275 = fVar293 * -fVar217 * auVar290._4_4_;
          auVar82._4_4_ = fVar275;
          auVar82._0_4_ = fVar273;
          fVar239 = fVar312 * -fVar311 * auVar290._8_4_;
          auVar82._8_4_ = fVar239;
          fVar241 = fVar295 * -fVar219 * auVar290._12_4_;
          auVar82._12_4_ = fVar241;
          fVar243 = fVar315 * -fVar314 * auVar290._16_4_;
          auVar82._16_4_ = fVar243;
          fVar245 = fVar297 * -fVar221 * auVar290._20_4_;
          auVar82._20_4_ = fVar245;
          fVar247 = fVar317 * -fVar316 * auVar290._24_4_;
          auVar82._24_4_ = fVar247;
          auVar82._28_4_ = fStack_804;
          auVar142 = vsubps_avx(auVar150,auVar80);
          auVar236._0_4_ = auVar198._0_4_ + fVar273;
          auVar236._4_4_ = auVar198._4_4_ + fVar275;
          auVar236._8_4_ = auVar198._8_4_ + fVar239;
          auVar236._12_4_ = auVar198._12_4_ + fVar241;
          auVar236._16_4_ = auVar198._16_4_ + fVar243;
          auVar236._20_4_ = auVar198._20_4_ + fVar245;
          auVar236._24_4_ = auVar198._24_4_ + fVar247;
          auVar236._28_4_ = auVar198._28_4_ + fStack_804;
          fVar273 = fVar303 * 0.0 * auVar290._0_4_;
          fVar275 = fVar293 * 0.0 * auVar290._4_4_;
          auVar83._4_4_ = fVar275;
          auVar83._0_4_ = fVar273;
          fVar239 = fVar312 * 0.0 * auVar290._8_4_;
          auVar83._8_4_ = fVar239;
          fVar241 = fVar295 * 0.0 * auVar290._12_4_;
          auVar83._12_4_ = fVar241;
          fVar243 = fVar315 * 0.0 * auVar290._16_4_;
          auVar83._16_4_ = fVar243;
          fVar245 = fVar297 * 0.0 * auVar290._20_4_;
          auVar83._20_4_ = fVar245;
          fVar247 = fVar317 * 0.0 * auVar290._24_4_;
          auVar83._24_4_ = fVar247;
          auVar83._28_4_ = auVar150._28_4_;
          auVar22 = vsubps_avx(auVar349,auVar81);
          auVar324._0_4_ = (float)local_6a0._0_4_ + fVar273;
          auVar324._4_4_ = (float)local_6a0._4_4_ + fVar275;
          auVar324._8_4_ = fStack_698 + fVar239;
          auVar324._12_4_ = fStack_694 + fVar241;
          auVar324._16_4_ = fStack_690 + fVar243;
          auVar324._20_4_ = fStack_68c + fVar245;
          auVar324._24_4_ = fStack_688 + fVar247;
          auVar324._28_4_ = fStack_684 + auVar150._28_4_;
          auVar23 = vsubps_avx(auVar198,auVar82);
          auVar24 = vsubps_avx(_local_6a0,auVar83);
          auVar25 = vsubps_avx(auVar236,auVar141);
          auVar26 = vsubps_avx(auVar324,auVar142);
          auVar84._4_4_ = auVar142._4_4_ * auVar25._4_4_;
          auVar84._0_4_ = auVar142._0_4_ * auVar25._0_4_;
          auVar84._8_4_ = auVar142._8_4_ * auVar25._8_4_;
          auVar84._12_4_ = auVar142._12_4_ * auVar25._12_4_;
          auVar84._16_4_ = auVar142._16_4_ * auVar25._16_4_;
          auVar84._20_4_ = auVar142._20_4_ * auVar25._20_4_;
          auVar84._24_4_ = auVar142._24_4_ * auVar25._24_4_;
          auVar84._28_4_ = auVar342._28_4_;
          auVar85._4_4_ = auVar141._4_4_ * auVar26._4_4_;
          auVar85._0_4_ = auVar141._0_4_ * auVar26._0_4_;
          auVar85._8_4_ = auVar141._8_4_ * auVar26._8_4_;
          auVar85._12_4_ = auVar141._12_4_ * auVar26._12_4_;
          auVar85._16_4_ = auVar141._16_4_ * auVar26._16_4_;
          auVar85._20_4_ = auVar141._20_4_ * auVar26._20_4_;
          auVar85._24_4_ = auVar141._24_4_ * auVar26._24_4_;
          auVar85._28_4_ = auVar198._28_4_;
          auVar27 = vsubps_avx(auVar85,auVar84);
          auVar86._4_4_ = auVar147._4_4_ * auVar26._4_4_;
          auVar86._0_4_ = auVar147._0_4_ * auVar26._0_4_;
          auVar86._8_4_ = auVar147._8_4_ * auVar26._8_4_;
          auVar86._12_4_ = auVar147._12_4_ * auVar26._12_4_;
          auVar86._16_4_ = auVar147._16_4_ * auVar26._16_4_;
          auVar86._20_4_ = auVar147._20_4_ * auVar26._20_4_;
          auVar86._24_4_ = auVar147._24_4_ * auVar26._24_4_;
          auVar86._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar351,auVar147);
          auVar87._4_4_ = auVar142._4_4_ * auVar26._4_4_;
          auVar87._0_4_ = auVar142._0_4_ * auVar26._0_4_;
          auVar87._8_4_ = auVar142._8_4_ * auVar26._8_4_;
          auVar87._12_4_ = auVar142._12_4_ * auVar26._12_4_;
          auVar87._16_4_ = auVar142._16_4_ * auVar26._16_4_;
          auVar87._20_4_ = auVar142._20_4_ * auVar26._20_4_;
          auVar87._24_4_ = auVar142._24_4_ * auVar26._24_4_;
          auVar87._28_4_ = auVar21._28_4_;
          auVar28 = vsubps_avx(auVar87,auVar86);
          auVar88._4_4_ = auVar141._4_4_ * auVar26._4_4_;
          auVar88._0_4_ = auVar141._0_4_ * auVar26._0_4_;
          auVar88._8_4_ = auVar141._8_4_ * auVar26._8_4_;
          auVar88._12_4_ = auVar141._12_4_ * auVar26._12_4_;
          auVar88._16_4_ = auVar141._16_4_ * auVar26._16_4_;
          auVar88._20_4_ = auVar141._20_4_ * auVar26._20_4_;
          auVar88._24_4_ = auVar141._24_4_ * auVar26._24_4_;
          auVar88._28_4_ = auVar21._28_4_;
          auVar89._4_4_ = auVar147._4_4_ * auVar25._4_4_;
          auVar89._0_4_ = auVar147._0_4_ * auVar25._0_4_;
          auVar89._8_4_ = auVar147._8_4_ * auVar25._8_4_;
          auVar89._12_4_ = auVar147._12_4_ * auVar25._12_4_;
          auVar89._16_4_ = auVar147._16_4_ * auVar25._16_4_;
          auVar89._20_4_ = auVar147._20_4_ * auVar25._20_4_;
          auVar89._24_4_ = auVar147._24_4_ * auVar25._24_4_;
          auVar89._28_4_ = auVar25._28_4_;
          auVar21 = vsubps_avx(auVar89,auVar88);
          auVar174._0_4_ = auVar27._0_4_ * 0.0 + auVar21._0_4_ + auVar28._0_4_ * 0.0;
          auVar174._4_4_ = auVar27._4_4_ * 0.0 + auVar21._4_4_ + auVar28._4_4_ * 0.0;
          auVar174._8_4_ = auVar27._8_4_ * 0.0 + auVar21._8_4_ + auVar28._8_4_ * 0.0;
          auVar174._12_4_ = auVar27._12_4_ * 0.0 + auVar21._12_4_ + auVar28._12_4_ * 0.0;
          auVar174._16_4_ = auVar27._16_4_ * 0.0 + auVar21._16_4_ + auVar28._16_4_ * 0.0;
          auVar174._20_4_ = auVar27._20_4_ * 0.0 + auVar21._20_4_ + auVar28._20_4_ * 0.0;
          auVar174._24_4_ = auVar27._24_4_ * 0.0 + auVar21._24_4_ + auVar28._24_4_ * 0.0;
          auVar174._28_4_ = auVar27._28_4_ + auVar21._28_4_ + auVar28._28_4_;
          auVar20 = vcmpps_avx(auVar174,ZEXT832(0) << 0x20,2);
          auVar21 = vblendvps_avx(auVar22,_local_620,auVar20);
          auVar22 = vblendvps_avx(auVar23,_local_680,auVar20);
          auVar23 = vblendvps_avx(auVar24,auVar363,auVar20);
          auVar24 = vblendvps_avx(auVar147,auVar351,auVar20);
          auVar25 = vblendvps_avx(auVar141,auVar236,auVar20);
          auVar26 = vblendvps_avx(auVar142,auVar324,auVar20);
          auVar27 = vblendvps_avx(auVar351,auVar147,auVar20);
          auVar28 = vblendvps_avx(auVar236,auVar141,auVar20);
          auVar19 = vblendvps_avx(auVar324,auVar142,auVar20);
          auVar147 = vandps_avx(auVar199,_local_460);
          auVar27 = vsubps_avx(auVar27,auVar21);
          auVar166 = vsubps_avx(auVar28,auVar22);
          auVar19 = vsubps_avx(auVar19,auVar23);
          auVar167 = vsubps_avx(auVar22,auVar25);
          fVar273 = auVar166._0_4_;
          fVar222 = auVar23._0_4_;
          fVar252 = auVar166._4_4_;
          fVar223 = auVar23._4_4_;
          auVar90._4_4_ = fVar223 * fVar252;
          auVar90._0_4_ = fVar222 * fVar273;
          fVar346 = auVar166._8_4_;
          fVar301 = auVar23._8_4_;
          auVar90._8_4_ = fVar301 * fVar346;
          fVar295 = auVar166._12_4_;
          fVar294 = auVar23._12_4_;
          auVar90._12_4_ = fVar294 * fVar295;
          fVar159 = auVar166._16_4_;
          fVar296 = auVar23._16_4_;
          auVar90._16_4_ = fVar296 * fVar159;
          fVar180 = auVar166._20_4_;
          fVar298 = auVar23._20_4_;
          auVar90._20_4_ = fVar298 * fVar180;
          fVar215 = auVar166._24_4_;
          fVar299 = auVar23._24_4_;
          auVar90._24_4_ = fVar299 * fVar215;
          auVar90._28_4_ = auVar28._28_4_;
          fVar275 = auVar22._0_4_;
          fVar238 = auVar19._0_4_;
          fVar254 = auVar22._4_4_;
          fVar240 = auVar19._4_4_;
          auVar91._4_4_ = fVar240 * fVar254;
          auVar91._0_4_ = fVar238 * fVar275;
          fVar303 = auVar22._8_4_;
          fVar242 = auVar19._8_4_;
          auVar91._8_4_ = fVar242 * fVar303;
          fVar314 = auVar22._12_4_;
          fVar278 = auVar19._12_4_;
          auVar91._12_4_ = fVar278 * fVar314;
          fVar182 = auVar22._16_4_;
          fVar300 = auVar19._16_4_;
          auVar91._16_4_ = fVar300 * fVar182;
          fVar246 = auVar22._20_4_;
          fVar302 = auVar19._20_4_;
          auVar91._20_4_ = fVar302 * fVar246;
          fVar216 = auVar22._24_4_;
          fVar309 = auVar19._24_4_;
          uVar135 = auVar141._28_4_;
          auVar91._24_4_ = fVar309 * fVar216;
          auVar91._28_4_ = uVar135;
          auVar28 = vsubps_avx(auVar91,auVar90);
          fVar239 = auVar21._0_4_;
          fVar256 = auVar21._4_4_;
          auVar92._4_4_ = fVar240 * fVar256;
          auVar92._0_4_ = fVar238 * fVar239;
          fVar217 = auVar21._8_4_;
          auVar92._8_4_ = fVar242 * fVar217;
          fVar315 = auVar21._12_4_;
          auVar92._12_4_ = fVar278 * fVar315;
          fVar280 = auVar21._16_4_;
          auVar92._16_4_ = fVar300 * fVar280;
          fVar261 = auVar21._20_4_;
          auVar92._20_4_ = fVar302 * fVar261;
          fVar218 = auVar21._24_4_;
          auVar92._24_4_ = fVar309 * fVar218;
          auVar92._28_4_ = uVar135;
          fVar241 = auVar27._0_4_;
          fVar258 = auVar27._4_4_;
          auVar93._4_4_ = fVar223 * fVar258;
          auVar93._0_4_ = fVar222 * fVar241;
          fVar293 = auVar27._8_4_;
          auVar93._8_4_ = fVar301 * fVar293;
          fVar221 = auVar27._12_4_;
          auVar93._12_4_ = fVar294 * fVar221;
          fVar333 = auVar27._16_4_;
          auVar93._16_4_ = fVar296 * fVar333;
          fVar279 = auVar27._20_4_;
          auVar93._20_4_ = fVar298 * fVar279;
          fVar277 = auVar27._24_4_;
          auVar93._24_4_ = fVar299 * fVar277;
          auVar93._28_4_ = auVar351._28_4_;
          auVar141 = vsubps_avx(auVar93,auVar92);
          auVar94._4_4_ = fVar254 * fVar258;
          auVar94._0_4_ = fVar275 * fVar241;
          auVar94._8_4_ = fVar303 * fVar293;
          auVar94._12_4_ = fVar314 * fVar221;
          auVar94._16_4_ = fVar182 * fVar333;
          auVar94._20_4_ = fVar246 * fVar279;
          auVar94._24_4_ = fVar216 * fVar277;
          auVar94._28_4_ = uVar135;
          auVar95._4_4_ = fVar256 * fVar252;
          auVar95._0_4_ = fVar239 * fVar273;
          auVar95._8_4_ = fVar217 * fVar346;
          auVar95._12_4_ = fVar315 * fVar295;
          auVar95._16_4_ = fVar280 * fVar159;
          auVar95._20_4_ = fVar261 * fVar180;
          auVar95._24_4_ = fVar218 * fVar215;
          auVar95._28_4_ = auVar142._28_4_;
          auVar142 = vsubps_avx(auVar95,auVar94);
          auVar168 = vsubps_avx(auVar23,auVar26);
          fVar245 = auVar142._28_4_ + auVar141._28_4_;
          auVar331._0_4_ = auVar142._0_4_ + auVar141._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
          auVar331._4_4_ = auVar142._4_4_ + auVar141._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
          auVar331._8_4_ = auVar142._8_4_ + auVar141._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
          auVar331._12_4_ = auVar142._12_4_ + auVar141._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
          auVar331._16_4_ = auVar142._16_4_ + auVar141._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
          auVar331._20_4_ = auVar142._20_4_ + auVar141._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
          auVar331._24_4_ = auVar142._24_4_ + auVar141._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
          auVar331._28_4_ = fVar245 + auVar28._28_4_;
          fVar243 = auVar167._0_4_;
          fVar259 = auVar167._4_4_;
          auVar96._4_4_ = auVar26._4_4_ * fVar259;
          auVar96._0_4_ = auVar26._0_4_ * fVar243;
          fVar311 = auVar167._8_4_;
          auVar96._8_4_ = auVar26._8_4_ * fVar311;
          fVar297 = auVar167._12_4_;
          auVar96._12_4_ = auVar26._12_4_ * fVar297;
          fVar160 = auVar167._16_4_;
          auVar96._16_4_ = auVar26._16_4_ * fVar160;
          fVar158 = auVar167._20_4_;
          auVar96._20_4_ = auVar26._20_4_ * fVar158;
          fVar337 = auVar167._24_4_;
          auVar96._24_4_ = auVar26._24_4_ * fVar337;
          auVar96._28_4_ = fVar245;
          fVar245 = auVar168._0_4_;
          fVar260 = auVar168._4_4_;
          auVar97._4_4_ = auVar25._4_4_ * fVar260;
          auVar97._0_4_ = auVar25._0_4_ * fVar245;
          fVar312 = auVar168._8_4_;
          auVar97._8_4_ = auVar25._8_4_ * fVar312;
          fVar316 = auVar168._12_4_;
          auVar97._12_4_ = auVar25._12_4_ * fVar316;
          fVar178 = auVar168._16_4_;
          auVar97._16_4_ = auVar25._16_4_ * fVar178;
          fVar181 = auVar168._20_4_;
          auVar97._20_4_ = auVar25._20_4_ * fVar181;
          fVar220 = auVar168._24_4_;
          auVar97._24_4_ = auVar25._24_4_ * fVar220;
          auVar97._28_4_ = auVar142._28_4_;
          auVar23 = vsubps_avx(auVar97,auVar96);
          auVar21 = vsubps_avx(auVar21,auVar24);
          fVar247 = auVar21._0_4_;
          fVar292 = auVar21._4_4_;
          auVar98._4_4_ = auVar26._4_4_ * fVar292;
          auVar98._0_4_ = auVar26._0_4_ * fVar247;
          fVar219 = auVar21._8_4_;
          auVar98._8_4_ = auVar26._8_4_ * fVar219;
          fVar317 = auVar21._12_4_;
          auVar98._12_4_ = auVar26._12_4_ * fVar317;
          fVar179 = auVar21._16_4_;
          auVar98._16_4_ = auVar26._16_4_ * fVar179;
          fVar200 = auVar21._20_4_;
          auVar98._20_4_ = auVar26._20_4_ * fVar200;
          fVar345 = auVar21._24_4_;
          auVar98._24_4_ = auVar26._24_4_ * fVar345;
          auVar98._28_4_ = auVar26._28_4_;
          auVar99._4_4_ = fVar260 * auVar24._4_4_;
          auVar99._0_4_ = fVar245 * auVar24._0_4_;
          auVar99._8_4_ = fVar312 * auVar24._8_4_;
          auVar99._12_4_ = fVar316 * auVar24._12_4_;
          auVar99._16_4_ = fVar178 * auVar24._16_4_;
          auVar99._20_4_ = fVar181 * auVar24._20_4_;
          auVar99._24_4_ = fVar220 * auVar24._24_4_;
          auVar99._28_4_ = auVar28._28_4_;
          auVar21 = vsubps_avx(auVar98,auVar99);
          auVar100._4_4_ = auVar25._4_4_ * fVar292;
          auVar100._0_4_ = auVar25._0_4_ * fVar247;
          auVar100._8_4_ = auVar25._8_4_ * fVar219;
          auVar100._12_4_ = auVar25._12_4_ * fVar317;
          auVar100._16_4_ = auVar25._16_4_ * fVar179;
          auVar100._20_4_ = auVar25._20_4_ * fVar200;
          auVar100._24_4_ = auVar25._24_4_ * fVar345;
          auVar100._28_4_ = auVar25._28_4_;
          auVar101._4_4_ = fVar259 * auVar24._4_4_;
          auVar101._0_4_ = fVar243 * auVar24._0_4_;
          auVar101._8_4_ = fVar311 * auVar24._8_4_;
          auVar101._12_4_ = fVar297 * auVar24._12_4_;
          auVar101._16_4_ = fVar160 * auVar24._16_4_;
          auVar101._20_4_ = fVar158 * auVar24._20_4_;
          auVar101._24_4_ = fVar337 * auVar24._24_4_;
          auVar101._28_4_ = auVar24._28_4_;
          auVar24 = vsubps_avx(auVar101,auVar100);
          auVar151._0_4_ = auVar23._0_4_ * 0.0 + auVar24._0_4_ + auVar21._0_4_ * 0.0;
          auVar151._4_4_ = auVar23._4_4_ * 0.0 + auVar24._4_4_ + auVar21._4_4_ * 0.0;
          auVar151._8_4_ = auVar23._8_4_ * 0.0 + auVar24._8_4_ + auVar21._8_4_ * 0.0;
          auVar151._12_4_ = auVar23._12_4_ * 0.0 + auVar24._12_4_ + auVar21._12_4_ * 0.0;
          auVar151._16_4_ = auVar23._16_4_ * 0.0 + auVar24._16_4_ + auVar21._16_4_ * 0.0;
          auVar151._20_4_ = auVar23._20_4_ * 0.0 + auVar24._20_4_ + auVar21._20_4_ * 0.0;
          auVar151._24_4_ = auVar23._24_4_ * 0.0 + auVar24._24_4_ + auVar21._24_4_ * 0.0;
          auVar151._28_4_ = auVar21._28_4_ + auVar24._28_4_ + auVar21._28_4_;
          auVar154 = ZEXT3264(auVar151);
          auVar21 = vmaxps_avx(auVar331,auVar151);
          auVar23 = vcmpps_avx(auVar21,ZEXT432(0) << 0x20,2);
          auVar24 = auVar147 & auVar23;
          auVar21 = auVar331;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
LAB_009e708b:
            auVar214._8_8_ = uStack_4f8;
            auVar214._0_8_ = local_500;
            auVar214._16_8_ = uStack_4f0;
            auVar214._24_8_ = uStack_4e8;
            auVar332 = auVar21._4_12_;
            auVar308._4_4_ = fVar155;
            auVar308._0_4_ = fVar137;
            auVar308._8_4_ = fVar156;
            auVar308._12_4_ = fVar157;
            auVar308._16_4_ = fStack_810;
            auVar308._20_4_ = fStack_80c;
            auVar308._24_4_ = fStack_808;
            auVar308._28_4_ = fStack_804;
          }
          else {
            auVar21 = vandps_avx(auVar23,auVar147);
            auVar332 = auVar21._4_12_;
            auVar102._4_4_ = fVar260 * fVar252;
            auVar102._0_4_ = fVar245 * fVar273;
            auVar102._8_4_ = fVar312 * fVar346;
            auVar102._12_4_ = fVar316 * fVar295;
            auVar102._16_4_ = fVar178 * fVar159;
            auVar102._20_4_ = fVar181 * fVar180;
            auVar102._24_4_ = fVar220 * fVar215;
            auVar102._28_4_ = auVar147._28_4_;
            auVar103._4_4_ = fVar259 * fVar240;
            auVar103._0_4_ = fVar243 * fVar238;
            auVar103._8_4_ = fVar311 * fVar242;
            auVar103._12_4_ = fVar297 * fVar278;
            auVar103._16_4_ = fVar160 * fVar300;
            auVar103._20_4_ = fVar158 * fVar302;
            auVar103._24_4_ = fVar337 * fVar309;
            auVar103._28_4_ = auVar23._28_4_;
            auVar23 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = fVar292 * fVar240;
            auVar104._0_4_ = fVar247 * fVar238;
            auVar104._8_4_ = fVar219 * fVar242;
            auVar104._12_4_ = fVar317 * fVar278;
            auVar104._16_4_ = fVar179 * fVar300;
            auVar104._20_4_ = fVar200 * fVar302;
            auVar104._24_4_ = fVar345 * fVar309;
            auVar104._28_4_ = auVar19._28_4_;
            auVar105._4_4_ = fVar260 * fVar258;
            auVar105._0_4_ = fVar245 * fVar241;
            auVar105._8_4_ = fVar312 * fVar293;
            auVar105._12_4_ = fVar316 * fVar221;
            auVar105._16_4_ = fVar178 * fVar333;
            auVar105._20_4_ = fVar181 * fVar279;
            auVar105._24_4_ = fVar220 * fVar277;
            auVar105._28_4_ = auVar168._28_4_;
            auVar24 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = fVar259 * fVar258;
            auVar106._0_4_ = fVar243 * fVar241;
            auVar106._8_4_ = fVar311 * fVar293;
            auVar106._12_4_ = fVar297 * fVar221;
            auVar106._16_4_ = fVar160 * fVar333;
            auVar106._20_4_ = fVar158 * fVar279;
            auVar106._24_4_ = fVar337 * fVar277;
            auVar106._28_4_ = auVar27._28_4_;
            auVar107._4_4_ = fVar292 * fVar252;
            auVar107._0_4_ = fVar247 * fVar273;
            auVar107._8_4_ = fVar219 * fVar346;
            auVar107._12_4_ = fVar317 * fVar295;
            auVar107._16_4_ = fVar179 * fVar159;
            auVar107._20_4_ = fVar200 * fVar180;
            auVar107._24_4_ = fVar345 * fVar215;
            auVar107._28_4_ = auVar166._28_4_;
            auVar25 = vsubps_avx(auVar107,auVar106);
            auVar307._0_4_ = auVar23._0_4_ * 0.0 + auVar25._0_4_ + auVar24._0_4_ * 0.0;
            auVar307._4_4_ = auVar23._4_4_ * 0.0 + auVar25._4_4_ + auVar24._4_4_ * 0.0;
            auVar307._8_4_ = auVar23._8_4_ * 0.0 + auVar25._8_4_ + auVar24._8_4_ * 0.0;
            auVar307._12_4_ = auVar23._12_4_ * 0.0 + auVar25._12_4_ + auVar24._12_4_ * 0.0;
            auVar307._16_4_ = auVar23._16_4_ * 0.0 + auVar25._16_4_ + auVar24._16_4_ * 0.0;
            auVar307._20_4_ = auVar23._20_4_ * 0.0 + auVar25._20_4_ + auVar24._20_4_ * 0.0;
            auVar307._24_4_ = auVar23._24_4_ * 0.0 + auVar25._24_4_ + auVar24._24_4_ * 0.0;
            auVar307._28_4_ = auVar167._28_4_ + auVar25._28_4_ + auVar27._28_4_;
            auVar147 = vrcpps_avx(auVar307);
            fVar273 = auVar147._0_4_;
            fVar241 = auVar147._4_4_;
            auVar108._4_4_ = auVar307._4_4_ * fVar241;
            auVar108._0_4_ = auVar307._0_4_ * fVar273;
            fVar243 = auVar147._8_4_;
            auVar108._8_4_ = auVar307._8_4_ * fVar243;
            fVar245 = auVar147._12_4_;
            auVar108._12_4_ = auVar307._12_4_ * fVar245;
            fVar247 = auVar147._16_4_;
            auVar108._16_4_ = auVar307._16_4_ * fVar247;
            fVar252 = auVar147._20_4_;
            auVar108._20_4_ = auVar307._20_4_ * fVar252;
            fVar258 = auVar147._24_4_;
            auVar108._24_4_ = auVar307._24_4_ * fVar258;
            auVar108._28_4_ = auVar168._28_4_;
            auVar343._8_4_ = 0x3f800000;
            auVar343._0_8_ = 0x3f8000003f800000;
            auVar343._12_4_ = 0x3f800000;
            auVar343._16_4_ = 0x3f800000;
            auVar343._20_4_ = 0x3f800000;
            auVar343._24_4_ = 0x3f800000;
            auVar343._28_4_ = 0x3f800000;
            auVar147 = vsubps_avx(auVar343,auVar108);
            fVar273 = auVar147._0_4_ * fVar273 + fVar273;
            fVar241 = auVar147._4_4_ * fVar241 + fVar241;
            fVar243 = auVar147._8_4_ * fVar243 + fVar243;
            fVar245 = auVar147._12_4_ * fVar245 + fVar245;
            fVar247 = auVar147._16_4_ * fVar247 + fVar247;
            fVar252 = auVar147._20_4_ * fVar252 + fVar252;
            fVar258 = auVar147._24_4_ * fVar258 + fVar258;
            auVar109._4_4_ =
                 (fVar256 * auVar23._4_4_ + auVar24._4_4_ * fVar254 + fVar223 * auVar25._4_4_) *
                 fVar241;
            auVar109._0_4_ =
                 (fVar239 * auVar23._0_4_ + auVar24._0_4_ * fVar275 + fVar222 * auVar25._0_4_) *
                 fVar273;
            auVar109._8_4_ =
                 (fVar217 * auVar23._8_4_ + auVar24._8_4_ * fVar303 + fVar301 * auVar25._8_4_) *
                 fVar243;
            auVar109._12_4_ =
                 (fVar315 * auVar23._12_4_ + auVar24._12_4_ * fVar314 + fVar294 * auVar25._12_4_) *
                 fVar245;
            auVar109._16_4_ =
                 (fVar280 * auVar23._16_4_ + auVar24._16_4_ * fVar182 + fVar296 * auVar25._16_4_) *
                 fVar247;
            auVar109._20_4_ =
                 (fVar261 * auVar23._20_4_ + auVar24._20_4_ * fVar246 + fVar298 * auVar25._20_4_) *
                 fVar252;
            auVar109._24_4_ =
                 (fVar218 * auVar23._24_4_ + auVar24._24_4_ * fVar216 + fVar299 * auVar25._24_4_) *
                 fVar258;
            auVar109._28_4_ = auVar22._28_4_ + auVar25._28_4_;
            uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar213._4_4_ = uVar135;
            auVar213._0_4_ = uVar135;
            auVar213._8_4_ = uVar135;
            auVar213._12_4_ = uVar135;
            auVar213._16_4_ = uVar135;
            auVar213._20_4_ = uVar135;
            auVar213._24_4_ = uVar135;
            auVar213._28_4_ = uVar135;
            auVar22 = vcmpps_avx(local_300,auVar109,2);
            auVar147 = vcmpps_avx(auVar109,auVar213,2);
            auVar147 = vandps_avx(auVar22,auVar147);
            auVar23 = auVar21 & auVar147;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) goto LAB_009e708b;
            auVar147 = vandps_avx(auVar21,auVar147);
            auVar21 = vcmpps_avx(auVar307,ZEXT432(0) << 0x20,4);
            auVar23 = auVar147 & auVar21;
            auVar214._8_8_ = uStack_4f8;
            auVar214._0_8_ = local_500;
            auVar214._16_8_ = uStack_4f0;
            auVar214._24_8_ = uStack_4e8;
            auVar308._4_4_ = fVar155;
            auVar308._0_4_ = fVar137;
            auVar308._8_4_ = fVar156;
            auVar308._12_4_ = fVar157;
            auVar308._16_4_ = fStack_810;
            auVar308._20_4_ = fStack_80c;
            auVar308._24_4_ = fStack_808;
            auVar308._28_4_ = fStack_804;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              auVar214 = vandps_avx(auVar21,auVar147);
              auVar110._4_4_ = auVar331._4_4_ * fVar241;
              auVar110._0_4_ = auVar331._0_4_ * fVar273;
              auVar110._8_4_ = auVar331._8_4_ * fVar243;
              auVar110._12_4_ = auVar331._12_4_ * fVar245;
              auVar110._16_4_ = auVar331._16_4_ * fVar247;
              auVar110._20_4_ = auVar331._20_4_ * fVar252;
              auVar110._24_4_ = auVar331._24_4_ * fVar258;
              auVar110._28_4_ = auVar22._28_4_;
              auVar111._4_4_ = auVar151._4_4_ * fVar241;
              auVar111._0_4_ = auVar151._0_4_ * fVar273;
              auVar111._8_4_ = auVar151._8_4_ * fVar243;
              auVar111._12_4_ = auVar151._12_4_ * fVar245;
              auVar111._16_4_ = auVar151._16_4_ * fVar247;
              auVar111._20_4_ = auVar151._20_4_ * fVar252;
              auVar111._24_4_ = auVar151._24_4_ * fVar258;
              auVar111._28_4_ = auVar151._28_4_;
              auVar270._8_4_ = 0x3f800000;
              auVar270._0_8_ = 0x3f8000003f800000;
              auVar270._12_4_ = 0x3f800000;
              auVar270._16_4_ = 0x3f800000;
              auVar270._20_4_ = 0x3f800000;
              auVar270._24_4_ = 0x3f800000;
              auVar270._28_4_ = 0x3f800000;
              auVar147 = vsubps_avx(auVar270,auVar110);
              _local_4e0 = vblendvps_avx(auVar147,auVar110,auVar20);
              auVar147 = vsubps_avx(auVar270,auVar111);
              _local_340 = vblendvps_avx(auVar147,auVar111,auVar20);
              auVar154 = ZEXT3264(_local_340);
              local_4c0 = auVar109;
            }
          }
          auVar325 = ZEXT3264(local_800);
          auVar336 = ZEXT3264(_local_760);
          auVar344 = ZEXT3264(_local_720);
          if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar214 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar214 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar214 >> 0x7f,0) != '\0') ||
                (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar214 >> 0xbf,0) != '\0') ||
              (auVar214 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar214[0x1f] < '\0') {
            auVar147 = vsubps_avx(auVar290,auVar308);
            fVar275 = auVar308._0_4_ + auVar147._0_4_ * (float)local_4e0._0_4_;
            fVar239 = auVar308._4_4_ + auVar147._4_4_ * (float)local_4e0._4_4_;
            fVar241 = auVar308._8_4_ + auVar147._8_4_ * fStack_4d8;
            fVar243 = auVar308._12_4_ + auVar147._12_4_ * fStack_4d4;
            fVar245 = auVar308._16_4_ + auVar147._16_4_ * fStack_4d0;
            fVar247 = auVar308._20_4_ + auVar147._20_4_ * fStack_4cc;
            fVar252 = auVar308._24_4_ + auVar147._24_4_ * fStack_4c8;
            fVar254 = auVar308._28_4_ + auVar147._28_4_;
            fVar273 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar112._4_4_ = (fVar239 + fVar239) * fVar273;
            auVar112._0_4_ = (fVar275 + fVar275) * fVar273;
            auVar112._8_4_ = (fVar241 + fVar241) * fVar273;
            auVar112._12_4_ = (fVar243 + fVar243) * fVar273;
            auVar112._16_4_ = (fVar245 + fVar245) * fVar273;
            auVar112._20_4_ = (fVar247 + fVar247) * fVar273;
            auVar112._24_4_ = (fVar252 + fVar252) * fVar273;
            auVar112._28_4_ = fVar254 + fVar254;
            auVar147 = vcmpps_avx(local_4c0,auVar112,6);
            auVar154 = ZEXT3264(auVar147);
            auVar21 = auVar214 & auVar147;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
              local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
              uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
              uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
              uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
              uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
              uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
              uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
              local_2e0 = _local_4e0;
              auVar125 = _local_340;
              auVar21 = _local_340;
              local_2c0 = (float)local_340._0_4_;
              fStack_2bc = (float)local_340._4_4_;
              fStack_2b8 = (float)uStack_338;
              fStack_2b4 = uStack_338._4_4_;
              fStack_2b0 = (float)uStack_330;
              fStack_2ac = uStack_330._4_4_;
              fStack_2a8 = (float)uStack_328;
              fStack_2a4 = uStack_328._4_4_;
              local_2a0 = local_4c0;
              local_27c = uVar15;
              local_270 = local_7a0;
              uStack_268 = uStack_798;
              local_260 = local_7c0;
              uStack_258 = uStack_7b8;
              local_250 = local_7d0;
              uStack_248 = uStack_7c8;
              local_240 = local_7b0;
              uStack_238 = uStack_7a8;
              pGVar134 = (context->scene->geometries).items[local_700].ptr;
              if ((pGVar134->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_540 = vandps_avx(auVar147,auVar214);
                auVar188._0_4_ = (float)(int)local_280;
                auVar188._4_12_ = auVar332;
                auVar229 = vshufps_avx(auVar188,auVar188,0);
                local_200[0] = (auVar229._0_4_ + (float)local_4e0._0_4_ + 0.0) *
                               (float)local_e0._0_4_;
                local_200[1] = (auVar229._4_4_ + (float)local_4e0._4_4_ + 1.0) *
                               (float)local_e0._4_4_;
                local_200[2] = (auVar229._8_4_ + fStack_4d8 + 2.0) * fStack_d8;
                local_200[3] = (auVar229._12_4_ + fStack_4d4 + 3.0) * fStack_d4;
                fStack_1f0 = (auVar229._0_4_ + fStack_4d0 + 4.0) * fStack_d0;
                fStack_1ec = (auVar229._4_4_ + fStack_4cc + 5.0) * fStack_cc;
                fStack_1e8 = (auVar229._8_4_ + fStack_4c8 + 6.0) * fStack_c8;
                fStack_1e4 = auVar229._12_4_ + fStack_4c4 + 7.0;
                uStack_330 = auVar125._16_8_;
                uStack_328 = auVar21._24_8_;
                local_1e0 = local_340;
                uStack_1d8 = uStack_338;
                uStack_1d0 = uStack_330;
                uStack_1c8 = uStack_328;
                local_1c0 = local_4c0;
                auVar175._8_4_ = 0x7f800000;
                auVar175._0_8_ = 0x7f8000007f800000;
                auVar175._12_4_ = 0x7f800000;
                auVar175._16_4_ = 0x7f800000;
                auVar175._20_4_ = 0x7f800000;
                auVar175._24_4_ = 0x7f800000;
                auVar175._28_4_ = 0x7f800000;
                auVar147 = vblendvps_avx(auVar175,local_4c0,local_540);
                auVar22 = vshufps_avx(auVar147,auVar147,0xb1);
                auVar22 = vminps_avx(auVar147,auVar22);
                auVar23 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar23);
                auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                auVar22 = vminps_avx(auVar22,auVar23);
                auVar22 = vcmpps_avx(auVar147,auVar22,0);
                auVar23 = local_540 & auVar22;
                auVar147 = local_540;
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar147 = vandps_avx(auVar22,local_540);
                }
                uVar127 = vmovmskps_avx(auVar147);
                uVar130 = 0;
                if (uVar127 != 0) {
                  for (; (uVar127 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                  }
                }
                uVar131 = (ulong)uVar130;
                _local_340 = auVar21;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar134->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar262 = local_200[uVar131];
                  auVar154 = ZEXT464((uint)fVar262);
                  uVar135 = *(undefined4 *)((long)&local_1e0 + uVar131 * 4);
                  fVar273 = 1.0 - fVar262;
                  fVar271 = fVar262 * fVar273 + fVar262 * fVar273;
                  auVar229 = ZEXT416((uint)(fVar262 * fVar262 * 3.0));
                  auVar229 = vshufps_avx(auVar229,auVar229,0);
                  auVar189 = ZEXT416((uint)((fVar271 - fVar262 * fVar262) * 3.0));
                  auVar189 = vshufps_avx(auVar189,auVar189,0);
                  auVar203 = ZEXT416((uint)((fVar273 * fVar273 - fVar271) * 3.0));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  auVar193 = ZEXT416((uint)(fVar273 * fVar273 * -3.0));
                  auVar193 = vshufps_avx(auVar193,auVar193,0);
                  auVar190._0_4_ =
                       auVar193._0_4_ * (float)local_7a0._0_4_ +
                       auVar203._0_4_ * (float)local_7c0._0_4_ +
                       auVar229._0_4_ * (float)local_7b0._0_4_ +
                       auVar189._0_4_ * (float)local_7d0._0_4_;
                  auVar190._4_4_ =
                       auVar193._4_4_ * (float)local_7a0._4_4_ +
                       auVar203._4_4_ * (float)local_7c0._4_4_ +
                       auVar229._4_4_ * (float)local_7b0._4_4_ +
                       auVar189._4_4_ * (float)local_7d0._4_4_;
                  auVar190._8_4_ =
                       auVar193._8_4_ * (float)uStack_798 +
                       auVar203._8_4_ * (float)uStack_7b8 +
                       auVar229._8_4_ * (float)uStack_7a8 + auVar189._8_4_ * (float)uStack_7c8;
                  auVar190._12_4_ =
                       auVar193._12_4_ * uStack_798._4_4_ +
                       auVar203._12_4_ * uStack_7b8._4_4_ +
                       auVar229._12_4_ * uStack_7a8._4_4_ + auVar189._12_4_ * uStack_7c8._4_4_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar131 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = auVar190._0_4_;
                  uVar16 = vextractps_avx(auVar190,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                  uVar16 = vextractps_avx(auVar190,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                  *(float *)(ray + k * 4 + 0xf0) = fVar262;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar135;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_5d0;
                  *(int *)(ray + k * 4 + 0x120) = (int)local_700;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  stack0xfffffffffffff8c8 = auVar198._8_24_;
                  auVar229 = *local_6e8;
                  local_820 = *(uint *)(ray + k * 4 + 0x80);
                  uStack_81c = 0;
                  uStack_818 = 0;
                  uStack_814 = 0;
                  local_840._0_8_ = pGVar134;
                  local_6f0 = ray;
                  _local_660 = auVar349;
                  _local_640 = auVar199;
                  _local_5a0 = auVar290;
                  while( true ) {
                    local_3a0 = local_200[uVar131];
                    local_390 = *(undefined4 *)((long)&local_1e0 + uVar131 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar131 * 4);
                    fVar271 = 1.0 - local_3a0;
                    fVar262 = local_3a0 * fVar271 + local_3a0 * fVar271;
                    auVar189 = ZEXT416((uint)(local_3a0 * local_3a0 * 3.0));
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    auVar203 = ZEXT416((uint)((fVar262 - local_3a0 * local_3a0) * 3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar193 = ZEXT416((uint)((fVar271 * fVar271 - fVar262) * 3.0));
                    auVar193 = vshufps_avx(auVar193,auVar193,0);
                    local_790.context = context->user;
                    auVar191 = ZEXT416((uint)(fVar271 * fVar271 * -3.0));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    auVar192._0_4_ =
                         auVar191._0_4_ * (float)local_7a0._0_4_ +
                         auVar193._0_4_ * (float)local_7c0._0_4_ +
                         auVar189._0_4_ * (float)local_7b0._0_4_ +
                         auVar203._0_4_ * (float)local_7d0._0_4_;
                    auVar192._4_4_ =
                         auVar191._4_4_ * (float)local_7a0._4_4_ +
                         auVar193._4_4_ * (float)local_7c0._4_4_ +
                         auVar189._4_4_ * (float)local_7b0._4_4_ +
                         auVar203._4_4_ * (float)local_7d0._4_4_;
                    auVar192._8_4_ =
                         auVar191._8_4_ * (float)uStack_798 +
                         auVar193._8_4_ * (float)uStack_7b8 +
                         auVar189._8_4_ * (float)uStack_7a8 + auVar203._8_4_ * (float)uStack_7c8;
                    auVar192._12_4_ =
                         auVar191._12_4_ * uStack_798._4_4_ +
                         auVar193._12_4_ * uStack_7b8._4_4_ +
                         auVar189._12_4_ * uStack_7a8._4_4_ + auVar203._12_4_ * uStack_7c8._4_4_;
                    auVar189 = vshufps_avx(auVar192,auVar192,0);
                    local_3d0[0] = (RTCHitN)auVar189[0];
                    local_3d0[1] = (RTCHitN)auVar189[1];
                    local_3d0[2] = (RTCHitN)auVar189[2];
                    local_3d0[3] = (RTCHitN)auVar189[3];
                    local_3d0[4] = (RTCHitN)auVar189[4];
                    local_3d0[5] = (RTCHitN)auVar189[5];
                    local_3d0[6] = (RTCHitN)auVar189[6];
                    local_3d0[7] = (RTCHitN)auVar189[7];
                    local_3d0[8] = (RTCHitN)auVar189[8];
                    local_3d0[9] = (RTCHitN)auVar189[9];
                    local_3d0[10] = (RTCHitN)auVar189[10];
                    local_3d0[0xb] = (RTCHitN)auVar189[0xb];
                    local_3d0[0xc] = (RTCHitN)auVar189[0xc];
                    local_3d0[0xd] = (RTCHitN)auVar189[0xd];
                    local_3d0[0xe] = (RTCHitN)auVar189[0xe];
                    local_3d0[0xf] = (RTCHitN)auVar189[0xf];
                    auVar189 = vshufps_avx(auVar192,auVar192,0x55);
                    local_3c0 = auVar189;
                    local_3b0 = vshufps_avx(auVar192,auVar192,0xaa);
                    fStack_39c = local_3a0;
                    fStack_398 = local_3a0;
                    fStack_394 = local_3a0;
                    uStack_38c = local_390;
                    uStack_388 = local_390;
                    uStack_384 = local_390;
                    local_380 = local_5f0._0_8_;
                    uStack_378 = local_5f0._8_8_;
                    local_370 = local_5e0;
                    vcmpps_avx(ZEXT1632(local_5e0),ZEXT1632(local_5e0),0xf);
                    uStack_35c = (local_790.context)->instID[0];
                    local_360 = uStack_35c;
                    uStack_358 = uStack_35c;
                    uStack_354 = uStack_35c;
                    uStack_350 = (local_790.context)->instPrimID[0];
                    uStack_34c = uStack_350;
                    uStack_348 = uStack_350;
                    uStack_344 = uStack_350;
                    local_790.valid = (int *)local_860;
                    local_790.geometryUserPtr = pGVar134->userPtr;
                    local_790.hit = local_3d0;
                    local_790.N = 4;
                    local_860 = auVar229;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar134->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar134->intersectionFilterN)(&local_790);
                      ray = local_6f0;
                      pGVar134 = (Geometry *)local_840._0_8_;
                    }
                    if (local_860 == (undefined1  [16])0x0) {
                      auVar189 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar189 = auVar189 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar134->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_790);
                        ray = local_6f0;
                        pGVar134 = (Geometry *)local_840._0_8_;
                      }
                      auVar203 = vpcmpeqd_avx(local_860,_DAT_01f45a50);
                      auVar193 = vpcmpeqd_avx(auVar189,auVar189);
                      auVar189 = auVar203 ^ auVar193;
                      if (local_860 != (undefined1  [16])0x0) {
                        auVar203 = auVar203 ^ auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])local_790.hit);
                        *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x10));
                        *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x20));
                        *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x30));
                        *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x40));
                        *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x50));
                        *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x60));
                        *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar193;
                        auVar193 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x70));
                        *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar193;
                        auVar203 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x80));
                        *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar203;
                      }
                    }
                    auVar147 = local_4c0;
                    auVar164._8_8_ = 0x100000001;
                    auVar164._0_8_ = 0x100000001;
                    if ((auVar164 & auVar189) == (undefined1  [16])0x0) {
                      auVar140._4_4_ = uStack_81c;
                      auVar140._0_4_ = local_820;
                      auVar140._8_4_ = uStack_818;
                      auVar140._12_4_ = uStack_814;
                      *(uint *)(ray + k * 4 + 0x80) = local_820;
                    }
                    else {
                      auVar140 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_540 + uVar131 * 4) = 0;
                    local_820 = auVar140._0_4_;
                    uStack_81c = auVar140._4_4_;
                    uStack_818 = auVar140._8_4_;
                    uStack_814 = auVar140._12_4_;
                    auVar189 = vshufps_avx(auVar140,auVar140,0);
                    auVar152._16_16_ = auVar189;
                    auVar152._0_16_ = auVar189;
                    auVar22 = vcmpps_avx(auVar147,auVar152,2);
                    auVar21 = vandps_avx(auVar22,local_540);
                    auVar154 = ZEXT3264(auVar21);
                    local_540 = local_540 & auVar22;
                    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_540 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_540 >> 0x7f,0) == '\0') &&
                          (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_540 >> 0xbf,0) == '\0') &&
                        (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_540[0x1f]) break;
                    auVar176._8_4_ = 0x7f800000;
                    auVar176._0_8_ = 0x7f8000007f800000;
                    auVar176._12_4_ = 0x7f800000;
                    auVar176._16_4_ = 0x7f800000;
                    auVar176._20_4_ = 0x7f800000;
                    auVar176._24_4_ = 0x7f800000;
                    auVar176._28_4_ = 0x7f800000;
                    auVar147 = vblendvps_avx(auVar176,auVar147,auVar21);
                    auVar22 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar22 = vminps_avx(auVar147,auVar22);
                    auVar23 = vshufpd_avx(auVar22,auVar22,5);
                    auVar22 = vminps_avx(auVar22,auVar23);
                    auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                    auVar22 = vminps_avx(auVar22,auVar23);
                    auVar22 = vcmpps_avx(auVar147,auVar22,0);
                    auVar23 = auVar21 & auVar22;
                    auVar147 = auVar21;
                    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0x7f,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0xbf,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar23[0x1f] < '\0') {
                      auVar147 = vandps_avx(auVar22,auVar21);
                    }
                    uVar127 = vmovmskps_avx(auVar147);
                    uVar130 = 0;
                    if (uVar127 != 0) {
                      for (; (uVar127 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                      }
                    }
                    uVar131 = (ulong)uVar130;
                    local_540 = auVar21;
                  }
                  auVar325 = ZEXT3264(local_800);
                  auVar344 = ZEXT3264(_local_720);
                  auVar336 = ZEXT3264(_local_760);
                  pre = local_848;
                }
              }
              fVar248 = (float)local_6c0._0_4_;
              fVar253 = (float)local_6c0._4_4_;
              fVar255 = fStack_6b8;
              fVar257 = fStack_6b4;
              fVar262 = fStack_6b0;
              fVar271 = fStack_6ac;
              fVar276 = fStack_6a8;
              fVar224 = fStack_6a4;
            }
          }
        }
        lVar129 = lVar129 + 8;
        fVar160 = (float)local_580._0_4_;
        fVar178 = (float)local_580._4_4_;
        fVar179 = fStack_578;
        fVar180 = fStack_574;
        fVar241 = fStack_570;
        fVar243 = fStack_56c;
        fVar247 = fStack_568;
        fVar252 = fStack_564;
      }
    }
    uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar148._4_4_ = uVar135;
    auVar148._0_4_ = uVar135;
    auVar148._8_4_ = uVar135;
    auVar148._12_4_ = uVar135;
    auVar148._16_4_ = uVar135;
    auVar148._20_4_ = uVar135;
    auVar148._24_4_ = uVar135;
    auVar148._28_4_ = uVar135;
    auVar147 = vcmpps_avx(local_80,auVar148,2);
    uVar130 = vmovmskps_avx(auVar147);
    uVar128 = (ulong)((uint)uVar128 & (uint)uVar128 + 0xff & uVar130);
    prim = (Primitive *)local_740._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }